

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  __int_type_conflict _Var10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined8 uVar33;
  ulong uVar34;
  uint uVar35;
  long lVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  byte bVar98;
  byte bVar99;
  ulong uVar100;
  uint uVar101;
  long lVar102;
  long lVar103;
  Geometry *pGVar104;
  uint uVar105;
  ulong uVar106;
  byte bVar107;
  float fVar108;
  float fVar109;
  float fVar160;
  float fVar162;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar166;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined4 uVar167;
  undefined8 uVar168;
  vint4 bi_2;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  vint4 bi_1;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  vint4 bi;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar197;
  float fVar201;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  float fVar202;
  float fVar203;
  float fVar216;
  float fVar218;
  vint4 ai_2;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar219;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar217;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  vint4 ai_1;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  vint4 ai;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [16];
  undefined1 auVar241 [64];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [16];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  vint<16> mask;
  undefined8 local_970;
  undefined8 uStack_968;
  RTCFilterFunctionNArguments local_960;
  Geometry *local_930;
  undefined1 (*local_928) [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 local_8d0 [8];
  undefined8 uStack_8c8;
  undefined1 local_8c0 [16];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined4 local_7a0;
  undefined4 uStack_79c;
  undefined8 uStack_798;
  LinearSpace3fa *local_790;
  Primitive *local_788;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  undefined4 uStack_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  undefined4 uStack_6c8;
  undefined4 uStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined4 local_640;
  int local_63c;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  byte local_5f0;
  float local_5e0 [4];
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [64];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar6 = prim[1];
  uVar100 = (ulong)(byte)PVar6;
  lVar36 = uVar100 * 0x25;
  fVar203 = *(float *)(prim + lVar36 + 0x12);
  auVar114 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar114 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar113 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar113 = vinsertps_avx(auVar113,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar114 = vsubps_avx(auVar114,*(undefined1 (*) [16])(prim + lVar36 + 6));
  auVar198._0_4_ = fVar203 * auVar114._0_4_;
  auVar198._4_4_ = fVar203 * auVar114._4_4_;
  auVar198._8_4_ = fVar203 * auVar114._8_4_;
  auVar198._12_4_ = fVar203 * auVar114._12_4_;
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 4 + 6)));
  auVar169._0_4_ = fVar203 * auVar113._0_4_;
  auVar169._4_4_ = fVar203 * auVar113._4_4_;
  auVar169._8_4_ = fVar203 * auVar113._8_4_;
  auVar169._12_4_ = fVar203 * auVar113._12_4_;
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar113 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 5 + 6)));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar115 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 6 + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0xf + 6)));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar249 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar249 = vcvtdq2ps_avx(auVar249);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar100 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0x1a + 6)));
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0x1b + 6)));
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0x1c + 6)));
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar220._4_4_ = auVar169._0_4_;
  auVar220._0_4_ = auVar169._0_4_;
  auVar220._8_4_ = auVar169._0_4_;
  auVar220._12_4_ = auVar169._0_4_;
  auVar32 = vshufps_avx(auVar169,auVar169,0x55);
  auVar116 = vshufps_avx(auVar169,auVar169,0xaa);
  fVar203 = auVar116._0_4_;
  auVar188._0_4_ = fVar203 * auVar115._0_4_;
  fVar217 = auVar116._4_4_;
  auVar188._4_4_ = fVar217 * auVar115._4_4_;
  fVar202 = auVar116._8_4_;
  auVar188._8_4_ = fVar202 * auVar115._8_4_;
  fVar216 = auVar116._12_4_;
  auVar188._12_4_ = fVar216 * auVar115._12_4_;
  auVar184._0_4_ = auVar28._0_4_ * fVar203;
  auVar184._4_4_ = auVar28._4_4_ * fVar217;
  auVar184._8_4_ = auVar28._8_4_ * fVar202;
  auVar184._12_4_ = auVar28._12_4_ * fVar216;
  auVar170._0_4_ = auVar31._0_4_ * fVar203;
  auVar170._4_4_ = auVar31._4_4_ * fVar217;
  auVar170._8_4_ = auVar31._8_4_ * fVar202;
  auVar170._12_4_ = auVar31._12_4_ * fVar216;
  auVar116 = vfmadd231ps_fma(auVar188,auVar32,auVar113);
  auVar117 = vfmadd231ps_fma(auVar184,auVar32,auVar249);
  auVar32 = vfmadd231ps_fma(auVar170,auVar30,auVar32);
  auVar38 = vfmadd231ps_fma(auVar116,auVar220,auVar114);
  auVar117 = vfmadd231ps_fma(auVar117,auVar220,auVar27);
  auVar118 = vfmadd231ps_fma(auVar32,auVar29,auVar220);
  auVar240._4_4_ = auVar198._0_4_;
  auVar240._0_4_ = auVar198._0_4_;
  auVar240._8_4_ = auVar198._0_4_;
  auVar240._12_4_ = auVar198._0_4_;
  auVar32 = vshufps_avx(auVar198,auVar198,0x55);
  auVar116 = vshufps_avx(auVar198,auVar198,0xaa);
  fVar203 = auVar116._0_4_;
  auVar221._0_4_ = fVar203 * auVar115._0_4_;
  fVar217 = auVar116._4_4_;
  auVar221._4_4_ = fVar217 * auVar115._4_4_;
  fVar202 = auVar116._8_4_;
  auVar221._8_4_ = fVar202 * auVar115._8_4_;
  fVar216 = auVar116._12_4_;
  auVar221._12_4_ = fVar216 * auVar115._12_4_;
  auVar204._0_4_ = auVar28._0_4_ * fVar203;
  auVar204._4_4_ = auVar28._4_4_ * fVar217;
  auVar204._8_4_ = auVar28._8_4_ * fVar202;
  auVar204._12_4_ = auVar28._12_4_ * fVar216;
  auVar199._0_4_ = auVar31._0_4_ * fVar203;
  auVar199._4_4_ = auVar31._4_4_ * fVar217;
  auVar199._8_4_ = auVar31._8_4_ * fVar202;
  auVar199._12_4_ = auVar31._12_4_ * fVar216;
  auVar113 = vfmadd231ps_fma(auVar221,auVar32,auVar113);
  auVar115 = vfmadd231ps_fma(auVar204,auVar32,auVar249);
  auVar249 = vfmadd231ps_fma(auVar199,auVar32,auVar30);
  auVar39 = vfmadd231ps_fma(auVar113,auVar240,auVar114);
  auVar169 = vfmadd231ps_fma(auVar115,auVar240,auVar27);
  auVar232._8_4_ = 0x7fffffff;
  auVar232._0_8_ = 0x7fffffff7fffffff;
  auVar232._12_4_ = 0x7fffffff;
  auVar170 = vfmadd231ps_fma(auVar249,auVar240,auVar29);
  auVar114 = vandps_avx(auVar232,auVar38);
  auVar229._8_4_ = 0x219392ef;
  auVar229._0_8_ = 0x219392ef219392ef;
  auVar229._12_4_ = 0x219392ef;
  uVar106 = vcmpps_avx512vl(auVar114,auVar229,1);
  bVar13 = (bool)((byte)uVar106 & 1);
  auVar110._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar38._0_4_;
  bVar13 = (bool)((byte)(uVar106 >> 1) & 1);
  auVar110._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar38._4_4_;
  bVar13 = (bool)((byte)(uVar106 >> 2) & 1);
  auVar110._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar38._8_4_;
  bVar13 = (bool)((byte)(uVar106 >> 3) & 1);
  auVar110._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar38._12_4_;
  auVar114 = vandps_avx(auVar232,auVar117);
  uVar106 = vcmpps_avx512vl(auVar114,auVar229,1);
  bVar13 = (bool)((byte)uVar106 & 1);
  auVar111._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar117._0_4_;
  bVar13 = (bool)((byte)(uVar106 >> 1) & 1);
  auVar111._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar117._4_4_;
  bVar13 = (bool)((byte)(uVar106 >> 2) & 1);
  auVar111._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar117._8_4_;
  bVar13 = (bool)((byte)(uVar106 >> 3) & 1);
  auVar111._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar117._12_4_;
  auVar114 = vandps_avx(auVar232,auVar118);
  uVar106 = vcmpps_avx512vl(auVar114,auVar229,1);
  bVar13 = (bool)((byte)uVar106 & 1);
  auVar112._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar118._0_4_;
  bVar13 = (bool)((byte)(uVar106 >> 1) & 1);
  auVar112._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar118._4_4_;
  bVar13 = (bool)((byte)(uVar106 >> 2) & 1);
  auVar112._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar118._8_4_;
  bVar13 = (bool)((byte)(uVar106 >> 3) & 1);
  auVar112._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar118._12_4_;
  auVar113 = vrcp14ps_avx512vl(auVar110);
  auVar230._8_4_ = 0x3f800000;
  auVar230._0_8_ = &DAT_3f8000003f800000;
  auVar230._12_4_ = 0x3f800000;
  auVar114 = vfnmadd213ps_fma(auVar110,auVar113,auVar230);
  auVar38 = vfmadd132ps_fma(auVar114,auVar113,auVar113);
  auVar113 = vrcp14ps_avx512vl(auVar111);
  auVar114 = vfnmadd213ps_fma(auVar111,auVar113,auVar230);
  auVar118 = vfmadd132ps_fma(auVar114,auVar113,auVar113);
  auVar113 = vrcp14ps_avx512vl(auVar112);
  auVar114 = vfnmadd213ps_fma(auVar112,auVar113,auVar230);
  auVar37 = vfmadd132ps_fma(auVar114,auVar113,auVar113);
  fVar203 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar36 + 0x16)) *
            *(float *)(prim + lVar36 + 0x1a);
  auVar227._4_4_ = fVar203;
  auVar227._0_4_ = fVar203;
  auVar227._8_4_ = fVar203;
  auVar227._12_4_ = fVar203;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar100 * 7 + 6);
  auVar114 = vpmovsxwd_avx(auVar114);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar100 * 0xb + 6);
  auVar113 = vpmovsxwd_avx(auVar113);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar27 = vsubps_avx(auVar113,auVar114);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *(ulong *)(prim + uVar100 * 9 + 6);
  auVar113 = vpmovsxwd_avx(auVar115);
  auVar115 = vfmadd213ps_fma(auVar27,auVar227,auVar114);
  auVar114 = vcvtdq2ps_avx(auVar113);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar100 * 0xd + 6);
  auVar113 = vpmovsxwd_avx(auVar27);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,auVar114);
  auVar27 = vfmadd213ps_fma(auVar113,auVar227,auVar114);
  auVar249._8_8_ = 0;
  auVar249._0_8_ = *(ulong *)(prim + uVar100 * 0x12 + 6);
  auVar114 = vpmovsxwd_avx(auVar249);
  auVar114 = vcvtdq2ps_avx(auVar114);
  uVar106 = (ulong)(uint)((int)(uVar100 * 5) << 2);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar100 * 2 + uVar106 + 6);
  auVar113 = vpmovsxwd_avx(auVar28);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,auVar114);
  auVar249 = vfmadd213ps_fma(auVar113,auVar227,auVar114);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar106 + 6);
  auVar114 = vpmovsxwd_avx(auVar29);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar100 * 0x18 + 6);
  auVar113 = vpmovsxwd_avx(auVar30);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,auVar114);
  auVar28 = vfmadd213ps_fma(auVar113,auVar227,auVar114);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar100 * 0x1d + 6);
  auVar114 = vpmovsxwd_avx(auVar31);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar100 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar113 = vpmovsxwd_avx(auVar32);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,auVar114);
  auVar29 = vfmadd213ps_fma(auVar113,auVar227,auVar114);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar100) + 6);
  auVar114 = vpmovsxwd_avx(auVar116);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar100 * 0x23 + 6);
  auVar113 = vpmovsxwd_avx(auVar117);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,auVar114);
  auVar113 = vfmadd213ps_fma(auVar113,auVar227,auVar114);
  auVar114 = vsubps_avx(auVar115,auVar39);
  auVar228._0_4_ = auVar38._0_4_ * auVar114._0_4_;
  auVar228._4_4_ = auVar38._4_4_ * auVar114._4_4_;
  auVar228._8_4_ = auVar38._8_4_ * auVar114._8_4_;
  auVar228._12_4_ = auVar38._12_4_ * auVar114._12_4_;
  auVar114 = vsubps_avx(auVar27,auVar39);
  auVar189._0_4_ = auVar38._0_4_ * auVar114._0_4_;
  auVar189._4_4_ = auVar38._4_4_ * auVar114._4_4_;
  auVar189._8_4_ = auVar38._8_4_ * auVar114._8_4_;
  auVar189._12_4_ = auVar38._12_4_ * auVar114._12_4_;
  auVar114 = vsubps_avx(auVar249,auVar169);
  auVar222._0_4_ = auVar118._0_4_ * auVar114._0_4_;
  auVar222._4_4_ = auVar118._4_4_ * auVar114._4_4_;
  auVar222._8_4_ = auVar118._8_4_ * auVar114._8_4_;
  auVar222._12_4_ = auVar118._12_4_ * auVar114._12_4_;
  auVar114 = vsubps_avx(auVar28,auVar169);
  auVar185._0_4_ = auVar118._0_4_ * auVar114._0_4_;
  auVar185._4_4_ = auVar118._4_4_ * auVar114._4_4_;
  auVar185._8_4_ = auVar118._8_4_ * auVar114._8_4_;
  auVar185._12_4_ = auVar118._12_4_ * auVar114._12_4_;
  auVar114 = vsubps_avx(auVar29,auVar170);
  auVar205._0_4_ = auVar37._0_4_ * auVar114._0_4_;
  auVar205._4_4_ = auVar37._4_4_ * auVar114._4_4_;
  auVar205._8_4_ = auVar37._8_4_ * auVar114._8_4_;
  auVar205._12_4_ = auVar37._12_4_ * auVar114._12_4_;
  auVar114 = vsubps_avx(auVar113,auVar170);
  auVar171._0_4_ = auVar37._0_4_ * auVar114._0_4_;
  auVar171._4_4_ = auVar37._4_4_ * auVar114._4_4_;
  auVar171._8_4_ = auVar37._8_4_ * auVar114._8_4_;
  auVar171._12_4_ = auVar37._12_4_ * auVar114._12_4_;
  auVar114 = vpminsd_avx(auVar228,auVar189);
  auVar113 = vpminsd_avx(auVar222,auVar185);
  auVar114 = vmaxps_avx(auVar114,auVar113);
  auVar113 = vpminsd_avx(auVar205,auVar171);
  uVar167 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar38._4_4_ = uVar167;
  auVar38._0_4_ = uVar167;
  auVar38._8_4_ = uVar167;
  auVar38._12_4_ = uVar167;
  auVar113 = vmaxps_avx512vl(auVar113,auVar38);
  auVar114 = vmaxps_avx(auVar114,auVar113);
  auVar118._8_4_ = 0x3f7ffffa;
  auVar118._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar118._12_4_ = 0x3f7ffffa;
  local_4f0 = vmulps_avx512vl(auVar114,auVar118);
  auVar114 = vpmaxsd_avx(auVar228,auVar189);
  auVar113 = vpmaxsd_avx(auVar222,auVar185);
  auVar114 = vminps_avx(auVar114,auVar113);
  auVar113 = vpmaxsd_avx(auVar205,auVar171);
  uVar167 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar37._4_4_ = uVar167;
  auVar37._0_4_ = uVar167;
  auVar37._8_4_ = uVar167;
  auVar37._12_4_ = uVar167;
  auVar113 = vminps_avx512vl(auVar113,auVar37);
  auVar114 = vminps_avx(auVar114,auVar113);
  auVar39._8_4_ = 0x3f800003;
  auVar39._0_8_ = 0x3f8000033f800003;
  auVar39._12_4_ = 0x3f800003;
  auVar114 = vmulps_avx512vl(auVar114,auVar39);
  auVar113 = vpbroadcastd_avx512vl();
  uVar168 = vcmpps_avx512vl(local_4f0,auVar114,2);
  uVar106 = vpcmpgtd_avx512vl(auVar113,_DAT_01ff0cf0);
  uVar106 = ((byte)uVar168 & 0xf) & uVar106;
  if ((char)uVar106 != '\0') {
    local_790 = pre->ray_space + k;
    local_928 = (undefined1 (*) [32])local_100;
    auVar183 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar183);
    local_788 = prim;
    do {
      lVar36 = 0;
      for (uVar100 = uVar106; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x8000000000000000) {
        lVar36 = lVar36 + 1;
      }
      uVar105 = *(uint *)(local_788 + 2);
      uVar7 = *(uint *)(local_788 + lVar36 * 4 + 6);
      pGVar104 = (context->scene->geometries).items[uVar105].ptr;
      uVar100 = (ulong)*(uint *)(*(long *)&pGVar104->field_0x58 +
                                (ulong)uVar7 *
                                pGVar104[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar203 = (pGVar104->time_range).lower;
      fVar203 = pGVar104->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x1c0) - fVar203) /
                ((pGVar104->time_range).upper - fVar203));
      auVar114 = vroundss_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),9);
      auVar114 = vminss_avx(auVar114,ZEXT416((uint)(pGVar104->fnumTimeSegments + -1.0)));
      auVar114 = vmaxss_avx(ZEXT816(0) << 0x20,auVar114);
      fVar203 = fVar203 - auVar114._0_4_;
      _Var10 = pGVar104[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar103 = (long)(int)auVar114._0_4_ * 0x38;
      lVar36 = *(long *)(_Var10 + 0x10 + lVar103);
      lVar102 = *(long *)(_Var10 + 0x38 + lVar103);
      lVar11 = *(long *)(_Var10 + 0x48 + lVar103);
      auVar186._4_4_ = fVar203;
      auVar186._0_4_ = fVar203;
      auVar186._8_4_ = fVar203;
      auVar186._12_4_ = fVar203;
      pfVar3 = (float *)(lVar102 + uVar100 * lVar11);
      auVar233._0_4_ = fVar203 * *pfVar3;
      auVar233._4_4_ = fVar203 * pfVar3[1];
      auVar233._8_4_ = fVar203 * pfVar3[2];
      auVar233._12_4_ = fVar203 * pfVar3[3];
      pfVar3 = (float *)(lVar102 + (uVar100 + 1) * lVar11);
      auVar234._0_4_ = fVar203 * *pfVar3;
      auVar234._4_4_ = fVar203 * pfVar3[1];
      auVar234._8_4_ = fVar203 * pfVar3[2];
      auVar234._12_4_ = fVar203 * pfVar3[3];
      auVar114 = vmulps_avx512vl(auVar186,*(undefined1 (*) [16])(lVar102 + (uVar100 + 2) * lVar11));
      auVar113 = vmulps_avx512vl(auVar186,*(undefined1 (*) [16])(lVar102 + lVar11 * (uVar100 + 3)));
      lVar102 = *(long *)(_Var10 + lVar103);
      fVar203 = 1.0 - fVar203;
      auVar172._4_4_ = fVar203;
      auVar172._0_4_ = fVar203;
      auVar172._8_4_ = fVar203;
      auVar172._12_4_ = fVar203;
      auVar27 = vfmadd231ps_fma(auVar233,auVar172,*(undefined1 (*) [16])(lVar102 + lVar36 * uVar100)
                               );
      local_8b0 = vfmadd231ps_fma(auVar234,auVar172,
                                  *(undefined1 (*) [16])(lVar102 + lVar36 * (uVar100 + 1)));
      local_8c0 = vfmadd231ps_avx512vl
                            (auVar114,auVar172,
                             *(undefined1 (*) [16])(lVar102 + lVar36 * (uVar100 + 2)));
      _local_8d0 = vfmadd231ps_avx512vl
                             (auVar113,auVar172,
                              *(undefined1 (*) [16])(lVar102 + lVar36 * (uVar100 + 3)));
      iVar8 = (int)pGVar104[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar114 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c);
      lVar36 = (long)iVar8 * 0x44;
      auVar114 = vinsertps_avx(auVar114,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar115 = vsubps_avx(auVar27,auVar114);
      uVar167 = auVar115._0_4_;
      auVar190._4_4_ = uVar167;
      auVar190._0_4_ = uVar167;
      auVar190._8_4_ = uVar167;
      auVar190._12_4_ = uVar167;
      auVar113 = vshufps_avx(auVar115,auVar115,0x55);
      aVar4 = (local_790->vx).field_0;
      aVar5 = (local_790->vy).field_0;
      fVar203 = (local_790->vz).field_0.m128[0];
      fVar217 = *(float *)((long)&(local_790->vz).field_0 + 4);
      fVar202 = *(float *)((long)&(local_790->vz).field_0 + 8);
      fVar216 = *(float *)((long)&(local_790->vz).field_0 + 0xc);
      auVar115 = vshufps_avx(auVar115,auVar115,0xaa);
      auVar236._0_4_ = fVar203 * auVar115._0_4_;
      auVar236._4_4_ = fVar217 * auVar115._4_4_;
      auVar236._8_4_ = fVar202 * auVar115._8_4_;
      auVar236._12_4_ = fVar216 * auVar115._12_4_;
      auVar113 = vfmadd231ps_fma(auVar236,(undefined1  [16])aVar5,auVar113);
      auVar249 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar4,auVar190);
      auVar115 = vsubps_avx(local_8b0,auVar114);
      uVar167 = auVar115._0_4_;
      auVar191._4_4_ = uVar167;
      auVar191._0_4_ = uVar167;
      auVar191._8_4_ = uVar167;
      auVar191._12_4_ = uVar167;
      auVar113 = vshufps_avx(auVar115,auVar115,0x55);
      auVar115 = vshufps_avx(auVar115,auVar115,0xaa);
      auVar237._0_4_ = fVar203 * auVar115._0_4_;
      auVar237._4_4_ = fVar217 * auVar115._4_4_;
      auVar237._8_4_ = fVar202 * auVar115._8_4_;
      auVar237._12_4_ = fVar216 * auVar115._12_4_;
      auVar113 = vfmadd231ps_fma(auVar237,(undefined1  [16])aVar5,auVar113);
      auVar28 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar4,auVar191);
      auVar115 = vsubps_avx512vl(local_8c0,auVar114);
      uVar167 = auVar115._0_4_;
      auVar192._4_4_ = uVar167;
      auVar192._0_4_ = uVar167;
      auVar192._8_4_ = uVar167;
      auVar192._12_4_ = uVar167;
      auVar113 = vshufps_avx(auVar115,auVar115,0x55);
      auVar115 = vshufps_avx(auVar115,auVar115,0xaa);
      auVar238._0_4_ = fVar203 * auVar115._0_4_;
      auVar238._4_4_ = fVar217 * auVar115._4_4_;
      auVar238._8_4_ = fVar202 * auVar115._8_4_;
      auVar238._12_4_ = fVar216 * auVar115._12_4_;
      auVar113 = vfmadd231ps_fma(auVar238,(undefined1  [16])aVar5,auVar113);
      auVar115 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar4,auVar192);
      auVar113 = vsubps_avx512vl(_local_8d0,auVar114);
      uVar167 = auVar113._0_4_;
      auVar187._4_4_ = uVar167;
      auVar187._0_4_ = uVar167;
      auVar187._8_4_ = uVar167;
      auVar187._12_4_ = uVar167;
      auVar114 = vshufps_avx(auVar113,auVar113,0x55);
      auVar113 = vshufps_avx(auVar113,auVar113,0xaa);
      auVar242._0_4_ = fVar203 * auVar113._0_4_;
      auVar242._4_4_ = fVar217 * auVar113._4_4_;
      auVar242._8_4_ = fVar202 * auVar113._8_4_;
      auVar242._12_4_ = fVar216 * auVar113._12_4_;
      auVar114 = vfmadd231ps_fma(auVar242,(undefined1  [16])aVar5,auVar114);
      auVar29 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar4,auVar187);
      auVar134 = *(undefined1 (*) [32])(bspline_basis0 + lVar36);
      uVar167 = auVar249._0_4_;
      local_720._4_4_ = uVar167;
      local_720._0_4_ = uVar167;
      local_720._8_4_ = uVar167;
      local_720._12_4_ = uVar167;
      local_720._16_4_ = uVar167;
      local_720._20_4_ = uVar167;
      local_720._24_4_ = uVar167;
      local_720._28_4_ = uVar167;
      auVar136 = *(undefined1 (*) [32])(bspline_basis0 + lVar36 + 0x484);
      auVar119._8_4_ = 1;
      auVar119._0_8_ = 0x100000001;
      auVar119._12_4_ = 1;
      auVar119._16_4_ = 1;
      auVar119._20_4_ = 1;
      auVar119._24_4_ = 1;
      auVar119._28_4_ = 1;
      local_700 = vpermps_avx2(auVar119,ZEXT1632(auVar249));
      local_740 = vbroadcastss_avx512vl(auVar28);
      local_900 = vpermps_avx512vl(auVar119,ZEXT1632(auVar28));
      auVar132 = *(undefined1 (*) [32])(bspline_basis0 + lVar36 + 0x908);
      local_920 = vbroadcastss_avx512vl(auVar115);
      local_7e0 = vpermps_avx512vl(auVar119,ZEXT1632(auVar115));
      auVar131 = *(undefined1 (*) [32])(bspline_basis0 + lVar36 + 0xd8c);
      local_800 = vbroadcastss_avx512vl(auVar29);
      auVar183 = ZEXT3264(local_800);
      local_820 = vpermps_avx512vl(auVar119,ZEXT1632(auVar29));
      auVar252 = ZEXT3264(local_820);
      auVar119 = vmulps_avx512vl(local_800,auVar131);
      auVar120 = vmulps_avx512vl(local_820,auVar131);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar132,local_920);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar132,local_7e0);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar136,local_740);
      auVar121 = vfmadd231ps_avx512vl(auVar120,auVar136,local_900);
      auVar122 = vfmadd231ps_avx512vl(auVar119,auVar134,local_720);
      auVar119 = *(undefined1 (*) [32])(bspline_basis1 + lVar36);
      auVar120 = *(undefined1 (*) [32])(bspline_basis1 + lVar36 + 0x484);
      auVar130 = *(undefined1 (*) [32])(bspline_basis1 + lVar36 + 0x908);
      auVar123 = vfmadd231ps_avx512vl(auVar121,auVar134,local_700);
      auVar121 = *(undefined1 (*) [32])(bspline_basis1 + lVar36 + 0xd8c);
      auVar124 = vmulps_avx512vl(local_800,auVar121);
      auVar125 = vmulps_avx512vl(local_820,auVar121);
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar130,local_920);
      auVar125 = vfmadd231ps_avx512vl(auVar125,auVar130,local_7e0);
      auVar124 = vfmadd231ps_avx512vl(auVar124,auVar120,local_740);
      auVar125 = vfmadd231ps_avx512vl(auVar125,auVar120,local_900);
      auVar30 = vfmadd231ps_fma(auVar124,auVar119,local_720);
      auVar31 = vfmadd231ps_fma(auVar125,auVar119,local_700);
      auVar125 = vsubps_avx512vl(ZEXT1632(auVar30),auVar122);
      auVar126 = vsubps_avx512vl(ZEXT1632(auVar31),auVar123);
      auVar124 = vmulps_avx512vl(auVar123,auVar125);
      auVar127 = vmulps_avx512vl(auVar122,auVar126);
      auVar124 = vsubps_avx512vl(auVar124,auVar127);
      auVar114 = vshufps_avx(auVar27,auVar27,0xff);
      uVar168 = auVar114._0_8_;
      local_320._8_8_ = uVar168;
      local_320._0_8_ = uVar168;
      local_320._16_8_ = uVar168;
      local_320._24_8_ = uVar168;
      auVar114 = vshufps_avx(local_8b0,local_8b0,0xff);
      local_340 = vbroadcastsd_avx512vl(auVar114);
      auVar114 = vshufps_avx512vl(local_8c0,local_8c0,0xff);
      local_360 = vbroadcastsd_avx512vl(auVar114);
      auVar114 = vshufps_avx512vl(_local_8d0,_local_8d0,0xff);
      uVar168 = auVar114._0_8_;
      register0x00001248 = uVar168;
      local_380 = uVar168;
      register0x00001250 = uVar168;
      register0x00001258 = uVar168;
      auVar127 = vmulps_avx512vl(_local_380,auVar131);
      auVar127 = vfmadd231ps_avx512vl(auVar127,auVar132,local_360);
      auVar127 = vfmadd231ps_avx512vl(auVar127,auVar136,local_340);
      auVar127 = vfmadd231ps_avx512vl(auVar127,auVar134,local_320);
      auVar128 = vmulps_avx512vl(_local_380,auVar121);
      auVar128 = vfmadd231ps_avx512vl(auVar128,auVar130,local_360);
      auVar128 = vfmadd231ps_avx512vl(auVar128,auVar120,local_340);
      auVar32 = vfmadd231ps_fma(auVar128,auVar119,local_320);
      auVar128 = vmulps_avx512vl(auVar126,auVar126);
      auVar128 = vfmadd231ps_avx512vl(auVar128,auVar125,auVar125);
      auVar129 = vmaxps_avx512vl(auVar127,ZEXT1632(auVar32));
      auVar129 = vmulps_avx512vl(auVar129,auVar129);
      auVar128 = vmulps_avx512vl(auVar129,auVar128);
      auVar124 = vmulps_avx512vl(auVar124,auVar124);
      uVar168 = vcmpps_avx512vl(auVar124,auVar128,2);
      auVar114 = vblendps_avx(auVar249,auVar27,8);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar113 = vandps_avx512vl(auVar114,auVar116);
      auVar114 = vblendps_avx(auVar28,local_8b0,8);
      auVar114 = vandps_avx512vl(auVar114,auVar116);
      auVar113 = vmaxps_avx(auVar113,auVar114);
      auVar114 = vblendps_avx(auVar115,local_8c0,8);
      auVar117 = vandps_avx512vl(auVar114,auVar116);
      auVar114 = vblendps_avx(auVar29,_local_8d0,8);
      auVar114 = vandps_avx512vl(auVar114,auVar116);
      auVar114 = vmaxps_avx(auVar117,auVar114);
      auVar114 = vmaxps_avx(auVar113,auVar114);
      auVar113 = vmovshdup_avx(auVar114);
      auVar113 = vmaxss_avx(auVar113,auVar114);
      auVar114 = vshufpd_avx(auVar114,auVar114,1);
      auVar114 = vmaxss_avx(auVar114,auVar113);
      _local_6c0 = vcvtsi2ss_avx512f(local_8c0,iVar8);
      auVar128._0_4_ = local_6c0._0_4_;
      auVar128._4_4_ = auVar128._0_4_;
      auVar128._8_4_ = auVar128._0_4_;
      auVar128._12_4_ = auVar128._0_4_;
      auVar128._16_4_ = auVar128._0_4_;
      auVar128._20_4_ = auVar128._0_4_;
      auVar128._24_4_ = auVar128._0_4_;
      auVar128._28_4_ = auVar128._0_4_;
      uVar33 = vcmpps_avx512vl(auVar128,_DAT_02020f40,0xe);
      bVar107 = (byte)uVar168 & (byte)uVar33;
      fVar217 = auVar114._0_4_ * 4.7683716e-07;
      auVar124._8_4_ = 2;
      auVar124._0_8_ = 0x200000002;
      auVar124._12_4_ = 2;
      auVar124._16_4_ = 2;
      auVar124._20_4_ = 2;
      auVar124._24_4_ = 2;
      auVar124._28_4_ = 2;
      local_3a0 = vpermps_avx512vl(auVar124,ZEXT1632(auVar249));
      local_3c0 = vpermps_avx512vl(auVar124,ZEXT1632(auVar28));
      local_3e0 = vpermps_avx512vl(auVar124,ZEXT1632(auVar115));
      auVar124 = vpermps_avx2(auVar124,ZEXT1632(auVar29));
      fVar203 = *(float *)(ray + k * 4 + 0xc0);
      auVar114 = auVar126._0_16_;
      _local_8e0 = ZEXT416((uint)fVar217);
      local_970 = auVar27._0_8_;
      uStack_968 = auVar27._8_8_;
      if (bVar107 == 0) {
        auVar114 = vxorps_avx512vl(auVar114,auVar114);
        auVar250 = ZEXT1664(auVar114);
        auVar246 = ZEXT3264(local_720);
        auVar247 = ZEXT3264(local_700);
        auVar248 = ZEXT3264(local_740);
        auVar245 = ZEXT3264(local_900);
        auVar253 = ZEXT3264(local_920);
        auVar251 = ZEXT3264(local_7e0);
      }
      else {
        fStack_77c = 0.0;
        fStack_778 = 0.0;
        fStack_774 = 0.0;
        auVar121 = vmulps_avx512vl(auVar124,auVar121);
        auVar130 = vfmadd213ps_avx512vl(auVar130,local_3e0,auVar121);
        auVar120 = vfmadd213ps_avx512vl(auVar120,local_3c0,auVar130);
        auVar129 = vfmadd213ps_avx512vl(auVar119,local_3a0,auVar120);
        auVar131 = vmulps_avx512vl(auVar124,auVar131);
        auVar132 = vfmadd213ps_avx512vl(auVar132,local_3e0,auVar131);
        auVar120 = vfmadd213ps_avx512vl(auVar136,local_3c0,auVar132);
        auVar136 = *(undefined1 (*) [32])(bspline_basis0 + lVar36 + 0x1210);
        auVar132 = *(undefined1 (*) [32])(bspline_basis0 + lVar36 + 0x1694);
        auVar131 = *(undefined1 (*) [32])(bspline_basis0 + lVar36 + 0x1b18);
        auVar119 = *(undefined1 (*) [32])(bspline_basis0 + lVar36 + 0x1f9c);
        auVar133 = vfmadd213ps_avx512vl(auVar134,local_3a0,auVar120);
        auVar134 = vmulps_avx512vl(local_800,auVar119);
        auVar120 = vmulps_avx512vl(local_820,auVar119);
        auVar239._0_4_ = auVar124._0_4_ * auVar119._0_4_;
        auVar239._4_4_ = auVar124._4_4_ * auVar119._4_4_;
        auVar239._8_4_ = auVar124._8_4_ * auVar119._8_4_;
        auVar239._12_4_ = auVar124._12_4_ * auVar119._12_4_;
        auVar239._16_4_ = auVar124._16_4_ * auVar119._16_4_;
        auVar239._20_4_ = auVar124._20_4_ * auVar119._20_4_;
        auVar239._24_4_ = auVar124._24_4_ * auVar119._24_4_;
        auVar239._28_4_ = 0;
        auVar253 = ZEXT3264(local_920);
        auVar134 = vfmadd231ps_avx512vl(auVar134,auVar131,local_920);
        auVar119 = vfmadd231ps_avx512vl(auVar120,auVar131,local_7e0);
        auVar131 = vfmadd231ps_avx512vl(auVar239,local_3e0,auVar131);
        auVar134 = vfmadd231ps_avx512vl(auVar134,auVar132,local_740);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar132,local_900);
        auVar120 = vfmadd231ps_avx512vl(auVar131,local_3c0,auVar132);
        auVar130 = vfmadd231ps_avx512vl(auVar134,auVar136,local_720);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar136,local_700);
        auVar134 = *(undefined1 (*) [32])(bspline_basis1 + lVar36 + 0x1210);
        auVar132 = *(undefined1 (*) [32])(bspline_basis1 + lVar36 + 0x1b18);
        auVar131 = *(undefined1 (*) [32])(bspline_basis1 + lVar36 + 0x1f9c);
        auVar120 = vfmadd231ps_avx512vl(auVar120,local_3a0,auVar136);
        auVar121 = vmulps_avx512vl(local_800,auVar131);
        auVar135 = vmulps_avx512vl(local_820,auVar131);
        auVar136._4_4_ = auVar124._4_4_ * auVar131._4_4_;
        auVar136._0_4_ = auVar124._0_4_ * auVar131._0_4_;
        auVar136._8_4_ = auVar124._8_4_ * auVar131._8_4_;
        auVar136._12_4_ = auVar124._12_4_ * auVar131._12_4_;
        auVar136._16_4_ = auVar124._16_4_ * auVar131._16_4_;
        auVar136._20_4_ = auVar124._20_4_ * auVar131._20_4_;
        auVar136._24_4_ = auVar124._24_4_ * auVar131._24_4_;
        auVar136._28_4_ = auVar131._28_4_;
        auVar131 = vfmadd231ps_avx512vl(auVar121,auVar132,local_920);
        auVar121 = vfmadd231ps_avx512vl(auVar135,auVar132,local_7e0);
        auVar132 = vfmadd231ps_avx512vl(auVar136,local_3e0,auVar132);
        auVar136 = *(undefined1 (*) [32])(bspline_basis1 + lVar36 + 0x1694);
        auVar131 = vfmadd231ps_avx512vl(auVar131,auVar136,local_740);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar136,local_900);
        auVar136 = vfmadd231ps_avx512vl(auVar132,local_3c0,auVar136);
        auVar132 = vfmadd231ps_avx512vl(auVar131,auVar134,local_720);
        auVar131 = vfmadd231ps_avx512vl(auVar121,auVar134,local_700);
        auVar121 = vfmadd231ps_avx512vl(auVar136,local_3a0,auVar134);
        auVar243._8_4_ = 0x7fffffff;
        auVar243._0_8_ = 0x7fffffff7fffffff;
        auVar243._12_4_ = 0x7fffffff;
        auVar243._16_4_ = 0x7fffffff;
        auVar243._20_4_ = 0x7fffffff;
        auVar243._24_4_ = 0x7fffffff;
        auVar243._28_4_ = 0x7fffffff;
        auVar134 = vandps_avx(auVar130,auVar243);
        auVar136 = vandps_avx(auVar119,auVar243);
        auVar136 = vmaxps_avx(auVar134,auVar136);
        auVar134 = vandps_avx(auVar120,auVar243);
        auVar134 = vmaxps_avx(auVar136,auVar134);
        auVar120 = vbroadcastss_avx512vl(_local_8e0);
        uVar100 = vcmpps_avx512vl(auVar134,auVar120,1);
        bVar13 = (bool)((byte)uVar100 & 1);
        auVar135._0_4_ = (float)((uint)bVar13 * auVar125._0_4_ | (uint)!bVar13 * auVar130._0_4_);
        bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar135._4_4_ = (float)((uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * auVar130._4_4_);
        bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar135._8_4_ = (float)((uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * auVar130._8_4_);
        bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar135._12_4_ = (float)((uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * auVar130._12_4_);
        bVar13 = (bool)((byte)(uVar100 >> 4) & 1);
        auVar135._16_4_ = (float)((uint)bVar13 * auVar125._16_4_ | (uint)!bVar13 * auVar130._16_4_);
        bVar13 = (bool)((byte)(uVar100 >> 5) & 1);
        auVar135._20_4_ = (float)((uint)bVar13 * auVar125._20_4_ | (uint)!bVar13 * auVar130._20_4_);
        bVar13 = (bool)((byte)(uVar100 >> 6) & 1);
        auVar135._24_4_ = (float)((uint)bVar13 * auVar125._24_4_ | (uint)!bVar13 * auVar130._24_4_);
        bVar13 = SUB81(uVar100 >> 7,0);
        auVar135._28_4_ = (uint)bVar13 * auVar125._28_4_ | (uint)!bVar13 * auVar130._28_4_;
        bVar13 = (bool)((byte)uVar100 & 1);
        auVar137._0_4_ = (float)((uint)bVar13 * auVar126._0_4_ | (uint)!bVar13 * auVar119._0_4_);
        bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar137._4_4_ = (float)((uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * auVar119._4_4_);
        bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar137._8_4_ = (float)((uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * auVar119._8_4_);
        bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar137._12_4_ = (float)((uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * auVar119._12_4_);
        bVar13 = (bool)((byte)(uVar100 >> 4) & 1);
        auVar137._16_4_ = (float)((uint)bVar13 * auVar126._16_4_ | (uint)!bVar13 * auVar119._16_4_);
        bVar13 = (bool)((byte)(uVar100 >> 5) & 1);
        auVar137._20_4_ = (float)((uint)bVar13 * auVar126._20_4_ | (uint)!bVar13 * auVar119._20_4_);
        bVar13 = (bool)((byte)(uVar100 >> 6) & 1);
        auVar137._24_4_ = (float)((uint)bVar13 * auVar126._24_4_ | (uint)!bVar13 * auVar119._24_4_);
        bVar13 = SUB81(uVar100 >> 7,0);
        auVar137._28_4_ = (uint)bVar13 * auVar126._28_4_ | (uint)!bVar13 * auVar119._28_4_;
        auVar134 = vandps_avx(auVar243,auVar132);
        auVar136 = vandps_avx(auVar131,auVar243);
        auVar136 = vmaxps_avx(auVar134,auVar136);
        auVar134 = vandps_avx(auVar121,auVar243);
        auVar134 = vmaxps_avx(auVar136,auVar134);
        uVar100 = vcmpps_avx512vl(auVar134,auVar120,1);
        bVar13 = (bool)((byte)uVar100 & 1);
        auVar138._0_4_ = (float)((uint)bVar13 * auVar125._0_4_ | (uint)!bVar13 * auVar132._0_4_);
        bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar138._4_4_ = (float)((uint)bVar13 * auVar125._4_4_ | (uint)!bVar13 * auVar132._4_4_);
        bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar138._8_4_ = (float)((uint)bVar13 * auVar125._8_4_ | (uint)!bVar13 * auVar132._8_4_);
        bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar138._12_4_ = (float)((uint)bVar13 * auVar125._12_4_ | (uint)!bVar13 * auVar132._12_4_);
        bVar13 = (bool)((byte)(uVar100 >> 4) & 1);
        auVar138._16_4_ = (float)((uint)bVar13 * auVar125._16_4_ | (uint)!bVar13 * auVar132._16_4_);
        bVar13 = (bool)((byte)(uVar100 >> 5) & 1);
        auVar138._20_4_ = (float)((uint)bVar13 * auVar125._20_4_ | (uint)!bVar13 * auVar132._20_4_);
        bVar13 = (bool)((byte)(uVar100 >> 6) & 1);
        auVar138._24_4_ = (float)((uint)bVar13 * auVar125._24_4_ | (uint)!bVar13 * auVar132._24_4_);
        bVar13 = SUB81(uVar100 >> 7,0);
        auVar138._28_4_ = (uint)bVar13 * auVar125._28_4_ | (uint)!bVar13 * auVar132._28_4_;
        bVar13 = (bool)((byte)uVar100 & 1);
        auVar139._0_4_ = (float)((uint)bVar13 * auVar126._0_4_ | (uint)!bVar13 * auVar131._0_4_);
        bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar139._4_4_ = (float)((uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * auVar131._4_4_);
        bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar139._8_4_ = (float)((uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * auVar131._8_4_);
        bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar139._12_4_ = (float)((uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * auVar131._12_4_);
        bVar13 = (bool)((byte)(uVar100 >> 4) & 1);
        auVar139._16_4_ = (float)((uint)bVar13 * auVar126._16_4_ | (uint)!bVar13 * auVar131._16_4_);
        bVar13 = (bool)((byte)(uVar100 >> 5) & 1);
        auVar139._20_4_ = (float)((uint)bVar13 * auVar126._20_4_ | (uint)!bVar13 * auVar131._20_4_);
        bVar13 = (bool)((byte)(uVar100 >> 6) & 1);
        auVar139._24_4_ = (float)((uint)bVar13 * auVar126._24_4_ | (uint)!bVar13 * auVar131._24_4_);
        bVar13 = SUB81(uVar100 >> 7,0);
        auVar139._28_4_ = (uint)bVar13 * auVar126._28_4_ | (uint)!bVar13 * auVar131._28_4_;
        auVar118 = vxorps_avx512vl(auVar114,auVar114);
        auVar250 = ZEXT1664(auVar118);
        auVar134 = vfmadd213ps_avx512vl(auVar135,auVar135,ZEXT1632(auVar118));
        auVar114 = vfmadd231ps_fma(auVar134,auVar137,auVar137);
        auVar136 = vrsqrt14ps_avx512vl(ZEXT1632(auVar114));
        fVar202 = auVar136._0_4_;
        fVar216 = auVar136._4_4_;
        fVar218 = auVar136._8_4_;
        fVar219 = auVar136._12_4_;
        fVar197 = auVar136._16_4_;
        fVar201 = auVar136._20_4_;
        fVar108 = auVar136._24_4_;
        auVar134._4_4_ = fVar216 * fVar216 * fVar216 * auVar114._4_4_ * -0.5;
        auVar134._0_4_ = fVar202 * fVar202 * fVar202 * auVar114._0_4_ * -0.5;
        auVar134._8_4_ = fVar218 * fVar218 * fVar218 * auVar114._8_4_ * -0.5;
        auVar134._12_4_ = fVar219 * fVar219 * fVar219 * auVar114._12_4_ * -0.5;
        auVar134._16_4_ = fVar197 * fVar197 * fVar197 * -0.0;
        auVar134._20_4_ = fVar201 * fVar201 * fVar201 * -0.0;
        auVar134._24_4_ = fVar108 * fVar108 * fVar108 * -0.0;
        auVar134._28_4_ = auVar121._28_4_;
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar134 = vfmadd231ps_avx512vl(auVar134,auVar119,auVar136);
        auVar132._4_4_ = auVar137._4_4_ * auVar134._4_4_;
        auVar132._0_4_ = auVar137._0_4_ * auVar134._0_4_;
        auVar132._8_4_ = auVar137._8_4_ * auVar134._8_4_;
        auVar132._12_4_ = auVar137._12_4_ * auVar134._12_4_;
        auVar132._16_4_ = auVar137._16_4_ * auVar134._16_4_;
        auVar132._20_4_ = auVar137._20_4_ * auVar134._20_4_;
        auVar132._24_4_ = auVar137._24_4_ * auVar134._24_4_;
        auVar132._28_4_ = 0;
        auVar131._4_4_ = auVar134._4_4_ * -auVar135._4_4_;
        auVar131._0_4_ = auVar134._0_4_ * -auVar135._0_4_;
        auVar131._8_4_ = auVar134._8_4_ * -auVar135._8_4_;
        auVar131._12_4_ = auVar134._12_4_ * -auVar135._12_4_;
        auVar131._16_4_ = auVar134._16_4_ * -auVar135._16_4_;
        auVar131._20_4_ = auVar134._20_4_ * -auVar135._20_4_;
        auVar131._24_4_ = auVar134._24_4_ * -auVar135._24_4_;
        auVar131._28_4_ = auVar137._28_4_;
        auVar134 = vmulps_avx512vl(auVar134,ZEXT1632(auVar118));
        auVar125 = ZEXT1632(auVar118);
        auVar136 = vfmadd213ps_avx512vl(auVar138,auVar138,auVar125);
        auVar114 = vfmadd231ps_fma(auVar136,auVar139,auVar139);
        auVar136 = vrsqrt14ps_avx512vl(ZEXT1632(auVar114));
        fVar202 = auVar136._0_4_;
        fVar216 = auVar136._4_4_;
        fVar218 = auVar136._8_4_;
        fVar219 = auVar136._12_4_;
        fVar197 = auVar136._16_4_;
        fVar201 = auVar136._20_4_;
        fVar108 = auVar136._24_4_;
        auVar120._4_4_ = fVar216 * fVar216 * fVar216 * auVar114._4_4_ * -0.5;
        auVar120._0_4_ = fVar202 * fVar202 * fVar202 * auVar114._0_4_ * -0.5;
        auVar120._8_4_ = fVar218 * fVar218 * fVar218 * auVar114._8_4_ * -0.5;
        auVar120._12_4_ = fVar219 * fVar219 * fVar219 * auVar114._12_4_ * -0.5;
        auVar120._16_4_ = fVar197 * fVar197 * fVar197 * -0.0;
        auVar120._20_4_ = fVar201 * fVar201 * fVar201 * -0.0;
        auVar120._24_4_ = fVar108 * fVar108 * fVar108 * -0.0;
        auVar120._28_4_ = 0;
        auVar119 = vfmadd231ps_avx512vl(auVar120,auVar119,auVar136);
        auVar130._4_4_ = auVar139._4_4_ * auVar119._4_4_;
        auVar130._0_4_ = auVar139._0_4_ * auVar119._0_4_;
        auVar130._8_4_ = auVar139._8_4_ * auVar119._8_4_;
        auVar130._12_4_ = auVar139._12_4_ * auVar119._12_4_;
        auVar130._16_4_ = auVar139._16_4_ * auVar119._16_4_;
        auVar130._20_4_ = auVar139._20_4_ * auVar119._20_4_;
        auVar130._24_4_ = auVar139._24_4_ * auVar119._24_4_;
        auVar130._28_4_ = auVar136._28_4_;
        auVar121._4_4_ = -auVar138._4_4_ * auVar119._4_4_;
        auVar121._0_4_ = -auVar138._0_4_ * auVar119._0_4_;
        auVar121._8_4_ = -auVar138._8_4_ * auVar119._8_4_;
        auVar121._12_4_ = -auVar138._12_4_ * auVar119._12_4_;
        auVar121._16_4_ = -auVar138._16_4_ * auVar119._16_4_;
        auVar121._20_4_ = -auVar138._20_4_ * auVar119._20_4_;
        auVar121._24_4_ = -auVar138._24_4_ * auVar119._24_4_;
        auVar121._28_4_ = auVar138._28_4_ ^ 0x80000000;
        auVar136 = vmulps_avx512vl(auVar119,auVar125);
        auVar114 = vfmadd213ps_fma(auVar132,auVar127,auVar122);
        auVar113 = vfmadd213ps_fma(auVar131,auVar127,auVar123);
        auVar119 = vfmadd213ps_avx512vl(auVar134,auVar127,auVar133);
        auVar120 = vfmadd213ps_avx512vl(auVar130,ZEXT1632(auVar32),ZEXT1632(auVar30));
        auVar116 = vfnmadd213ps_fma(auVar132,auVar127,auVar122);
        auVar122 = ZEXT1632(auVar32);
        auVar115 = vfmadd213ps_fma(auVar121,auVar122,ZEXT1632(auVar31));
        auVar117 = vfnmadd213ps_fma(auVar131,auVar127,auVar123);
        auVar249 = vfmadd213ps_fma(auVar136,auVar122,auVar129);
        auVar132 = vfnmadd231ps_avx512vl(auVar133,auVar127,auVar134);
        auVar30 = vfnmadd213ps_fma(auVar130,auVar122,ZEXT1632(auVar30));
        auVar31 = vfnmadd213ps_fma(auVar121,auVar122,ZEXT1632(auVar31));
        auVar38 = vfnmadd231ps_fma(auVar129,ZEXT1632(auVar32),auVar136);
        auVar136 = vsubps_avx512vl(auVar120,ZEXT1632(auVar116));
        auVar134 = vsubps_avx(ZEXT1632(auVar115),ZEXT1632(auVar117));
        auVar131 = vsubps_avx512vl(ZEXT1632(auVar249),auVar132);
        auVar130 = vmulps_avx512vl(auVar134,auVar132);
        auVar28 = vfmsub231ps_fma(auVar130,ZEXT1632(auVar117),auVar131);
        auVar122._4_4_ = auVar116._4_4_ * auVar131._4_4_;
        auVar122._0_4_ = auVar116._0_4_ * auVar131._0_4_;
        auVar122._8_4_ = auVar116._8_4_ * auVar131._8_4_;
        auVar122._12_4_ = auVar116._12_4_ * auVar131._12_4_;
        auVar122._16_4_ = auVar131._16_4_ * 0.0;
        auVar122._20_4_ = auVar131._20_4_ * 0.0;
        auVar122._24_4_ = auVar131._24_4_ * 0.0;
        auVar122._28_4_ = auVar131._28_4_;
        auVar131 = vfmsub231ps_avx512vl(auVar122,auVar132,auVar136);
        auVar123._4_4_ = auVar117._4_4_ * auVar136._4_4_;
        auVar123._0_4_ = auVar117._0_4_ * auVar136._0_4_;
        auVar123._8_4_ = auVar117._8_4_ * auVar136._8_4_;
        auVar123._12_4_ = auVar117._12_4_ * auVar136._12_4_;
        auVar123._16_4_ = auVar136._16_4_ * 0.0;
        auVar123._20_4_ = auVar136._20_4_ * 0.0;
        auVar123._24_4_ = auVar136._24_4_ * 0.0;
        auVar123._28_4_ = auVar136._28_4_;
        auVar29 = vfmsub231ps_fma(auVar123,ZEXT1632(auVar116),auVar134);
        auVar134 = vfmadd231ps_avx512vl(ZEXT1632(auVar29),auVar125,auVar131);
        auVar134 = vfmadd231ps_avx512vl(auVar134,auVar125,ZEXT1632(auVar28));
        auVar135 = ZEXT1632(auVar118);
        uVar100 = vcmpps_avx512vl(auVar134,auVar135,2);
        bVar99 = (byte)uVar100;
        fVar108 = (float)((uint)(bVar99 & 1) * auVar114._0_4_ |
                         (uint)!(bool)(bVar99 & 1) * auVar30._0_4_);
        bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
        fVar160 = (float)((uint)bVar13 * auVar114._4_4_ | (uint)!bVar13 * auVar30._4_4_);
        bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
        fVar162 = (float)((uint)bVar13 * auVar114._8_4_ | (uint)!bVar13 * auVar30._8_4_);
        bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
        fVar164 = (float)((uint)bVar13 * auVar114._12_4_ | (uint)!bVar13 * auVar30._12_4_);
        auVar130 = ZEXT1632(CONCAT412(fVar164,CONCAT48(fVar162,CONCAT44(fVar160,fVar108))));
        fVar109 = (float)((uint)(bVar99 & 1) * auVar113._0_4_ |
                         (uint)!(bool)(bVar99 & 1) * auVar31._0_4_);
        bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
        fVar161 = (float)((uint)bVar13 * auVar113._4_4_ | (uint)!bVar13 * auVar31._4_4_);
        bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
        fVar163 = (float)((uint)bVar13 * auVar113._8_4_ | (uint)!bVar13 * auVar31._8_4_);
        bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
        fVar165 = (float)((uint)bVar13 * auVar113._12_4_ | (uint)!bVar13 * auVar31._12_4_);
        auVar121 = ZEXT1632(CONCAT412(fVar165,CONCAT48(fVar163,CONCAT44(fVar161,fVar109))));
        auVar133._0_4_ =
             (float)((uint)(bVar99 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar99 & 1) * auVar38._0_4_
                    );
        bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar133._4_4_ = (float)((uint)bVar13 * auVar119._4_4_ | (uint)!bVar13 * auVar38._4_4_);
        bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar133._8_4_ = (float)((uint)bVar13 * auVar119._8_4_ | (uint)!bVar13 * auVar38._8_4_);
        bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar133._12_4_ = (float)((uint)bVar13 * auVar119._12_4_ | (uint)!bVar13 * auVar38._12_4_);
        fVar216 = (float)((uint)((byte)(uVar100 >> 4) & 1) * auVar119._16_4_);
        auVar133._16_4_ = fVar216;
        fVar202 = (float)((uint)((byte)(uVar100 >> 5) & 1) * auVar119._20_4_);
        auVar133._20_4_ = fVar202;
        fVar218 = (float)((uint)((byte)(uVar100 >> 6) & 1) * auVar119._24_4_);
        auVar133._24_4_ = fVar218;
        iVar1 = (uint)(byte)(uVar100 >> 7) * auVar119._28_4_;
        auVar133._28_4_ = iVar1;
        auVar136 = vblendmps_avx512vl(ZEXT1632(auVar116),auVar120);
        auVar140._0_4_ =
             (uint)(bVar99 & 1) * auVar136._0_4_ | (uint)!(bool)(bVar99 & 1) * auVar28._0_4_;
        bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar140._4_4_ = (uint)bVar13 * auVar136._4_4_ | (uint)!bVar13 * auVar28._4_4_;
        bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar140._8_4_ = (uint)bVar13 * auVar136._8_4_ | (uint)!bVar13 * auVar28._8_4_;
        bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar140._12_4_ = (uint)bVar13 * auVar136._12_4_ | (uint)!bVar13 * auVar28._12_4_;
        auVar140._16_4_ = (uint)((byte)(uVar100 >> 4) & 1) * auVar136._16_4_;
        auVar140._20_4_ = (uint)((byte)(uVar100 >> 5) & 1) * auVar136._20_4_;
        auVar140._24_4_ = (uint)((byte)(uVar100 >> 6) & 1) * auVar136._24_4_;
        auVar140._28_4_ = (uint)(byte)(uVar100 >> 7) * auVar136._28_4_;
        auVar136 = vblendmps_avx512vl(ZEXT1632(auVar117),ZEXT1632(auVar115));
        auVar141._0_4_ =
             (float)((uint)(bVar99 & 1) * auVar136._0_4_ |
                    (uint)!(bool)(bVar99 & 1) * auVar113._0_4_);
        bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar141._4_4_ = (float)((uint)bVar13 * auVar136._4_4_ | (uint)!bVar13 * auVar113._4_4_);
        bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar141._8_4_ = (float)((uint)bVar13 * auVar136._8_4_ | (uint)!bVar13 * auVar113._8_4_);
        bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar141._12_4_ = (float)((uint)bVar13 * auVar136._12_4_ | (uint)!bVar13 * auVar113._12_4_);
        fVar219 = (float)((uint)((byte)(uVar100 >> 4) & 1) * auVar136._16_4_);
        auVar141._16_4_ = fVar219;
        fVar197 = (float)((uint)((byte)(uVar100 >> 5) & 1) * auVar136._20_4_);
        auVar141._20_4_ = fVar197;
        fVar201 = (float)((uint)((byte)(uVar100 >> 6) & 1) * auVar136._24_4_);
        auVar141._24_4_ = fVar201;
        auVar141._28_4_ = (uint)(byte)(uVar100 >> 7) * auVar136._28_4_;
        auVar136 = vblendmps_avx512vl(auVar132,ZEXT1632(auVar249));
        auVar142._0_4_ =
             (float)((uint)(bVar99 & 1) * auVar136._0_4_ |
                    (uint)!(bool)(bVar99 & 1) * auVar119._0_4_);
        bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar142._4_4_ = (float)((uint)bVar13 * auVar136._4_4_ | (uint)!bVar13 * auVar119._4_4_);
        bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar142._8_4_ = (float)((uint)bVar13 * auVar136._8_4_ | (uint)!bVar13 * auVar119._8_4_);
        bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar142._12_4_ = (float)((uint)bVar13 * auVar136._12_4_ | (uint)!bVar13 * auVar119._12_4_);
        bVar13 = (bool)((byte)(uVar100 >> 4) & 1);
        auVar142._16_4_ = (float)((uint)bVar13 * auVar136._16_4_ | (uint)!bVar13 * auVar119._16_4_);
        bVar13 = (bool)((byte)(uVar100 >> 5) & 1);
        auVar142._20_4_ = (float)((uint)bVar13 * auVar136._20_4_ | (uint)!bVar13 * auVar119._20_4_);
        bVar13 = (bool)((byte)(uVar100 >> 6) & 1);
        auVar142._24_4_ = (float)((uint)bVar13 * auVar136._24_4_ | (uint)!bVar13 * auVar119._24_4_);
        bVar13 = SUB81(uVar100 >> 7,0);
        auVar142._28_4_ = (uint)bVar13 * auVar136._28_4_ | (uint)!bVar13 * auVar119._28_4_;
        auVar143._0_4_ =
             (uint)(bVar99 & 1) * (int)auVar116._0_4_ | (uint)!(bool)(bVar99 & 1) * auVar120._0_4_;
        bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar143._4_4_ = (uint)bVar13 * (int)auVar116._4_4_ | (uint)!bVar13 * auVar120._4_4_;
        bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar143._8_4_ = (uint)bVar13 * (int)auVar116._8_4_ | (uint)!bVar13 * auVar120._8_4_;
        bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar143._12_4_ = (uint)bVar13 * (int)auVar116._12_4_ | (uint)!bVar13 * auVar120._12_4_;
        auVar143._16_4_ = (uint)!(bool)((byte)(uVar100 >> 4) & 1) * auVar120._16_4_;
        auVar143._20_4_ = (uint)!(bool)((byte)(uVar100 >> 5) & 1) * auVar120._20_4_;
        auVar143._24_4_ = (uint)!(bool)((byte)(uVar100 >> 6) & 1) * auVar120._24_4_;
        auVar143._28_4_ = (uint)!SUB81(uVar100 >> 7,0) * auVar120._28_4_;
        bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar144._0_4_ =
             (uint)(bVar99 & 1) * auVar132._0_4_ | (uint)!(bool)(bVar99 & 1) * auVar249._0_4_;
        bVar14 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar144._4_4_ = (uint)bVar14 * auVar132._4_4_ | (uint)!bVar14 * auVar249._4_4_;
        bVar14 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar144._8_4_ = (uint)bVar14 * auVar132._8_4_ | (uint)!bVar14 * auVar249._8_4_;
        bVar14 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar144._12_4_ = (uint)bVar14 * auVar132._12_4_ | (uint)!bVar14 * auVar249._12_4_;
        auVar144._16_4_ = (uint)((byte)(uVar100 >> 4) & 1) * auVar132._16_4_;
        auVar144._20_4_ = (uint)((byte)(uVar100 >> 5) & 1) * auVar132._20_4_;
        auVar144._24_4_ = (uint)((byte)(uVar100 >> 6) & 1) * auVar132._24_4_;
        iVar2 = (uint)(byte)(uVar100 >> 7) * auVar132._28_4_;
        auVar144._28_4_ = iVar2;
        auVar122 = vsubps_avx512vl(auVar143,auVar130);
        auVar136 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar117._12_4_ |
                                                 (uint)!bVar16 * auVar115._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar117._8_4_ |
                                                          (uint)!bVar15 * auVar115._8_4_,
                                                          CONCAT44((uint)bVar13 *
                                                                   (int)auVar117._4_4_ |
                                                                   (uint)!bVar13 * auVar115._4_4_,
                                                                   (uint)(bVar99 & 1) *
                                                                   (int)auVar117._0_4_ |
                                                                   (uint)!(bool)(bVar99 & 1) *
                                                                   auVar115._0_4_)))),auVar121);
        auVar132 = vsubps_avx(auVar144,auVar133);
        auVar131 = vsubps_avx(auVar130,auVar140);
        auVar119 = vsubps_avx(auVar121,auVar141);
        auVar120 = vsubps_avx(auVar133,auVar142);
        auVar125._4_4_ = auVar132._4_4_ * fVar160;
        auVar125._0_4_ = auVar132._0_4_ * fVar108;
        auVar125._8_4_ = auVar132._8_4_ * fVar162;
        auVar125._12_4_ = auVar132._12_4_ * fVar164;
        auVar125._16_4_ = auVar132._16_4_ * 0.0;
        auVar125._20_4_ = auVar132._20_4_ * 0.0;
        auVar125._24_4_ = auVar132._24_4_ * 0.0;
        auVar125._28_4_ = iVar2;
        auVar114 = vfmsub231ps_fma(auVar125,auVar133,auVar122);
        auVar126._4_4_ = fVar161 * auVar122._4_4_;
        auVar126._0_4_ = fVar109 * auVar122._0_4_;
        auVar126._8_4_ = fVar163 * auVar122._8_4_;
        auVar126._12_4_ = fVar165 * auVar122._12_4_;
        auVar126._16_4_ = auVar122._16_4_ * 0.0;
        auVar126._20_4_ = auVar122._20_4_ * 0.0;
        auVar126._24_4_ = auVar122._24_4_ * 0.0;
        auVar126._28_4_ = auVar134._28_4_;
        auVar113 = vfmsub231ps_fma(auVar126,auVar130,auVar136);
        auVar134 = vfmadd231ps_avx512vl(ZEXT1632(auVar113),auVar135,ZEXT1632(auVar114));
        auVar212._0_4_ = auVar136._0_4_ * auVar133._0_4_;
        auVar212._4_4_ = auVar136._4_4_ * auVar133._4_4_;
        auVar212._8_4_ = auVar136._8_4_ * auVar133._8_4_;
        auVar212._12_4_ = auVar136._12_4_ * auVar133._12_4_;
        auVar212._16_4_ = auVar136._16_4_ * fVar216;
        auVar212._20_4_ = auVar136._20_4_ * fVar202;
        auVar212._24_4_ = auVar136._24_4_ * fVar218;
        auVar212._28_4_ = 0;
        auVar114 = vfmsub231ps_fma(auVar212,auVar121,auVar132);
        auVar123 = vfmadd231ps_avx512vl(auVar134,auVar135,ZEXT1632(auVar114));
        auVar134 = vmulps_avx512vl(auVar120,auVar140);
        auVar134 = vfmsub231ps_avx512vl(auVar134,auVar131,auVar142);
        auVar129._4_4_ = auVar119._4_4_ * auVar142._4_4_;
        auVar129._0_4_ = auVar119._0_4_ * auVar142._0_4_;
        auVar129._8_4_ = auVar119._8_4_ * auVar142._8_4_;
        auVar129._12_4_ = auVar119._12_4_ * auVar142._12_4_;
        auVar129._16_4_ = auVar119._16_4_ * auVar142._16_4_;
        auVar129._20_4_ = auVar119._20_4_ * auVar142._20_4_;
        auVar129._24_4_ = auVar119._24_4_ * auVar142._24_4_;
        auVar129._28_4_ = auVar142._28_4_;
        auVar114 = vfmsub231ps_fma(auVar129,auVar141,auVar120);
        auVar213._0_4_ = auVar141._0_4_ * auVar131._0_4_;
        auVar213._4_4_ = auVar141._4_4_ * auVar131._4_4_;
        auVar213._8_4_ = auVar141._8_4_ * auVar131._8_4_;
        auVar213._12_4_ = auVar141._12_4_ * auVar131._12_4_;
        auVar213._16_4_ = fVar219 * auVar131._16_4_;
        auVar213._20_4_ = fVar197 * auVar131._20_4_;
        auVar213._24_4_ = fVar201 * auVar131._24_4_;
        auVar213._28_4_ = 0;
        auVar113 = vfmsub231ps_fma(auVar213,auVar119,auVar140);
        auVar134 = vfmadd231ps_avx512vl(ZEXT1632(auVar113),auVar135,auVar134);
        auVar125 = vfmadd231ps_avx512vl(auVar134,auVar135,ZEXT1632(auVar114));
        auVar134 = vmaxps_avx(auVar123,auVar125);
        uVar168 = vcmpps_avx512vl(auVar134,auVar135,2);
        bVar107 = bVar107 & (byte)uVar168;
        auVar246 = ZEXT3264(local_720);
        auVar247 = ZEXT3264(local_700);
        auVar248 = ZEXT3264(local_740);
        auVar245 = ZEXT3264(local_900);
        auVar241 = ZEXT1664(_local_8e0);
        if (bVar107 == 0) {
          bVar107 = 0;
        }
        else {
          auVar54._4_4_ = auVar120._4_4_ * auVar136._4_4_;
          auVar54._0_4_ = auVar120._0_4_ * auVar136._0_4_;
          auVar54._8_4_ = auVar120._8_4_ * auVar136._8_4_;
          auVar54._12_4_ = auVar120._12_4_ * auVar136._12_4_;
          auVar54._16_4_ = auVar120._16_4_ * auVar136._16_4_;
          auVar54._20_4_ = auVar120._20_4_ * auVar136._20_4_;
          auVar54._24_4_ = auVar120._24_4_ * auVar136._24_4_;
          auVar54._28_4_ = auVar134._28_4_;
          auVar115 = vfmsub231ps_fma(auVar54,auVar119,auVar132);
          auVar55._4_4_ = auVar132._4_4_ * auVar131._4_4_;
          auVar55._0_4_ = auVar132._0_4_ * auVar131._0_4_;
          auVar55._8_4_ = auVar132._8_4_ * auVar131._8_4_;
          auVar55._12_4_ = auVar132._12_4_ * auVar131._12_4_;
          auVar55._16_4_ = auVar132._16_4_ * auVar131._16_4_;
          auVar55._20_4_ = auVar132._20_4_ * auVar131._20_4_;
          auVar55._24_4_ = auVar132._24_4_ * auVar131._24_4_;
          auVar55._28_4_ = auVar132._28_4_;
          auVar113 = vfmsub231ps_fma(auVar55,auVar122,auVar120);
          auVar56._4_4_ = auVar119._4_4_ * auVar122._4_4_;
          auVar56._0_4_ = auVar119._0_4_ * auVar122._0_4_;
          auVar56._8_4_ = auVar119._8_4_ * auVar122._8_4_;
          auVar56._12_4_ = auVar119._12_4_ * auVar122._12_4_;
          auVar56._16_4_ = auVar119._16_4_ * auVar122._16_4_;
          auVar56._20_4_ = auVar119._20_4_ * auVar122._20_4_;
          auVar56._24_4_ = auVar119._24_4_ * auVar122._24_4_;
          auVar56._28_4_ = auVar119._28_4_;
          auVar249 = vfmsub231ps_fma(auVar56,auVar131,auVar136);
          auVar114 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar113),ZEXT1632(auVar249));
          auVar134 = vfmadd231ps_avx512vl(ZEXT1632(auVar114),ZEXT1632(auVar115),auVar135);
          auVar136 = vrcp14ps_avx512vl(auVar134);
          auVar45._8_4_ = 0x3f800000;
          auVar45._0_8_ = &DAT_3f8000003f800000;
          auVar45._12_4_ = 0x3f800000;
          auVar45._16_4_ = 0x3f800000;
          auVar45._20_4_ = 0x3f800000;
          auVar45._24_4_ = 0x3f800000;
          auVar45._28_4_ = 0x3f800000;
          auVar132 = vfnmadd213ps_avx512vl(auVar136,auVar134,auVar45);
          auVar114 = vfmadd132ps_fma(auVar132,auVar136,auVar136);
          auVar57._4_4_ = auVar249._4_4_ * auVar133._4_4_;
          auVar57._0_4_ = auVar249._0_4_ * auVar133._0_4_;
          auVar57._8_4_ = auVar249._8_4_ * auVar133._8_4_;
          auVar57._12_4_ = auVar249._12_4_ * auVar133._12_4_;
          auVar57._16_4_ = fVar216 * 0.0;
          auVar57._20_4_ = fVar202 * 0.0;
          auVar57._24_4_ = fVar218 * 0.0;
          auVar57._28_4_ = iVar1;
          auVar113 = vfmadd231ps_fma(auVar57,auVar121,ZEXT1632(auVar113));
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar130,ZEXT1632(auVar115));
          fVar202 = auVar114._0_4_;
          fVar216 = auVar114._4_4_;
          fVar218 = auVar114._8_4_;
          fVar219 = auVar114._12_4_;
          auVar136 = ZEXT1632(CONCAT412(auVar113._12_4_ * fVar219,
                                        CONCAT48(auVar113._8_4_ * fVar218,
                                                 CONCAT44(auVar113._4_4_ * fVar216,
                                                          auVar113._0_4_ * fVar202))));
          auVar231._4_4_ = fVar203;
          auVar231._0_4_ = fVar203;
          auVar231._8_4_ = fVar203;
          auVar231._12_4_ = fVar203;
          auVar231._16_4_ = fVar203;
          auVar231._20_4_ = fVar203;
          auVar231._24_4_ = fVar203;
          auVar231._28_4_ = fVar203;
          uVar168 = vcmpps_avx512vl(auVar231,auVar136,2);
          uVar167 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar46._4_4_ = uVar167;
          auVar46._0_4_ = uVar167;
          auVar46._8_4_ = uVar167;
          auVar46._12_4_ = uVar167;
          auVar46._16_4_ = uVar167;
          auVar46._20_4_ = uVar167;
          auVar46._24_4_ = uVar167;
          auVar46._28_4_ = uVar167;
          uVar33 = vcmpps_avx512vl(auVar136,auVar46,2);
          bVar107 = (byte)uVar168 & (byte)uVar33 & bVar107;
          if (bVar107 != 0) {
            uVar168 = vcmpps_avx512vl(auVar134,auVar135,4);
            if ((bVar107 & (byte)uVar168) != 0) {
              bVar107 = bVar107 & (byte)uVar168;
              fVar197 = auVar123._0_4_ * fVar202;
              fVar201 = auVar123._4_4_ * fVar216;
              auVar58._4_4_ = fVar201;
              auVar58._0_4_ = fVar197;
              fVar108 = auVar123._8_4_ * fVar218;
              auVar58._8_4_ = fVar108;
              fVar109 = auVar123._12_4_ * fVar219;
              auVar58._12_4_ = fVar109;
              fVar160 = auVar123._16_4_ * 0.0;
              auVar58._16_4_ = fVar160;
              fVar161 = auVar123._20_4_ * 0.0;
              auVar58._20_4_ = fVar161;
              fVar162 = auVar123._24_4_ * 0.0;
              auVar58._24_4_ = fVar162;
              auVar58._28_4_ = auVar123._28_4_;
              fVar202 = auVar125._0_4_ * fVar202;
              fVar216 = auVar125._4_4_ * fVar216;
              auVar59._4_4_ = fVar216;
              auVar59._0_4_ = fVar202;
              fVar218 = auVar125._8_4_ * fVar218;
              auVar59._8_4_ = fVar218;
              fVar219 = auVar125._12_4_ * fVar219;
              auVar59._12_4_ = fVar219;
              fVar163 = auVar125._16_4_ * 0.0;
              auVar59._16_4_ = fVar163;
              fVar164 = auVar125._20_4_ * 0.0;
              auVar59._20_4_ = fVar164;
              fVar165 = auVar125._24_4_ * 0.0;
              auVar59._24_4_ = fVar165;
              auVar59._28_4_ = auVar125._28_4_;
              auVar225._8_4_ = 0x3f800000;
              auVar225._0_8_ = &DAT_3f8000003f800000;
              auVar225._12_4_ = 0x3f800000;
              auVar225._16_4_ = 0x3f800000;
              auVar225._20_4_ = 0x3f800000;
              auVar225._24_4_ = 0x3f800000;
              auVar225._28_4_ = 0x3f800000;
              auVar134 = vsubps_avx(auVar225,auVar58);
              local_840._0_4_ =
                   (uint)(bVar99 & 1) * (int)fVar197 | (uint)!(bool)(bVar99 & 1) * auVar134._0_4_;
              bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
              local_840._4_4_ = (uint)bVar13 * (int)fVar201 | (uint)!bVar13 * auVar134._4_4_;
              bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
              local_840._8_4_ = (uint)bVar13 * (int)fVar108 | (uint)!bVar13 * auVar134._8_4_;
              bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
              local_840._12_4_ = (uint)bVar13 * (int)fVar109 | (uint)!bVar13 * auVar134._12_4_;
              bVar13 = (bool)((byte)(uVar100 >> 4) & 1);
              local_840._16_4_ = (uint)bVar13 * (int)fVar160 | (uint)!bVar13 * auVar134._16_4_;
              bVar13 = (bool)((byte)(uVar100 >> 5) & 1);
              local_840._20_4_ = (uint)bVar13 * (int)fVar161 | (uint)!bVar13 * auVar134._20_4_;
              bVar13 = (bool)((byte)(uVar100 >> 6) & 1);
              local_840._24_4_ = (uint)bVar13 * (int)fVar162 | (uint)!bVar13 * auVar134._24_4_;
              bVar13 = SUB81(uVar100 >> 7,0);
              local_840._28_4_ = (uint)bVar13 * auVar123._28_4_ | (uint)!bVar13 * auVar134._28_4_;
              auVar134 = vsubps_avx(auVar225,auVar59);
              local_520._0_4_ =
                   (uint)(bVar99 & 1) * (int)fVar202 | (uint)!(bool)(bVar99 & 1) * auVar134._0_4_;
              bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
              local_520._4_4_ = (uint)bVar13 * (int)fVar216 | (uint)!bVar13 * auVar134._4_4_;
              bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
              local_520._8_4_ = (uint)bVar13 * (int)fVar218 | (uint)!bVar13 * auVar134._8_4_;
              bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
              local_520._12_4_ = (uint)bVar13 * (int)fVar219 | (uint)!bVar13 * auVar134._12_4_;
              bVar13 = (bool)((byte)(uVar100 >> 4) & 1);
              local_520._16_4_ = (uint)bVar13 * (int)fVar163 | (uint)!bVar13 * auVar134._16_4_;
              bVar13 = (bool)((byte)(uVar100 >> 5) & 1);
              local_520._20_4_ = (uint)bVar13 * (int)fVar164 | (uint)!bVar13 * auVar134._20_4_;
              bVar13 = (bool)((byte)(uVar100 >> 6) & 1);
              local_520._24_4_ = (uint)bVar13 * (int)fVar165 | (uint)!bVar13 * auVar134._24_4_;
              bVar13 = SUB81(uVar100 >> 7,0);
              local_520._28_4_ = (uint)bVar13 * auVar125._28_4_ | (uint)!bVar13 * auVar134._28_4_;
              local_860 = auVar136;
              goto LAB_01c514d5;
            }
          }
          bVar107 = 0;
        }
LAB_01c514d5:
        auVar252 = ZEXT3264(local_820);
        auVar183 = ZEXT3264(local_800);
        auVar251 = ZEXT3264(local_7e0);
        auVar254 = ZEXT3264(auVar124);
        if (bVar107 != 0) {
          auVar134 = vsubps_avx(ZEXT1632(auVar32),auVar127);
          auVar114 = vfmadd213ps_fma(auVar134,local_840,auVar127);
          uVar167 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
          auVar127._4_4_ = uVar167;
          auVar127._0_4_ = uVar167;
          auVar127._8_4_ = uVar167;
          auVar127._12_4_ = uVar167;
          auVar127._16_4_ = uVar167;
          auVar127._20_4_ = uVar167;
          auVar127._24_4_ = uVar167;
          auVar127._28_4_ = uVar167;
          auVar134 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar114._12_4_ + auVar114._12_4_,
                                                        CONCAT48(auVar114._8_4_ + auVar114._8_4_,
                                                                 CONCAT44(auVar114._4_4_ +
                                                                          auVar114._4_4_,
                                                                          auVar114._0_4_ +
                                                                          auVar114._0_4_)))),
                                     auVar127);
          uVar168 = vcmpps_avx512vl(local_860,auVar134,6);
          bVar107 = bVar107 & (byte)uVar168;
          if (bVar107 != 0) {
            auVar177._8_4_ = 0xbf800000;
            auVar177._0_8_ = 0xbf800000bf800000;
            auVar177._12_4_ = 0xbf800000;
            auVar177._16_4_ = 0xbf800000;
            auVar177._20_4_ = 0xbf800000;
            auVar177._24_4_ = 0xbf800000;
            auVar177._28_4_ = 0xbf800000;
            auVar47._8_4_ = 0x40000000;
            auVar47._0_8_ = 0x4000000040000000;
            auVar47._12_4_ = 0x40000000;
            auVar47._16_4_ = 0x40000000;
            auVar47._20_4_ = 0x40000000;
            auVar47._24_4_ = 0x40000000;
            auVar47._28_4_ = 0x40000000;
            local_680 = vfmadd132ps_avx512vl(local_520,auVar177,auVar47);
            local_520 = local_680;
            auVar134 = local_520;
            local_640 = 0;
            local_630 = local_970;
            uStack_628 = uStack_968;
            local_620 = local_8b0._0_8_;
            uStack_618 = local_8b0._8_8_;
            local_610 = local_8c0._0_8_;
            uStack_608 = local_8c0._8_8_;
            local_600 = local_8d0;
            uStack_5f8 = uStack_8c8;
            local_520 = auVar134;
            if ((pGVar104->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
              fVar202 = 1.0 / auVar128._0_4_;
              local_5e0[0] = fVar202 * (local_840._0_4_ + 0.0);
              local_5e0[1] = fVar202 * (local_840._4_4_ + 1.0);
              local_5e0[2] = fVar202 * (local_840._8_4_ + 2.0);
              local_5e0[3] = fVar202 * (local_840._12_4_ + 3.0);
              fStack_5d0 = fVar202 * (local_840._16_4_ + 4.0);
              fStack_5cc = fVar202 * (local_840._20_4_ + 5.0);
              fStack_5c8 = fVar202 * (local_840._24_4_ + 6.0);
              fStack_5c4 = local_840._28_4_ + 7.0;
              local_520._0_8_ = local_680._0_8_;
              local_520._8_8_ = local_680._8_8_;
              local_520._16_8_ = local_680._16_8_;
              local_520._24_8_ = local_680._24_8_;
              local_5c0 = local_520._0_8_;
              uStack_5b8 = local_520._8_8_;
              uStack_5b0 = local_520._16_8_;
              uStack_5a8 = local_520._24_8_;
              local_5a0 = local_860;
              auVar178._8_4_ = 0x7f800000;
              auVar178._0_8_ = 0x7f8000007f800000;
              auVar178._12_4_ = 0x7f800000;
              auVar178._16_4_ = 0x7f800000;
              auVar178._20_4_ = 0x7f800000;
              auVar178._24_4_ = 0x7f800000;
              auVar178._28_4_ = 0x7f800000;
              auVar134 = vblendmps_avx512vl(auVar178,local_860);
              auVar145._0_4_ =
                   (uint)(bVar107 & 1) * auVar134._0_4_ | (uint)!(bool)(bVar107 & 1) * 0x7f800000;
              bVar13 = (bool)(bVar107 >> 1 & 1);
              auVar145._4_4_ = (uint)bVar13 * auVar134._4_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar107 >> 2 & 1);
              auVar145._8_4_ = (uint)bVar13 * auVar134._8_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar107 >> 3 & 1);
              auVar145._12_4_ = (uint)bVar13 * auVar134._12_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar107 >> 4 & 1);
              auVar145._16_4_ = (uint)bVar13 * auVar134._16_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar107 >> 5 & 1);
              auVar145._20_4_ = (uint)bVar13 * auVar134._20_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar107 >> 6 & 1);
              auVar145._24_4_ = (uint)bVar13 * auVar134._24_4_ | (uint)!bVar13 * 0x7f800000;
              auVar145._28_4_ =
                   (uint)(bVar107 >> 7) * auVar134._28_4_ | (uint)!(bool)(bVar107 >> 7) * 0x7f800000
              ;
              auVar134 = vshufps_avx(auVar145,auVar145,0xb1);
              auVar134 = vminps_avx(auVar145,auVar134);
              auVar136 = vshufpd_avx(auVar134,auVar134,5);
              auVar134 = vminps_avx(auVar134,auVar136);
              auVar136 = vpermpd_avx2(auVar134,0x4e);
              auVar134 = vminps_avx(auVar134,auVar136);
              uVar168 = vcmpps_avx512vl(auVar145,auVar134,0);
              bVar98 = (byte)uVar168 & bVar107;
              bVar99 = bVar107;
              if (bVar98 != 0) {
                bVar99 = bVar98;
              }
              uVar35 = 0;
              for (uVar101 = (uint)bVar99; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x80000000)
              {
                uVar35 = uVar35 + 1;
              }
              uVar100 = (ulong)uVar35;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar104->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar202 = local_5e0[uVar100];
                uVar167 = *(undefined4 *)((long)&local_5c0 + uVar100 * 4);
                fVar216 = 1.0 - fVar202;
                auVar40._8_4_ = 0x80000000;
                auVar40._0_8_ = 0x8000000080000000;
                auVar40._12_4_ = 0x80000000;
                auVar115 = vxorps_avx512vl(ZEXT416((uint)fVar216),auVar40);
                auVar114 = ZEXT416((uint)(fVar202 * fVar216 * 4.0));
                auVar113 = vfnmsub213ss_fma(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),auVar114);
                auVar114 = vfmadd213ss_fma(ZEXT416((uint)fVar216),ZEXT416((uint)fVar216),auVar114);
                fVar216 = fVar216 * auVar115._0_4_ * 0.5;
                fVar218 = auVar113._0_4_ * 0.5;
                fVar219 = auVar114._0_4_ * 0.5;
                fVar197 = fVar202 * fVar202 * 0.5;
                auVar206._0_4_ = fVar197 * (float)local_8d0._0_4_;
                auVar206._4_4_ = fVar197 * (float)local_8d0._4_4_;
                auVar206._8_4_ = fVar197 * (float)uStack_8c8;
                auVar206._12_4_ = fVar197 * uStack_8c8._4_4_;
                auVar193._4_4_ = fVar219;
                auVar193._0_4_ = fVar219;
                auVar193._8_4_ = fVar219;
                auVar193._12_4_ = fVar219;
                auVar114 = vfmadd132ps_fma(auVar193,auVar206,local_8c0);
                auVar207._4_4_ = fVar218;
                auVar207._0_4_ = fVar218;
                auVar207._8_4_ = fVar218;
                auVar207._12_4_ = fVar218;
                auVar114 = vfmadd132ps_fma(auVar207,auVar114,local_8b0);
                auVar194._4_4_ = fVar216;
                auVar194._0_4_ = fVar216;
                auVar194._8_4_ = fVar216;
                auVar194._12_4_ = fVar216;
                auVar114 = vfmadd132ps_fma(auVar194,auVar114,auVar27);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5a0 + uVar100 * 4);
                *(int *)(ray + k * 4 + 0x300) = auVar114._0_4_;
                uVar9 = vextractps_avx(auVar114,1);
                *(undefined4 *)(ray + k * 4 + 0x340) = uVar9;
                uVar9 = vextractps_avx(auVar114,2);
                *(undefined4 *)(ray + k * 4 + 0x380) = uVar9;
                *(float *)(ray + k * 4 + 0x3c0) = fVar202;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar167;
                *(uint *)(ray + k * 4 + 0x440) = uVar7;
                *(uint *)(ray + k * 4 + 0x480) = uVar105;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
              }
              else {
                auVar158 = vpbroadcastd_avx512f();
                local_480 = vmovdqa64_avx512f(auVar158);
                auVar158 = vpbroadcastd_avx512f();
                local_4c0 = vmovdqa64_avx512f(auVar158);
                local_7a0 = local_8b0._0_4_;
                uStack_79c = local_8b0._4_4_;
                uStack_798 = local_8b0._8_8_;
                local_7b0 = local_8c0._0_8_;
                uStack_7a8 = local_8c0._8_8_;
                local_7c0 = (float)local_8d0._0_4_;
                fStack_7bc = (float)local_8d0._4_4_;
                fStack_7b8 = (float)uStack_8c8;
                fStack_7b4 = uStack_8c8._4_4_;
                local_780 = fVar203;
                local_760 = auVar124;
                local_6a0 = local_840;
                local_660 = local_860;
                local_63c = iVar8;
                local_5f0 = bVar107;
                do {
                  auVar249 = auVar250._0_16_;
                  local_440._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_5e0[uVar100]));
                  local_1c0 = vbroadcastss_avx512f
                                        (ZEXT416(*(uint *)((long)&local_5c0 + uVar100 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5a0 + uVar100 * 4);
                  local_960.context = context->user;
                  fVar218 = local_200._0_4_;
                  fVar217 = 1.0 - fVar218;
                  auVar44._8_4_ = 0x80000000;
                  auVar44._0_8_ = 0x8000000080000000;
                  auVar44._12_4_ = 0x80000000;
                  auVar115 = vxorps_avx512vl(ZEXT416((uint)fVar217),auVar44);
                  auVar114 = ZEXT416((uint)(fVar218 * fVar217 * 4.0));
                  auVar113 = vfnmsub213ss_fma(local_200._0_16_,local_200._0_16_,auVar114);
                  auVar114 = vfmadd213ss_fma(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),auVar114)
                  ;
                  fVar217 = fVar217 * auVar115._0_4_ * 0.5;
                  fVar202 = auVar113._0_4_ * 0.5;
                  fVar216 = auVar114._0_4_ * 0.5;
                  fVar218 = fVar218 * fVar218 * 0.5;
                  auVar224._0_4_ = fVar218 * local_7c0;
                  auVar224._4_4_ = fVar218 * fStack_7bc;
                  auVar224._8_4_ = fVar218 * fStack_7b8;
                  auVar224._12_4_ = fVar218 * fStack_7b4;
                  auVar175._4_4_ = fVar216;
                  auVar175._0_4_ = fVar216;
                  auVar175._8_4_ = fVar216;
                  auVar175._12_4_ = fVar216;
                  auVar94._8_8_ = uStack_7a8;
                  auVar94._0_8_ = local_7b0;
                  auVar114 = vfmadd132ps_fma(auVar175,auVar224,auVar94);
                  auVar211._4_4_ = fVar202;
                  auVar211._0_4_ = fVar202;
                  auVar211._8_4_ = fVar202;
                  auVar211._12_4_ = fVar202;
                  auVar95._4_4_ = uStack_79c;
                  auVar95._0_4_ = local_7a0;
                  auVar95._8_8_ = uStack_798;
                  auVar114 = vfmadd132ps_fma(auVar211,auVar114,auVar95);
                  auVar176._4_4_ = fVar217;
                  auVar176._0_4_ = fVar217;
                  auVar176._8_4_ = fVar217;
                  auVar176._12_4_ = fVar217;
                  auVar114 = vfmadd132ps_fma(auVar176,auVar114,auVar27);
                  auVar158 = vbroadcastss_avx512f(auVar114);
                  auVar159 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar159,ZEXT1664(auVar114));
                  auVar159 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar159,ZEXT1664(auVar114));
                  local_2c0[0] = (RTCHitN)auVar158[0];
                  local_2c0[1] = (RTCHitN)auVar158[1];
                  local_2c0[2] = (RTCHitN)auVar158[2];
                  local_2c0[3] = (RTCHitN)auVar158[3];
                  local_2c0[4] = (RTCHitN)auVar158[4];
                  local_2c0[5] = (RTCHitN)auVar158[5];
                  local_2c0[6] = (RTCHitN)auVar158[6];
                  local_2c0[7] = (RTCHitN)auVar158[7];
                  local_2c0[8] = (RTCHitN)auVar158[8];
                  local_2c0[9] = (RTCHitN)auVar158[9];
                  local_2c0[10] = (RTCHitN)auVar158[10];
                  local_2c0[0xb] = (RTCHitN)auVar158[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar158[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar158[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar158[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar158[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar158[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar158[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar158[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar158[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar158[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar158[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar158[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar158[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar158[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar158[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar158[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar158[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar158[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar158[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar158[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar158[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar158[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar158[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar158[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar158[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar158[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar158[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar158[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar158[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar158[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar158[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar158[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar158[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar158[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar158[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar158[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar158[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar158[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar158[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar158[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar158[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar158[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar158[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar158[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar158[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar158[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar158[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar158[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar158[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar158[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar158[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar158[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar158[0x3f];
                  local_180 = local_4c0._0_8_;
                  uStack_178 = local_4c0._8_8_;
                  uStack_170 = local_4c0._16_8_;
                  uStack_168 = local_4c0._24_8_;
                  uStack_160 = local_4c0._32_8_;
                  uStack_158 = local_4c0._40_8_;
                  uStack_150 = local_4c0._48_8_;
                  uStack_148 = local_4c0._56_8_;
                  auVar158 = vmovdqa64_avx512f(local_480);
                  local_140 = vmovdqa64_avx512f(auVar158);
                  auVar134 = vpcmpeqd_avx2(auVar158._0_32_,auVar158._0_32_);
                  local_928[3] = auVar134;
                  local_928[2] = auVar134;
                  local_928[1] = auVar134;
                  *local_928 = auVar134;
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_960.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_960.context)->instPrimID[0]));
                  local_580 = local_300;
                  local_960.valid = (int *)local_580;
                  local_960.geometryUserPtr = pGVar104->userPtr;
                  local_960.hit = local_2c0;
                  local_960.N = 0x10;
                  local_6e0 = (undefined4)uVar100;
                  uStack_6dc = (undefined4)(uVar100 >> 0x20);
                  local_960.ray = (RTCRayN *)ray;
                  if (pGVar104->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar104->intersectionFilterN)(&local_960);
                    uVar100 = CONCAT44(uStack_6dc,local_6e0);
                    auVar241 = ZEXT1664(_local_8e0);
                    auVar254 = ZEXT3264(local_760);
                    auVar252 = ZEXT3264(local_820);
                    auVar183 = ZEXT3264(local_800);
                    auVar251 = ZEXT3264(local_7e0);
                    auVar253 = ZEXT3264(local_920);
                    auVar245 = ZEXT3264(local_900);
                    auVar248 = ZEXT3264(local_740);
                    auVar247 = ZEXT3264(local_700);
                    auVar246 = ZEXT3264(local_720);
                    auVar114 = vxorps_avx512vl(auVar249,auVar249);
                    auVar250 = ZEXT1664(auVar114);
                    fVar203 = local_780;
                  }
                  auVar114 = auVar250._0_16_;
                  auVar158 = vmovdqa64_avx512f(local_580);
                  uVar168 = vptestmd_avx512f(auVar158,auVar158);
                  if ((short)uVar168 == 0) {
LAB_01c52b95:
                    *(undefined4 *)(ray + k * 4 + 0x200) = local_440._0_4_;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar104->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_960);
                      uVar100 = CONCAT44(uStack_6dc,local_6e0);
                      auVar241 = ZEXT1664(_local_8e0);
                      auVar254 = ZEXT3264(local_760);
                      auVar252 = ZEXT3264(local_820);
                      auVar183 = ZEXT3264(local_800);
                      auVar251 = ZEXT3264(local_7e0);
                      auVar253 = ZEXT3264(local_920);
                      auVar245 = ZEXT3264(local_900);
                      auVar248 = ZEXT3264(local_740);
                      auVar247 = ZEXT3264(local_700);
                      auVar246 = ZEXT3264(local_720);
                      auVar114 = vxorps_avx512vl(auVar114,auVar114);
                      auVar250 = ZEXT1664(auVar114);
                      fVar203 = local_780;
                    }
                    auVar158 = vmovdqa64_avx512f(local_580);
                    uVar34 = vptestmd_avx512f(auVar158,auVar158);
                    if ((short)uVar34 == 0) goto LAB_01c52b95;
                    iVar1 = *(int *)(local_960.hit + 4);
                    iVar2 = *(int *)(local_960.hit + 8);
                    iVar79 = *(int *)(local_960.hit + 0xc);
                    iVar80 = *(int *)(local_960.hit + 0x10);
                    iVar81 = *(int *)(local_960.hit + 0x14);
                    iVar82 = *(int *)(local_960.hit + 0x18);
                    iVar83 = *(int *)(local_960.hit + 0x1c);
                    iVar84 = *(int *)(local_960.hit + 0x20);
                    iVar85 = *(int *)(local_960.hit + 0x24);
                    iVar86 = *(int *)(local_960.hit + 0x28);
                    iVar87 = *(int *)(local_960.hit + 0x2c);
                    iVar88 = *(int *)(local_960.hit + 0x30);
                    iVar89 = *(int *)(local_960.hit + 0x34);
                    iVar90 = *(int *)(local_960.hit + 0x38);
                    iVar91 = *(int *)(local_960.hit + 0x3c);
                    bVar99 = (byte)uVar34;
                    bVar13 = (bool)((byte)(uVar34 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar34 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar34 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar34 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar34 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar34 >> 6) & 1);
                    bVar19 = (bool)((byte)(uVar34 >> 7) & 1);
                    bVar98 = (byte)(uVar34 >> 8);
                    bVar20 = (bool)((byte)(uVar34 >> 9) & 1);
                    bVar21 = (bool)((byte)(uVar34 >> 10) & 1);
                    bVar22 = (bool)((byte)(uVar34 >> 0xb) & 1);
                    bVar23 = (bool)((byte)(uVar34 >> 0xc) & 1);
                    bVar24 = (bool)((byte)(uVar34 >> 0xd) & 1);
                    bVar25 = (bool)((byte)(uVar34 >> 0xe) & 1);
                    bVar26 = SUB81(uVar34 >> 0xf,0);
                    *(uint *)(local_960.ray + 0x300) =
                         (uint)(bVar99 & 1) * *(int *)local_960.hit |
                         (uint)!(bool)(bVar99 & 1) * *(int *)(local_960.ray + 0x300);
                    *(uint *)(local_960.ray + 0x304) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 0x304);
                    *(uint *)(local_960.ray + 0x308) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x308);
                    *(uint *)(local_960.ray + 0x30c) =
                         (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_960.ray + 0x30c);
                    *(uint *)(local_960.ray + 0x310) =
                         (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_960.ray + 0x310);
                    *(uint *)(local_960.ray + 0x314) =
                         (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_960.ray + 0x314);
                    *(uint *)(local_960.ray + 0x318) =
                         (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_960.ray + 0x318);
                    *(uint *)(local_960.ray + 0x31c) =
                         (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_960.ray + 0x31c);
                    *(uint *)(local_960.ray + 800) =
                         (uint)(bVar98 & 1) * iVar84 |
                         (uint)!(bool)(bVar98 & 1) * *(int *)(local_960.ray + 800);
                    *(uint *)(local_960.ray + 0x324) =
                         (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_960.ray + 0x324);
                    *(uint *)(local_960.ray + 0x328) =
                         (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_960.ray + 0x328);
                    *(uint *)(local_960.ray + 0x32c) =
                         (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_960.ray + 0x32c);
                    *(uint *)(local_960.ray + 0x330) =
                         (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_960.ray + 0x330);
                    *(uint *)(local_960.ray + 0x334) =
                         (uint)bVar24 * iVar89 | (uint)!bVar24 * *(int *)(local_960.ray + 0x334);
                    *(uint *)(local_960.ray + 0x338) =
                         (uint)bVar25 * iVar90 | (uint)!bVar25 * *(int *)(local_960.ray + 0x338);
                    *(uint *)(local_960.ray + 0x33c) =
                         (uint)bVar26 * iVar91 | (uint)!bVar26 * *(int *)(local_960.ray + 0x33c);
                    iVar1 = *(int *)(local_960.hit + 0x44);
                    iVar2 = *(int *)(local_960.hit + 0x48);
                    iVar79 = *(int *)(local_960.hit + 0x4c);
                    iVar80 = *(int *)(local_960.hit + 0x50);
                    iVar81 = *(int *)(local_960.hit + 0x54);
                    iVar82 = *(int *)(local_960.hit + 0x58);
                    iVar83 = *(int *)(local_960.hit + 0x5c);
                    iVar84 = *(int *)(local_960.hit + 0x60);
                    iVar85 = *(int *)(local_960.hit + 100);
                    iVar86 = *(int *)(local_960.hit + 0x68);
                    iVar87 = *(int *)(local_960.hit + 0x6c);
                    iVar88 = *(int *)(local_960.hit + 0x70);
                    iVar89 = *(int *)(local_960.hit + 0x74);
                    iVar90 = *(int *)(local_960.hit + 0x78);
                    iVar91 = *(int *)(local_960.hit + 0x7c);
                    bVar13 = (bool)((byte)(uVar34 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar34 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar34 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar34 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar34 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar34 >> 6) & 1);
                    bVar19 = (bool)((byte)(uVar34 >> 7) & 1);
                    bVar20 = (bool)((byte)(uVar34 >> 9) & 1);
                    bVar21 = (bool)((byte)(uVar34 >> 10) & 1);
                    bVar22 = (bool)((byte)(uVar34 >> 0xb) & 1);
                    bVar23 = (bool)((byte)(uVar34 >> 0xc) & 1);
                    bVar24 = (bool)((byte)(uVar34 >> 0xd) & 1);
                    bVar25 = (bool)((byte)(uVar34 >> 0xe) & 1);
                    bVar26 = SUB81(uVar34 >> 0xf,0);
                    *(uint *)(local_960.ray + 0x340) =
                         (uint)(bVar99 & 1) * *(int *)(local_960.hit + 0x40) |
                         (uint)!(bool)(bVar99 & 1) * *(int *)(local_960.ray + 0x340);
                    *(uint *)(local_960.ray + 0x344) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 0x344);
                    *(uint *)(local_960.ray + 0x348) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x348);
                    *(uint *)(local_960.ray + 0x34c) =
                         (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_960.ray + 0x34c);
                    *(uint *)(local_960.ray + 0x350) =
                         (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_960.ray + 0x350);
                    *(uint *)(local_960.ray + 0x354) =
                         (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_960.ray + 0x354);
                    *(uint *)(local_960.ray + 0x358) =
                         (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_960.ray + 0x358);
                    *(uint *)(local_960.ray + 0x35c) =
                         (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_960.ray + 0x35c);
                    *(uint *)(local_960.ray + 0x360) =
                         (uint)(bVar98 & 1) * iVar84 |
                         (uint)!(bool)(bVar98 & 1) * *(int *)(local_960.ray + 0x360);
                    *(uint *)(local_960.ray + 0x364) =
                         (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_960.ray + 0x364);
                    *(uint *)(local_960.ray + 0x368) =
                         (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_960.ray + 0x368);
                    *(uint *)(local_960.ray + 0x36c) =
                         (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_960.ray + 0x36c);
                    *(uint *)(local_960.ray + 0x370) =
                         (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_960.ray + 0x370);
                    *(uint *)(local_960.ray + 0x374) =
                         (uint)bVar24 * iVar89 | (uint)!bVar24 * *(int *)(local_960.ray + 0x374);
                    *(uint *)(local_960.ray + 0x378) =
                         (uint)bVar25 * iVar90 | (uint)!bVar25 * *(int *)(local_960.ray + 0x378);
                    *(uint *)(local_960.ray + 0x37c) =
                         (uint)bVar26 * iVar91 | (uint)!bVar26 * *(int *)(local_960.ray + 0x37c);
                    iVar1 = *(int *)(local_960.hit + 0x84);
                    iVar2 = *(int *)(local_960.hit + 0x88);
                    iVar79 = *(int *)(local_960.hit + 0x8c);
                    iVar80 = *(int *)(local_960.hit + 0x90);
                    iVar81 = *(int *)(local_960.hit + 0x94);
                    iVar82 = *(int *)(local_960.hit + 0x98);
                    iVar83 = *(int *)(local_960.hit + 0x9c);
                    iVar84 = *(int *)(local_960.hit + 0xa0);
                    iVar85 = *(int *)(local_960.hit + 0xa4);
                    iVar86 = *(int *)(local_960.hit + 0xa8);
                    iVar87 = *(int *)(local_960.hit + 0xac);
                    iVar88 = *(int *)(local_960.hit + 0xb0);
                    iVar89 = *(int *)(local_960.hit + 0xb4);
                    iVar90 = *(int *)(local_960.hit + 0xb8);
                    iVar91 = *(int *)(local_960.hit + 0xbc);
                    bVar13 = (bool)((byte)(uVar34 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar34 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar34 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar34 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar34 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar34 >> 6) & 1);
                    bVar19 = (bool)((byte)(uVar34 >> 7) & 1);
                    bVar20 = (bool)((byte)(uVar34 >> 9) & 1);
                    bVar21 = (bool)((byte)(uVar34 >> 10) & 1);
                    bVar22 = (bool)((byte)(uVar34 >> 0xb) & 1);
                    bVar23 = (bool)((byte)(uVar34 >> 0xc) & 1);
                    bVar24 = (bool)((byte)(uVar34 >> 0xd) & 1);
                    bVar25 = (bool)((byte)(uVar34 >> 0xe) & 1);
                    bVar26 = SUB81(uVar34 >> 0xf,0);
                    *(uint *)(local_960.ray + 0x380) =
                         (uint)(bVar99 & 1) * *(int *)(local_960.hit + 0x80) |
                         (uint)!(bool)(bVar99 & 1) * *(int *)(local_960.ray + 0x380);
                    *(uint *)(local_960.ray + 900) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 900);
                    *(uint *)(local_960.ray + 0x388) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x388);
                    *(uint *)(local_960.ray + 0x38c) =
                         (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_960.ray + 0x38c);
                    *(uint *)(local_960.ray + 0x390) =
                         (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_960.ray + 0x390);
                    *(uint *)(local_960.ray + 0x394) =
                         (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_960.ray + 0x394);
                    *(uint *)(local_960.ray + 0x398) =
                         (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_960.ray + 0x398);
                    *(uint *)(local_960.ray + 0x39c) =
                         (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_960.ray + 0x39c);
                    *(uint *)(local_960.ray + 0x3a0) =
                         (uint)(bVar98 & 1) * iVar84 |
                         (uint)!(bool)(bVar98 & 1) * *(int *)(local_960.ray + 0x3a0);
                    *(uint *)(local_960.ray + 0x3a4) =
                         (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_960.ray + 0x3a4);
                    *(uint *)(local_960.ray + 0x3a8) =
                         (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_960.ray + 0x3a8);
                    *(uint *)(local_960.ray + 0x3ac) =
                         (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_960.ray + 0x3ac);
                    *(uint *)(local_960.ray + 0x3b0) =
                         (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_960.ray + 0x3b0);
                    *(uint *)(local_960.ray + 0x3b4) =
                         (uint)bVar24 * iVar89 | (uint)!bVar24 * *(int *)(local_960.ray + 0x3b4);
                    *(uint *)(local_960.ray + 0x3b8) =
                         (uint)bVar25 * iVar90 | (uint)!bVar25 * *(int *)(local_960.ray + 0x3b8);
                    *(uint *)(local_960.ray + 0x3bc) =
                         (uint)bVar26 * iVar91 | (uint)!bVar26 * *(int *)(local_960.ray + 0x3bc);
                    iVar1 = *(int *)(local_960.hit + 0xc4);
                    iVar2 = *(int *)(local_960.hit + 200);
                    iVar79 = *(int *)(local_960.hit + 0xcc);
                    iVar80 = *(int *)(local_960.hit + 0xd0);
                    iVar81 = *(int *)(local_960.hit + 0xd4);
                    iVar82 = *(int *)(local_960.hit + 0xd8);
                    iVar83 = *(int *)(local_960.hit + 0xdc);
                    iVar84 = *(int *)(local_960.hit + 0xe0);
                    iVar85 = *(int *)(local_960.hit + 0xe4);
                    iVar86 = *(int *)(local_960.hit + 0xe8);
                    iVar87 = *(int *)(local_960.hit + 0xec);
                    iVar88 = *(int *)(local_960.hit + 0xf0);
                    iVar89 = *(int *)(local_960.hit + 0xf4);
                    iVar90 = *(int *)(local_960.hit + 0xf8);
                    iVar91 = *(int *)(local_960.hit + 0xfc);
                    bVar13 = (bool)((byte)(uVar34 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar34 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar34 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar34 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar34 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar34 >> 6) & 1);
                    bVar19 = (bool)((byte)(uVar34 >> 7) & 1);
                    bVar20 = (bool)((byte)(uVar34 >> 9) & 1);
                    bVar21 = (bool)((byte)(uVar34 >> 10) & 1);
                    bVar22 = (bool)((byte)(uVar34 >> 0xb) & 1);
                    bVar23 = (bool)((byte)(uVar34 >> 0xc) & 1);
                    bVar24 = (bool)((byte)(uVar34 >> 0xd) & 1);
                    bVar25 = (bool)((byte)(uVar34 >> 0xe) & 1);
                    bVar26 = SUB81(uVar34 >> 0xf,0);
                    *(uint *)(local_960.ray + 0x3c0) =
                         (uint)(bVar99 & 1) * *(int *)(local_960.hit + 0xc0) |
                         (uint)!(bool)(bVar99 & 1) * *(int *)(local_960.ray + 0x3c0);
                    *(uint *)(local_960.ray + 0x3c4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 0x3c4);
                    *(uint *)(local_960.ray + 0x3c8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x3c8);
                    *(uint *)(local_960.ray + 0x3cc) =
                         (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_960.ray + 0x3cc);
                    *(uint *)(local_960.ray + 0x3d0) =
                         (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_960.ray + 0x3d0);
                    *(uint *)(local_960.ray + 0x3d4) =
                         (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_960.ray + 0x3d4);
                    *(uint *)(local_960.ray + 0x3d8) =
                         (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_960.ray + 0x3d8);
                    *(uint *)(local_960.ray + 0x3dc) =
                         (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_960.ray + 0x3dc);
                    *(uint *)(local_960.ray + 0x3e0) =
                         (uint)(bVar98 & 1) * iVar84 |
                         (uint)!(bool)(bVar98 & 1) * *(int *)(local_960.ray + 0x3e0);
                    *(uint *)(local_960.ray + 0x3e4) =
                         (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_960.ray + 0x3e4);
                    *(uint *)(local_960.ray + 1000) =
                         (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_960.ray + 1000);
                    *(uint *)(local_960.ray + 0x3ec) =
                         (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_960.ray + 0x3ec);
                    *(uint *)(local_960.ray + 0x3f0) =
                         (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_960.ray + 0x3f0);
                    *(uint *)(local_960.ray + 0x3f4) =
                         (uint)bVar24 * iVar89 | (uint)!bVar24 * *(int *)(local_960.ray + 0x3f4);
                    *(uint *)(local_960.ray + 0x3f8) =
                         (uint)bVar25 * iVar90 | (uint)!bVar25 * *(int *)(local_960.ray + 0x3f8);
                    *(uint *)(local_960.ray + 0x3fc) =
                         (uint)bVar26 * iVar91 | (uint)!bVar26 * *(int *)(local_960.ray + 0x3fc);
                    iVar1 = *(int *)(local_960.hit + 0x104);
                    iVar2 = *(int *)(local_960.hit + 0x108);
                    iVar79 = *(int *)(local_960.hit + 0x10c);
                    iVar80 = *(int *)(local_960.hit + 0x110);
                    iVar81 = *(int *)(local_960.hit + 0x114);
                    iVar82 = *(int *)(local_960.hit + 0x118);
                    iVar83 = *(int *)(local_960.hit + 0x11c);
                    iVar84 = *(int *)(local_960.hit + 0x120);
                    iVar85 = *(int *)(local_960.hit + 0x124);
                    iVar86 = *(int *)(local_960.hit + 0x128);
                    iVar87 = *(int *)(local_960.hit + 300);
                    iVar88 = *(int *)(local_960.hit + 0x130);
                    iVar89 = *(int *)(local_960.hit + 0x134);
                    iVar90 = *(int *)(local_960.hit + 0x138);
                    iVar91 = *(int *)(local_960.hit + 0x13c);
                    bVar13 = (bool)((byte)(uVar34 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar34 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar34 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar34 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar34 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar34 >> 6) & 1);
                    bVar19 = (bool)((byte)(uVar34 >> 7) & 1);
                    bVar20 = (bool)((byte)(uVar34 >> 9) & 1);
                    bVar21 = (bool)((byte)(uVar34 >> 10) & 1);
                    bVar22 = (bool)((byte)(uVar34 >> 0xb) & 1);
                    bVar23 = (bool)((byte)(uVar34 >> 0xc) & 1);
                    bVar24 = (bool)((byte)(uVar34 >> 0xd) & 1);
                    bVar25 = (bool)((byte)(uVar34 >> 0xe) & 1);
                    bVar26 = SUB81(uVar34 >> 0xf,0);
                    *(uint *)(local_960.ray + 0x400) =
                         (uint)(bVar99 & 1) * *(int *)(local_960.hit + 0x100) |
                         (uint)!(bool)(bVar99 & 1) * *(int *)(local_960.ray + 0x400);
                    *(uint *)(local_960.ray + 0x404) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 0x404);
                    *(uint *)(local_960.ray + 0x408) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x408);
                    *(uint *)(local_960.ray + 0x40c) =
                         (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_960.ray + 0x40c);
                    *(uint *)(local_960.ray + 0x410) =
                         (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_960.ray + 0x410);
                    *(uint *)(local_960.ray + 0x414) =
                         (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_960.ray + 0x414);
                    *(uint *)(local_960.ray + 0x418) =
                         (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_960.ray + 0x418);
                    *(uint *)(local_960.ray + 0x41c) =
                         (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_960.ray + 0x41c);
                    *(uint *)(local_960.ray + 0x420) =
                         (uint)(bVar98 & 1) * iVar84 |
                         (uint)!(bool)(bVar98 & 1) * *(int *)(local_960.ray + 0x420);
                    *(uint *)(local_960.ray + 0x424) =
                         (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_960.ray + 0x424);
                    *(uint *)(local_960.ray + 0x428) =
                         (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_960.ray + 0x428);
                    *(uint *)(local_960.ray + 0x42c) =
                         (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_960.ray + 0x42c);
                    *(uint *)(local_960.ray + 0x430) =
                         (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_960.ray + 0x430);
                    *(uint *)(local_960.ray + 0x434) =
                         (uint)bVar24 * iVar89 | (uint)!bVar24 * *(int *)(local_960.ray + 0x434);
                    *(uint *)(local_960.ray + 0x438) =
                         (uint)bVar25 * iVar90 | (uint)!bVar25 * *(int *)(local_960.ray + 0x438);
                    *(uint *)(local_960.ray + 0x43c) =
                         (uint)bVar26 * iVar91 | (uint)!bVar26 * *(int *)(local_960.ray + 0x43c);
                    auVar158 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_960.hit + 0x140));
                    auVar158 = vmovdqu32_avx512f(auVar158);
                    *(undefined1 (*) [64])(local_960.ray + 0x440) = auVar158;
                    auVar158 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_960.hit + 0x180));
                    auVar158 = vmovdqu32_avx512f(auVar158);
                    *(undefined1 (*) [64])(local_960.ray + 0x480) = auVar158;
                    auVar158 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_960.hit + 0x1c0));
                    auVar158 = vmovdqa32_avx512f(auVar158);
                    *(undefined1 (*) [64])(local_960.ray + 0x4c0) = auVar158;
                    auVar158 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_960.hit + 0x200));
                    auVar158 = vmovdqa32_avx512f(auVar158);
                    *(undefined1 (*) [64])(local_960.ray + 0x500) = auVar158;
                  }
                  auVar124 = auVar254._0_32_;
                  bVar99 = ~(byte)(1 << ((uint)uVar100 & 0x1f)) & bVar107;
                  uVar167 = *(undefined4 *)(ray + k * 4 + 0x200);
                  auVar53._4_4_ = uVar167;
                  auVar53._0_4_ = uVar167;
                  auVar53._8_4_ = uVar167;
                  auVar53._12_4_ = uVar167;
                  auVar53._16_4_ = uVar167;
                  auVar53._20_4_ = uVar167;
                  auVar53._24_4_ = uVar167;
                  auVar53._28_4_ = uVar167;
                  uVar168 = vcmpps_avx512vl(local_860,auVar53,2);
                  bVar107 = bVar99 & (byte)uVar168;
                  if ((bVar99 & (byte)uVar168) != 0) {
                    auVar182._8_4_ = 0x7f800000;
                    auVar182._0_8_ = 0x7f8000007f800000;
                    auVar182._12_4_ = 0x7f800000;
                    auVar182._16_4_ = 0x7f800000;
                    auVar182._20_4_ = 0x7f800000;
                    auVar182._24_4_ = 0x7f800000;
                    auVar182._28_4_ = 0x7f800000;
                    auVar134 = vblendmps_avx512vl(auVar182,local_860);
                    auVar157._0_4_ =
                         (uint)(bVar107 & 1) * auVar134._0_4_ |
                         (uint)!(bool)(bVar107 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar107 >> 1 & 1);
                    auVar157._4_4_ = (uint)bVar13 * auVar134._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar107 >> 2 & 1);
                    auVar157._8_4_ = (uint)bVar13 * auVar134._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar107 >> 3 & 1);
                    auVar157._12_4_ = (uint)bVar13 * auVar134._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar107 >> 4 & 1);
                    auVar157._16_4_ = (uint)bVar13 * auVar134._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar107 >> 5 & 1);
                    auVar157._20_4_ = (uint)bVar13 * auVar134._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar107 >> 6 & 1);
                    auVar157._24_4_ = (uint)bVar13 * auVar134._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar157._28_4_ =
                         (uint)(bVar107 >> 7) * auVar134._28_4_ |
                         (uint)!(bool)(bVar107 >> 7) * 0x7f800000;
                    auVar134 = vshufps_avx(auVar157,auVar157,0xb1);
                    auVar134 = vminps_avx(auVar157,auVar134);
                    auVar136 = vshufpd_avx(auVar134,auVar134,5);
                    auVar134 = vminps_avx(auVar134,auVar136);
                    auVar136 = vpermpd_avx2(auVar134,0x4e);
                    auVar134 = vminps_avx(auVar134,auVar136);
                    uVar168 = vcmpps_avx512vl(auVar157,auVar134,0);
                    bVar98 = (byte)uVar168 & bVar107;
                    bVar99 = bVar107;
                    if (bVar98 != 0) {
                      bVar99 = bVar98;
                    }
                    uVar35 = 0;
                    for (uVar101 = (uint)bVar99; (uVar101 & 1) == 0;
                        uVar101 = uVar101 >> 1 | 0x80000000) {
                      uVar35 = uVar35 + 1;
                    }
                    uVar100 = (ulong)uVar35;
                  }
                  fVar217 = auVar241._0_4_;
                } while (bVar107 != 0);
              }
            }
          }
        }
      }
      local_780 = fVar217;
      if (8 < iVar8) {
        auVar134 = vpbroadcastd_avx512vl();
        auVar254 = ZEXT3264(auVar134);
        fStack_6b0 = 1.0 / (float)local_6c0._0_4_;
        local_6c0._4_4_ = fStack_6b0;
        local_6c0._0_4_ = fStack_6b0;
        fStack_6b8 = fStack_6b0;
        fStack_6b4 = fStack_6b0;
        auVar241 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar241);
        auVar241 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar241);
        lVar102 = 8;
        fStack_77c = local_780;
        fStack_778 = local_780;
        fStack_774 = local_780;
        fStack_770 = local_780;
        fStack_76c = local_780;
        fStack_768 = local_780;
        fStack_764 = local_780;
        local_760 = auVar124;
        local_6e0 = fVar203;
        uStack_6dc = fVar203;
        uStack_6d8 = fVar203;
        uStack_6d4 = fVar203;
        uStack_6d0 = fVar203;
        uStack_6cc = fVar203;
        uStack_6c8 = fVar203;
        uStack_6c4 = fVar203;
        fStack_6ac = fStack_6b0;
        fStack_6a8 = fStack_6b0;
        fStack_6a4 = fStack_6b0;
        do {
          auVar134 = vpbroadcastd_avx512vl();
          auVar119 = vpor_avx2(auVar134,_DAT_0205a920);
          uVar33 = vpcmpgtd_avx512vl(auVar254._0_32_,auVar119);
          auVar134 = *(undefined1 (*) [32])(bspline_basis0 + lVar102 * 4 + lVar36);
          auVar136 = *(undefined1 (*) [32])(lVar36 + 0x222bfac + lVar102 * 4);
          auVar132 = *(undefined1 (*) [32])(lVar36 + 0x222c430 + lVar102 * 4);
          auVar131 = *(undefined1 (*) [32])(lVar36 + 0x222c8b4 + lVar102 * 4);
          local_800 = auVar183._0_32_;
          auVar120 = vmulps_avx512vl(local_800,auVar131);
          local_820 = auVar252._0_32_;
          auVar130 = vmulps_avx512vl(local_820,auVar131);
          auVar60._4_4_ = auVar131._4_4_ * (float)local_380._4_4_;
          auVar60._0_4_ = auVar131._0_4_ * (float)local_380._0_4_;
          auVar60._8_4_ = auVar131._8_4_ * fStack_378;
          auVar60._12_4_ = auVar131._12_4_ * fStack_374;
          auVar60._16_4_ = auVar131._16_4_ * fStack_370;
          auVar60._20_4_ = auVar131._20_4_ * fStack_36c;
          auVar60._24_4_ = auVar131._24_4_ * fStack_368;
          auVar60._28_4_ = auVar119._28_4_;
          auVar139 = auVar253._0_32_;
          auVar119 = vfmadd231ps_avx512vl(auVar120,auVar132,auVar139);
          local_7e0 = auVar251._0_32_;
          auVar120 = vfmadd231ps_avx512vl(auVar130,auVar132,local_7e0);
          auVar130 = vfmadd231ps_avx512vl(auVar60,auVar132,local_360);
          auVar138 = auVar248._0_32_;
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar136,auVar138);
          auVar135 = auVar245._0_32_;
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar136,auVar135);
          auVar114 = vfmadd231ps_fma(auVar130,auVar136,local_340);
          auVar137 = auVar246._0_32_;
          auVar123 = vfmadd231ps_avx512vl(auVar119,auVar134,auVar137);
          local_700 = auVar247._0_32_;
          auVar125 = vfmadd231ps_avx512vl(auVar120,auVar134,local_700);
          auVar119 = *(undefined1 (*) [32])(bspline_basis1 + lVar102 * 4 + lVar36);
          auVar120 = *(undefined1 (*) [32])(lVar36 + 0x222e3cc + lVar102 * 4);
          auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar134,local_320);
          auVar130 = *(undefined1 (*) [32])(lVar36 + 0x222e850 + lVar102 * 4);
          auVar121 = *(undefined1 (*) [32])(lVar36 + 0x222ecd4 + lVar102 * 4);
          auVar124 = vmulps_avx512vl(local_800,auVar121);
          auVar122 = vmulps_avx512vl(local_820,auVar121);
          auVar61._4_4_ = auVar121._4_4_ * (float)local_380._4_4_;
          auVar61._0_4_ = auVar121._0_4_ * (float)local_380._0_4_;
          auVar61._8_4_ = auVar121._8_4_ * fStack_378;
          auVar61._12_4_ = auVar121._12_4_ * fStack_374;
          auVar61._16_4_ = auVar121._16_4_ * fStack_370;
          auVar61._20_4_ = auVar121._20_4_ * fStack_36c;
          auVar61._24_4_ = auVar121._24_4_ * fStack_368;
          auVar61._28_4_ = uStack_364;
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar130,auVar139);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar130,local_7e0);
          auVar126 = vfmadd231ps_avx512vl(auVar61,auVar130,local_360);
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar120,auVar138);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar120,auVar135);
          auVar113 = vfmadd231ps_fma(auVar126,auVar120,local_340);
          auVar126 = vfmadd231ps_avx512vl(auVar124,auVar119,auVar137);
          auVar127 = vfmadd231ps_avx512vl(auVar122,auVar119,local_700);
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar119,local_320);
          auVar128 = vmaxps_avx512vl(ZEXT1632(auVar114),ZEXT1632(auVar113));
          auVar124 = vsubps_avx(auVar126,auVar123);
          auVar122 = vsubps_avx(auVar127,auVar125);
          auVar129 = vmulps_avx512vl(auVar125,auVar124);
          auVar133 = vmulps_avx512vl(auVar123,auVar122);
          auVar129 = vsubps_avx512vl(auVar129,auVar133);
          auVar133 = vmulps_avx512vl(auVar122,auVar122);
          auVar133 = vfmadd231ps_avx512vl(auVar133,auVar124,auVar124);
          auVar128 = vmulps_avx512vl(auVar128,auVar128);
          auVar128 = vmulps_avx512vl(auVar128,auVar133);
          auVar129 = vmulps_avx512vl(auVar129,auVar129);
          uVar168 = vcmpps_avx512vl(auVar129,auVar128,2);
          local_5f0 = (byte)uVar33 & (byte)uVar168;
          if (local_5f0 == 0) {
            auVar241 = ZEXT3264(auVar135);
            auVar253 = ZEXT3264(auVar139);
          }
          else {
            auVar121 = vmulps_avx512vl(local_760,auVar121);
            auVar130 = vfmadd213ps_avx512vl(auVar130,local_3e0,auVar121);
            auVar120 = vfmadd213ps_avx512vl(auVar120,local_3c0,auVar130);
            auVar119 = vfmadd213ps_avx512vl(auVar119,local_3a0,auVar120);
            auVar131 = vmulps_avx512vl(local_760,auVar131);
            auVar132 = vfmadd213ps_avx512vl(auVar132,local_3e0,auVar131);
            auVar136 = vfmadd213ps_avx512vl(auVar136,local_3c0,auVar132);
            auVar120 = vfmadd213ps_avx512vl(auVar134,local_3a0,auVar136);
            auVar134 = *(undefined1 (*) [32])(lVar36 + 0x222cd38 + lVar102 * 4);
            auVar136 = *(undefined1 (*) [32])(lVar36 + 0x222d1bc + lVar102 * 4);
            auVar132 = *(undefined1 (*) [32])(lVar36 + 0x222d640 + lVar102 * 4);
            auVar131 = *(undefined1 (*) [32])(lVar36 + 0x222dac4 + lVar102 * 4);
            auVar130 = vmulps_avx512vl(local_800,auVar131);
            auVar121 = vmulps_avx512vl(local_820,auVar131);
            auVar131 = vmulps_avx512vl(local_760,auVar131);
            auVar130 = vfmadd231ps_avx512vl(auVar130,auVar132,auVar139);
            auVar121 = vfmadd231ps_avx512vl(auVar121,auVar132,local_7e0);
            auVar132 = vfmadd231ps_avx512vl(auVar131,local_3e0,auVar132);
            auVar131 = vfmadd231ps_avx512vl(auVar130,auVar136,auVar138);
            auVar130 = vfmadd231ps_avx512vl(auVar121,auVar136,auVar135);
            auVar136 = vfmadd231ps_avx512vl(auVar132,local_3c0,auVar136);
            auVar131 = vfmadd231ps_avx512vl(auVar131,auVar134,auVar137);
            auVar130 = vfmadd231ps_avx512vl(auVar130,auVar134,local_700);
            auVar121 = vfmadd231ps_avx512vl(auVar136,local_3a0,auVar134);
            auVar134 = *(undefined1 (*) [32])(lVar36 + 0x222f158 + lVar102 * 4);
            auVar136 = *(undefined1 (*) [32])(lVar36 + 0x222fa60 + lVar102 * 4);
            auVar132 = *(undefined1 (*) [32])(lVar36 + 0x222fee4 + lVar102 * 4);
            auVar128 = vmulps_avx512vl(local_800,auVar132);
            auVar129 = vmulps_avx512vl(local_820,auVar132);
            auVar132 = vmulps_avx512vl(local_760,auVar132);
            auVar128 = vfmadd231ps_avx512vl(auVar128,auVar136,auVar139);
            auVar129 = vfmadd231ps_avx512vl(auVar129,auVar136,local_7e0);
            auVar132 = vfmadd231ps_avx512vl(auVar132,local_3e0,auVar136);
            auVar136 = *(undefined1 (*) [32])(lVar36 + 0x222f5dc + lVar102 * 4);
            auVar128 = vfmadd231ps_avx512vl(auVar128,auVar136,auVar138);
            auVar129 = vfmadd231ps_avx512vl(auVar129,auVar136,auVar135);
            auVar136 = vfmadd231ps_avx512vl(auVar132,local_3c0,auVar136);
            auVar132 = vfmadd231ps_avx512vl(auVar128,auVar134,auVar137);
            auVar128 = vfmadd231ps_avx512vl(auVar129,auVar134,local_700);
            auVar136 = vfmadd231ps_avx512vl(auVar136,local_3a0,auVar134);
            auVar129 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar131,auVar129);
            vandps_avx512vl(auVar130,auVar129);
            auVar134 = vmaxps_avx(auVar129,auVar129);
            vandps_avx512vl(auVar121,auVar129);
            auVar134 = vmaxps_avx(auVar134,auVar129);
            auVar96._4_4_ = fStack_77c;
            auVar96._0_4_ = local_780;
            auVar96._8_4_ = fStack_778;
            auVar96._12_4_ = fStack_774;
            auVar96._16_4_ = fStack_770;
            auVar96._20_4_ = fStack_76c;
            auVar96._24_4_ = fStack_768;
            auVar96._28_4_ = fStack_764;
            uVar100 = vcmpps_avx512vl(auVar134,auVar96,1);
            bVar13 = (bool)((byte)uVar100 & 1);
            auVar146._0_4_ = (float)((uint)bVar13 * auVar124._0_4_ | (uint)!bVar13 * auVar131._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar146._4_4_ = (float)((uint)bVar13 * auVar124._4_4_ | (uint)!bVar13 * auVar131._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar146._8_4_ = (float)((uint)bVar13 * auVar124._8_4_ | (uint)!bVar13 * auVar131._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar146._12_4_ =
                 (float)((uint)bVar13 * auVar124._12_4_ | (uint)!bVar13 * auVar131._12_4_);
            bVar13 = (bool)((byte)(uVar100 >> 4) & 1);
            auVar146._16_4_ =
                 (float)((uint)bVar13 * auVar124._16_4_ | (uint)!bVar13 * auVar131._16_4_);
            bVar13 = (bool)((byte)(uVar100 >> 5) & 1);
            auVar146._20_4_ =
                 (float)((uint)bVar13 * auVar124._20_4_ | (uint)!bVar13 * auVar131._20_4_);
            bVar13 = (bool)((byte)(uVar100 >> 6) & 1);
            auVar146._24_4_ =
                 (float)((uint)bVar13 * auVar124._24_4_ | (uint)!bVar13 * auVar131._24_4_);
            bVar13 = SUB81(uVar100 >> 7,0);
            auVar146._28_4_ = (uint)bVar13 * auVar124._28_4_ | (uint)!bVar13 * auVar131._28_4_;
            bVar13 = (bool)((byte)uVar100 & 1);
            auVar147._0_4_ = (float)((uint)bVar13 * auVar122._0_4_ | (uint)!bVar13 * auVar130._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar147._4_4_ = (float)((uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * auVar130._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar147._8_4_ = (float)((uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * auVar130._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar147._12_4_ =
                 (float)((uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * auVar130._12_4_);
            bVar13 = (bool)((byte)(uVar100 >> 4) & 1);
            auVar147._16_4_ =
                 (float)((uint)bVar13 * auVar122._16_4_ | (uint)!bVar13 * auVar130._16_4_);
            bVar13 = (bool)((byte)(uVar100 >> 5) & 1);
            auVar147._20_4_ =
                 (float)((uint)bVar13 * auVar122._20_4_ | (uint)!bVar13 * auVar130._20_4_);
            bVar13 = (bool)((byte)(uVar100 >> 6) & 1);
            auVar147._24_4_ =
                 (float)((uint)bVar13 * auVar122._24_4_ | (uint)!bVar13 * auVar130._24_4_);
            bVar13 = SUB81(uVar100 >> 7,0);
            auVar147._28_4_ = (uint)bVar13 * auVar122._28_4_ | (uint)!bVar13 * auVar130._28_4_;
            vandps_avx512vl(auVar132,auVar129);
            vandps_avx512vl(auVar128,auVar129);
            auVar134 = vmaxps_avx(auVar147,auVar147);
            vandps_avx512vl(auVar136,auVar129);
            auVar134 = vmaxps_avx(auVar134,auVar147);
            uVar100 = vcmpps_avx512vl(auVar134,auVar96,1);
            bVar13 = (bool)((byte)uVar100 & 1);
            auVar148._0_4_ = (uint)bVar13 * auVar124._0_4_ | (uint)!bVar13 * auVar132._0_4_;
            bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar148._4_4_ = (uint)bVar13 * auVar124._4_4_ | (uint)!bVar13 * auVar132._4_4_;
            bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar148._8_4_ = (uint)bVar13 * auVar124._8_4_ | (uint)!bVar13 * auVar132._8_4_;
            bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar148._12_4_ = (uint)bVar13 * auVar124._12_4_ | (uint)!bVar13 * auVar132._12_4_;
            bVar13 = (bool)((byte)(uVar100 >> 4) & 1);
            auVar148._16_4_ = (uint)bVar13 * auVar124._16_4_ | (uint)!bVar13 * auVar132._16_4_;
            bVar13 = (bool)((byte)(uVar100 >> 5) & 1);
            auVar148._20_4_ = (uint)bVar13 * auVar124._20_4_ | (uint)!bVar13 * auVar132._20_4_;
            bVar13 = (bool)((byte)(uVar100 >> 6) & 1);
            auVar148._24_4_ = (uint)bVar13 * auVar124._24_4_ | (uint)!bVar13 * auVar132._24_4_;
            bVar13 = SUB81(uVar100 >> 7,0);
            auVar148._28_4_ = (uint)bVar13 * auVar124._28_4_ | (uint)!bVar13 * auVar132._28_4_;
            bVar13 = (bool)((byte)uVar100 & 1);
            auVar149._0_4_ = (float)((uint)bVar13 * auVar122._0_4_ | (uint)!bVar13 * auVar128._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar149._4_4_ = (float)((uint)bVar13 * auVar122._4_4_ | (uint)!bVar13 * auVar128._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar149._8_4_ = (float)((uint)bVar13 * auVar122._8_4_ | (uint)!bVar13 * auVar128._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar149._12_4_ =
                 (float)((uint)bVar13 * auVar122._12_4_ | (uint)!bVar13 * auVar128._12_4_);
            bVar13 = (bool)((byte)(uVar100 >> 4) & 1);
            auVar149._16_4_ =
                 (float)((uint)bVar13 * auVar122._16_4_ | (uint)!bVar13 * auVar128._16_4_);
            bVar13 = (bool)((byte)(uVar100 >> 5) & 1);
            auVar149._20_4_ =
                 (float)((uint)bVar13 * auVar122._20_4_ | (uint)!bVar13 * auVar128._20_4_);
            bVar13 = (bool)((byte)(uVar100 >> 6) & 1);
            auVar149._24_4_ =
                 (float)((uint)bVar13 * auVar122._24_4_ | (uint)!bVar13 * auVar128._24_4_);
            bVar13 = SUB81(uVar100 >> 7,0);
            auVar149._28_4_ = (uint)bVar13 * auVar122._28_4_ | (uint)!bVar13 * auVar128._28_4_;
            auVar235._8_4_ = 0x80000000;
            auVar235._0_8_ = 0x8000000080000000;
            auVar235._12_4_ = 0x80000000;
            auVar235._16_4_ = 0x80000000;
            auVar235._20_4_ = 0x80000000;
            auVar235._24_4_ = 0x80000000;
            auVar235._28_4_ = 0x80000000;
            auVar134 = vxorps_avx512vl(auVar148,auVar235);
            auVar128 = auVar250._0_32_;
            auVar136 = vfmadd213ps_avx512vl(auVar146,auVar146,auVar128);
            auVar115 = vfmadd231ps_fma(auVar136,auVar147,auVar147);
            auVar136 = vrsqrt14ps_avx512vl(ZEXT1632(auVar115));
            auVar244._8_4_ = 0xbf000000;
            auVar244._0_8_ = 0xbf000000bf000000;
            auVar244._12_4_ = 0xbf000000;
            auVar244._16_4_ = 0xbf000000;
            auVar244._20_4_ = 0xbf000000;
            auVar244._24_4_ = 0xbf000000;
            auVar244._28_4_ = 0xbf000000;
            fVar203 = auVar136._0_4_;
            fVar217 = auVar136._4_4_;
            fVar202 = auVar136._8_4_;
            fVar216 = auVar136._12_4_;
            fVar218 = auVar136._16_4_;
            fVar219 = auVar136._20_4_;
            fVar197 = auVar136._24_4_;
            auVar62._4_4_ = fVar217 * fVar217 * fVar217 * auVar115._4_4_ * -0.5;
            auVar62._0_4_ = fVar203 * fVar203 * fVar203 * auVar115._0_4_ * -0.5;
            auVar62._8_4_ = fVar202 * fVar202 * fVar202 * auVar115._8_4_ * -0.5;
            auVar62._12_4_ = fVar216 * fVar216 * fVar216 * auVar115._12_4_ * -0.5;
            auVar62._16_4_ = fVar218 * fVar218 * fVar218 * -0.0;
            auVar62._20_4_ = fVar219 * fVar219 * fVar219 * -0.0;
            auVar62._24_4_ = fVar197 * fVar197 * fVar197 * -0.0;
            auVar62._28_4_ = auVar147._28_4_;
            auVar132 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar136 = vfmadd231ps_avx512vl(auVar62,auVar132,auVar136);
            auVar63._4_4_ = auVar147._4_4_ * auVar136._4_4_;
            auVar63._0_4_ = auVar147._0_4_ * auVar136._0_4_;
            auVar63._8_4_ = auVar147._8_4_ * auVar136._8_4_;
            auVar63._12_4_ = auVar147._12_4_ * auVar136._12_4_;
            auVar63._16_4_ = auVar147._16_4_ * auVar136._16_4_;
            auVar63._20_4_ = auVar147._20_4_ * auVar136._20_4_;
            auVar63._24_4_ = auVar147._24_4_ * auVar136._24_4_;
            auVar63._28_4_ = 0;
            auVar64._4_4_ = auVar136._4_4_ * -auVar146._4_4_;
            auVar64._0_4_ = auVar136._0_4_ * -auVar146._0_4_;
            auVar64._8_4_ = auVar136._8_4_ * -auVar146._8_4_;
            auVar64._12_4_ = auVar136._12_4_ * -auVar146._12_4_;
            auVar64._16_4_ = auVar136._16_4_ * -auVar146._16_4_;
            auVar64._20_4_ = auVar136._20_4_ * -auVar146._20_4_;
            auVar64._24_4_ = auVar136._24_4_ * -auVar146._24_4_;
            auVar64._28_4_ = auVar147._28_4_;
            auVar131 = vmulps_avx512vl(auVar136,auVar128);
            auVar136 = vfmadd213ps_avx512vl(auVar148,auVar148,auVar128);
            auVar136 = vfmadd231ps_avx512vl(auVar136,auVar149,auVar149);
            auVar130 = vrsqrt14ps_avx512vl(auVar136);
            auVar136 = vmulps_avx512vl(auVar136,auVar244);
            fVar203 = auVar130._0_4_;
            fVar217 = auVar130._4_4_;
            fVar202 = auVar130._8_4_;
            fVar216 = auVar130._12_4_;
            fVar218 = auVar130._16_4_;
            fVar219 = auVar130._20_4_;
            fVar197 = auVar130._24_4_;
            auVar65._4_4_ = fVar217 * fVar217 * fVar217 * auVar136._4_4_;
            auVar65._0_4_ = fVar203 * fVar203 * fVar203 * auVar136._0_4_;
            auVar65._8_4_ = fVar202 * fVar202 * fVar202 * auVar136._8_4_;
            auVar65._12_4_ = fVar216 * fVar216 * fVar216 * auVar136._12_4_;
            auVar65._16_4_ = fVar218 * fVar218 * fVar218 * auVar136._16_4_;
            auVar65._20_4_ = fVar219 * fVar219 * fVar219 * auVar136._20_4_;
            auVar65._24_4_ = fVar197 * fVar197 * fVar197 * auVar136._24_4_;
            auVar65._28_4_ = auVar136._28_4_;
            auVar136 = vfmadd231ps_avx512vl(auVar65,auVar132,auVar130);
            auVar66._4_4_ = auVar149._4_4_ * auVar136._4_4_;
            auVar66._0_4_ = auVar149._0_4_ * auVar136._0_4_;
            auVar66._8_4_ = auVar149._8_4_ * auVar136._8_4_;
            auVar66._12_4_ = auVar149._12_4_ * auVar136._12_4_;
            auVar66._16_4_ = auVar149._16_4_ * auVar136._16_4_;
            auVar66._20_4_ = auVar149._20_4_ * auVar136._20_4_;
            auVar66._24_4_ = auVar149._24_4_ * auVar136._24_4_;
            auVar66._28_4_ = auVar130._28_4_;
            auVar67._4_4_ = auVar136._4_4_ * auVar134._4_4_;
            auVar67._0_4_ = auVar136._0_4_ * auVar134._0_4_;
            auVar67._8_4_ = auVar136._8_4_ * auVar134._8_4_;
            auVar67._12_4_ = auVar136._12_4_ * auVar134._12_4_;
            auVar67._16_4_ = auVar136._16_4_ * auVar134._16_4_;
            auVar67._20_4_ = auVar136._20_4_ * auVar134._20_4_;
            auVar67._24_4_ = auVar136._24_4_ * auVar134._24_4_;
            auVar67._28_4_ = auVar134._28_4_;
            auVar134 = vmulps_avx512vl(auVar136,auVar128);
            auVar115 = vfmadd213ps_fma(auVar63,ZEXT1632(auVar114),auVar123);
            auVar136 = ZEXT1632(auVar114);
            auVar249 = vfmadd213ps_fma(auVar64,auVar136,auVar125);
            auVar132 = vfmadd213ps_avx512vl(auVar131,auVar136,auVar120);
            auVar130 = vfmadd213ps_avx512vl(auVar66,ZEXT1632(auVar113),auVar126);
            auVar32 = vfnmadd213ps_fma(auVar63,auVar136,auVar123);
            auVar121 = ZEXT1632(auVar113);
            auVar28 = vfmadd213ps_fma(auVar67,auVar121,auVar127);
            auVar116 = vfnmadd213ps_fma(auVar64,auVar136,auVar125);
            auVar29 = vfmadd213ps_fma(auVar134,auVar121,auVar119);
            auVar125 = ZEXT1632(auVar114);
            auVar118 = vfnmadd231ps_fma(auVar120,auVar125,auVar131);
            auVar117 = vfnmadd213ps_fma(auVar66,auVar121,auVar126);
            auVar38 = vfnmadd213ps_fma(auVar67,auVar121,auVar127);
            auVar37 = vfnmadd231ps_fma(auVar119,ZEXT1632(auVar113),auVar134);
            auVar119 = vsubps_avx512vl(auVar130,ZEXT1632(auVar32));
            auVar134 = vsubps_avx(ZEXT1632(auVar28),ZEXT1632(auVar116));
            auVar136 = vsubps_avx(ZEXT1632(auVar29),ZEXT1632(auVar118));
            auVar68._4_4_ = auVar134._4_4_ * auVar118._4_4_;
            auVar68._0_4_ = auVar134._0_4_ * auVar118._0_4_;
            auVar68._8_4_ = auVar134._8_4_ * auVar118._8_4_;
            auVar68._12_4_ = auVar134._12_4_ * auVar118._12_4_;
            auVar68._16_4_ = auVar134._16_4_ * 0.0;
            auVar68._20_4_ = auVar134._20_4_ * 0.0;
            auVar68._24_4_ = auVar134._24_4_ * 0.0;
            auVar68._28_4_ = auVar131._28_4_;
            auVar114 = vfmsub231ps_fma(auVar68,ZEXT1632(auVar116),auVar136);
            auVar69._4_4_ = auVar136._4_4_ * auVar32._4_4_;
            auVar69._0_4_ = auVar136._0_4_ * auVar32._0_4_;
            auVar69._8_4_ = auVar136._8_4_ * auVar32._8_4_;
            auVar69._12_4_ = auVar136._12_4_ * auVar32._12_4_;
            auVar69._16_4_ = auVar136._16_4_ * 0.0;
            auVar69._20_4_ = auVar136._20_4_ * 0.0;
            auVar69._24_4_ = auVar136._24_4_ * 0.0;
            auVar69._28_4_ = auVar136._28_4_;
            auVar30 = vfmsub231ps_fma(auVar69,ZEXT1632(auVar118),auVar119);
            auVar70._4_4_ = auVar116._4_4_ * auVar119._4_4_;
            auVar70._0_4_ = auVar116._0_4_ * auVar119._0_4_;
            auVar70._8_4_ = auVar116._8_4_ * auVar119._8_4_;
            auVar70._12_4_ = auVar116._12_4_ * auVar119._12_4_;
            auVar70._16_4_ = auVar119._16_4_ * 0.0;
            auVar70._20_4_ = auVar119._20_4_ * 0.0;
            auVar70._24_4_ = auVar119._24_4_ * 0.0;
            auVar70._28_4_ = auVar119._28_4_;
            auVar31 = vfmsub231ps_fma(auVar70,ZEXT1632(auVar32),auVar134);
            auVar134 = vfmadd231ps_avx512vl(ZEXT1632(auVar31),auVar128,ZEXT1632(auVar30));
            auVar134 = vfmadd231ps_avx512vl(auVar134,auVar128,ZEXT1632(auVar114));
            uVar100 = vcmpps_avx512vl(auVar134,auVar128,2);
            bVar107 = (byte)uVar100;
            fVar109 = (float)((uint)(bVar107 & 1) * auVar115._0_4_ |
                             (uint)!(bool)(bVar107 & 1) * auVar117._0_4_);
            bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
            fVar161 = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar117._4_4_);
            bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
            fVar163 = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar117._8_4_);
            bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
            fVar165 = (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar117._12_4_);
            auVar121 = ZEXT1632(CONCAT412(fVar165,CONCAT48(fVar163,CONCAT44(fVar161,fVar109))));
            fVar160 = (float)((uint)(bVar107 & 1) * auVar249._0_4_ |
                             (uint)!(bool)(bVar107 & 1) * auVar38._0_4_);
            bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
            fVar162 = (float)((uint)bVar13 * auVar249._4_4_ | (uint)!bVar13 * auVar38._4_4_);
            bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
            fVar164 = (float)((uint)bVar13 * auVar249._8_4_ | (uint)!bVar13 * auVar38._8_4_);
            bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
            fVar166 = (float)((uint)bVar13 * auVar249._12_4_ | (uint)!bVar13 * auVar38._12_4_);
            auVar124 = ZEXT1632(CONCAT412(fVar166,CONCAT48(fVar164,CONCAT44(fVar162,fVar160))));
            auVar150._0_4_ =
                 (float)((uint)(bVar107 & 1) * auVar132._0_4_ |
                        (uint)!(bool)(bVar107 & 1) * auVar37._0_4_);
            bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar150._4_4_ = (float)((uint)bVar13 * auVar132._4_4_ | (uint)!bVar13 * auVar37._4_4_);
            bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar150._8_4_ = (float)((uint)bVar13 * auVar132._8_4_ | (uint)!bVar13 * auVar37._8_4_);
            bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar150._12_4_ =
                 (float)((uint)bVar13 * auVar132._12_4_ | (uint)!bVar13 * auVar37._12_4_);
            fVar217 = (float)((uint)((byte)(uVar100 >> 4) & 1) * auVar132._16_4_);
            auVar150._16_4_ = fVar217;
            fVar202 = (float)((uint)((byte)(uVar100 >> 5) & 1) * auVar132._20_4_);
            auVar150._20_4_ = fVar202;
            fVar203 = (float)((uint)((byte)(uVar100 >> 6) & 1) * auVar132._24_4_);
            auVar150._24_4_ = fVar203;
            iVar1 = (uint)(byte)(uVar100 >> 7) * auVar132._28_4_;
            auVar150._28_4_ = iVar1;
            auVar134 = vblendmps_avx512vl(ZEXT1632(auVar32),auVar130);
            auVar151._0_4_ =
                 (uint)(bVar107 & 1) * auVar134._0_4_ | (uint)!(bool)(bVar107 & 1) * auVar114._0_4_;
            bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar151._4_4_ = (uint)bVar13 * auVar134._4_4_ | (uint)!bVar13 * auVar114._4_4_;
            bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar151._8_4_ = (uint)bVar13 * auVar134._8_4_ | (uint)!bVar13 * auVar114._8_4_;
            bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar151._12_4_ = (uint)bVar13 * auVar134._12_4_ | (uint)!bVar13 * auVar114._12_4_;
            auVar151._16_4_ = (uint)((byte)(uVar100 >> 4) & 1) * auVar134._16_4_;
            auVar151._20_4_ = (uint)((byte)(uVar100 >> 5) & 1) * auVar134._20_4_;
            auVar151._24_4_ = (uint)((byte)(uVar100 >> 6) & 1) * auVar134._24_4_;
            auVar151._28_4_ = (uint)(byte)(uVar100 >> 7) * auVar134._28_4_;
            auVar134 = vblendmps_avx512vl(ZEXT1632(auVar116),ZEXT1632(auVar28));
            auVar152._0_4_ =
                 (float)((uint)(bVar107 & 1) * auVar134._0_4_ |
                        (uint)!(bool)(bVar107 & 1) * auVar115._0_4_);
            bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar152._4_4_ = (float)((uint)bVar13 * auVar134._4_4_ | (uint)!bVar13 * auVar115._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar152._8_4_ = (float)((uint)bVar13 * auVar134._8_4_ | (uint)!bVar13 * auVar115._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar152._12_4_ =
                 (float)((uint)bVar13 * auVar134._12_4_ | (uint)!bVar13 * auVar115._12_4_);
            fVar216 = (float)((uint)((byte)(uVar100 >> 4) & 1) * auVar134._16_4_);
            auVar152._16_4_ = fVar216;
            fVar219 = (float)((uint)((byte)(uVar100 >> 5) & 1) * auVar134._20_4_);
            auVar152._20_4_ = fVar219;
            fVar218 = (float)((uint)((byte)(uVar100 >> 6) & 1) * auVar134._24_4_);
            auVar152._24_4_ = fVar218;
            auVar152._28_4_ = (uint)(byte)(uVar100 >> 7) * auVar134._28_4_;
            auVar134 = vblendmps_avx512vl(ZEXT1632(auVar118),ZEXT1632(auVar29));
            auVar153._0_4_ =
                 (float)((uint)(bVar107 & 1) * auVar134._0_4_ |
                        (uint)!(bool)(bVar107 & 1) * auVar249._0_4_);
            bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar153._4_4_ = (float)((uint)bVar13 * auVar134._4_4_ | (uint)!bVar13 * auVar249._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar153._8_4_ = (float)((uint)bVar13 * auVar134._8_4_ | (uint)!bVar13 * auVar249._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar153._12_4_ =
                 (float)((uint)bVar13 * auVar134._12_4_ | (uint)!bVar13 * auVar249._12_4_);
            fVar108 = (float)((uint)((byte)(uVar100 >> 4) & 1) * auVar134._16_4_);
            auVar153._16_4_ = fVar108;
            fVar197 = (float)((uint)((byte)(uVar100 >> 5) & 1) * auVar134._20_4_);
            auVar153._20_4_ = fVar197;
            fVar201 = (float)((uint)((byte)(uVar100 >> 6) & 1) * auVar134._24_4_);
            auVar153._24_4_ = fVar201;
            iVar2 = (uint)(byte)(uVar100 >> 7) * auVar134._28_4_;
            auVar153._28_4_ = iVar2;
            auVar154._0_4_ =
                 (uint)(bVar107 & 1) * (int)auVar32._0_4_ |
                 (uint)!(bool)(bVar107 & 1) * auVar130._0_4_;
            bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
            auVar154._4_4_ = (uint)bVar13 * (int)auVar32._4_4_ | (uint)!bVar13 * auVar130._4_4_;
            bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
            auVar154._8_4_ = (uint)bVar13 * (int)auVar32._8_4_ | (uint)!bVar13 * auVar130._8_4_;
            bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar154._12_4_ = (uint)bVar13 * (int)auVar32._12_4_ | (uint)!bVar13 * auVar130._12_4_;
            auVar154._16_4_ = (uint)!(bool)((byte)(uVar100 >> 4) & 1) * auVar130._16_4_;
            auVar154._20_4_ = (uint)!(bool)((byte)(uVar100 >> 5) & 1) * auVar130._20_4_;
            auVar154._24_4_ = (uint)!(bool)((byte)(uVar100 >> 6) & 1) * auVar130._24_4_;
            auVar154._28_4_ = (uint)!SUB81(uVar100 >> 7,0) * auVar130._28_4_;
            bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar100 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar100 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar100 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar100 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
            auVar130 = vsubps_avx512vl(auVar154,auVar121);
            auVar136 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar116._12_4_ |
                                                     (uint)!bVar17 * auVar28._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar116._8_4_ |
                                                              (uint)!bVar15 * auVar28._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar116._4_4_ |
                                                                       (uint)!bVar13 * auVar28._4_4_
                                                                       ,(uint)(bVar107 & 1) *
                                                                        (int)auVar116._0_4_ |
                                                                        (uint)!(bool)(bVar107 & 1) *
                                                                        auVar28._0_4_)))),auVar124);
            auVar132 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar118._12_4_ |
                                                     (uint)!bVar18 * auVar29._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar118._8_4_ |
                                                              (uint)!bVar16 * auVar29._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar118._4_4_ |
                                                                       (uint)!bVar14 * auVar29._4_4_
                                                                       ,(uint)(bVar107 & 1) *
                                                                        (int)auVar118._0_4_ |
                                                                        (uint)!(bool)(bVar107 & 1) *
                                                                        auVar29._0_4_)))),auVar150);
            auVar131 = vsubps_avx(auVar121,auVar151);
            auVar119 = vsubps_avx(auVar124,auVar152);
            auVar120 = vsubps_avx(auVar150,auVar153);
            auVar71._4_4_ = auVar132._4_4_ * fVar161;
            auVar71._0_4_ = auVar132._0_4_ * fVar109;
            auVar71._8_4_ = auVar132._8_4_ * fVar163;
            auVar71._12_4_ = auVar132._12_4_ * fVar165;
            auVar71._16_4_ = auVar132._16_4_ * 0.0;
            auVar71._20_4_ = auVar132._20_4_ * 0.0;
            auVar71._24_4_ = auVar132._24_4_ * 0.0;
            auVar71._28_4_ = 0;
            auVar114 = vfmsub231ps_fma(auVar71,auVar150,auVar130);
            auVar200._0_4_ = fVar160 * auVar130._0_4_;
            auVar200._4_4_ = fVar162 * auVar130._4_4_;
            auVar200._8_4_ = fVar164 * auVar130._8_4_;
            auVar200._12_4_ = fVar166 * auVar130._12_4_;
            auVar200._16_4_ = auVar130._16_4_ * 0.0;
            auVar200._20_4_ = auVar130._20_4_ * 0.0;
            auVar200._24_4_ = auVar130._24_4_ * 0.0;
            auVar200._28_4_ = 0;
            auVar115 = vfmsub231ps_fma(auVar200,auVar121,auVar136);
            auVar134 = vfmadd231ps_avx512vl(ZEXT1632(auVar115),auVar128,ZEXT1632(auVar114));
            auVar214._0_4_ = auVar136._0_4_ * auVar150._0_4_;
            auVar214._4_4_ = auVar136._4_4_ * auVar150._4_4_;
            auVar214._8_4_ = auVar136._8_4_ * auVar150._8_4_;
            auVar214._12_4_ = auVar136._12_4_ * auVar150._12_4_;
            auVar214._16_4_ = auVar136._16_4_ * fVar217;
            auVar214._20_4_ = auVar136._20_4_ * fVar202;
            auVar214._24_4_ = auVar136._24_4_ * fVar203;
            auVar214._28_4_ = 0;
            auVar114 = vfmsub231ps_fma(auVar214,auVar124,auVar132);
            auVar122 = vfmadd231ps_avx512vl(auVar134,auVar128,ZEXT1632(auVar114));
            auVar134 = vmulps_avx512vl(auVar120,auVar151);
            auVar134 = vfmsub231ps_avx512vl(auVar134,auVar131,auVar153);
            auVar72._4_4_ = auVar119._4_4_ * auVar153._4_4_;
            auVar72._0_4_ = auVar119._0_4_ * auVar153._0_4_;
            auVar72._8_4_ = auVar119._8_4_ * auVar153._8_4_;
            auVar72._12_4_ = auVar119._12_4_ * auVar153._12_4_;
            auVar72._16_4_ = auVar119._16_4_ * fVar108;
            auVar72._20_4_ = auVar119._20_4_ * fVar197;
            auVar72._24_4_ = auVar119._24_4_ * fVar201;
            auVar72._28_4_ = iVar2;
            auVar114 = vfmsub231ps_fma(auVar72,auVar152,auVar120);
            auVar215._0_4_ = auVar152._0_4_ * auVar131._0_4_;
            auVar215._4_4_ = auVar152._4_4_ * auVar131._4_4_;
            auVar215._8_4_ = auVar152._8_4_ * auVar131._8_4_;
            auVar215._12_4_ = auVar152._12_4_ * auVar131._12_4_;
            auVar215._16_4_ = fVar216 * auVar131._16_4_;
            auVar215._20_4_ = fVar219 * auVar131._20_4_;
            auVar215._24_4_ = fVar218 * auVar131._24_4_;
            auVar215._28_4_ = 0;
            auVar115 = vfmsub231ps_fma(auVar215,auVar119,auVar151);
            auVar134 = vfmadd231ps_avx512vl(ZEXT1632(auVar115),auVar128,auVar134);
            auVar123 = vfmadd231ps_avx512vl(auVar134,auVar128,ZEXT1632(auVar114));
            auVar134 = vmaxps_avx(auVar122,auVar123);
            uVar168 = vcmpps_avx512vl(auVar134,auVar128,2);
            local_5f0 = local_5f0 & (byte)uVar168;
            if (local_5f0 == 0) {
LAB_01c521bd:
              local_5f0 = 0;
            }
            else {
              auVar73._4_4_ = auVar120._4_4_ * auVar136._4_4_;
              auVar73._0_4_ = auVar120._0_4_ * auVar136._0_4_;
              auVar73._8_4_ = auVar120._8_4_ * auVar136._8_4_;
              auVar73._12_4_ = auVar120._12_4_ * auVar136._12_4_;
              auVar73._16_4_ = auVar120._16_4_ * auVar136._16_4_;
              auVar73._20_4_ = auVar120._20_4_ * auVar136._20_4_;
              auVar73._24_4_ = auVar120._24_4_ * auVar136._24_4_;
              auVar73._28_4_ = auVar134._28_4_;
              auVar249 = vfmsub231ps_fma(auVar73,auVar119,auVar132);
              auVar74._4_4_ = auVar132._4_4_ * auVar131._4_4_;
              auVar74._0_4_ = auVar132._0_4_ * auVar131._0_4_;
              auVar74._8_4_ = auVar132._8_4_ * auVar131._8_4_;
              auVar74._12_4_ = auVar132._12_4_ * auVar131._12_4_;
              auVar74._16_4_ = auVar132._16_4_ * auVar131._16_4_;
              auVar74._20_4_ = auVar132._20_4_ * auVar131._20_4_;
              auVar74._24_4_ = auVar132._24_4_ * auVar131._24_4_;
              auVar74._28_4_ = auVar132._28_4_;
              auVar115 = vfmsub231ps_fma(auVar74,auVar130,auVar120);
              auVar75._4_4_ = auVar119._4_4_ * auVar130._4_4_;
              auVar75._0_4_ = auVar119._0_4_ * auVar130._0_4_;
              auVar75._8_4_ = auVar119._8_4_ * auVar130._8_4_;
              auVar75._12_4_ = auVar119._12_4_ * auVar130._12_4_;
              auVar75._16_4_ = auVar119._16_4_ * auVar130._16_4_;
              auVar75._20_4_ = auVar119._20_4_ * auVar130._20_4_;
              auVar75._24_4_ = auVar119._24_4_ * auVar130._24_4_;
              auVar75._28_4_ = auVar119._28_4_;
              auVar28 = vfmsub231ps_fma(auVar75,auVar131,auVar136);
              auVar114 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar115),ZEXT1632(auVar28));
              auVar134 = vfmadd231ps_avx512vl(ZEXT1632(auVar114),ZEXT1632(auVar249),auVar128);
              auVar136 = vrcp14ps_avx512vl(auVar134);
              auVar48._8_4_ = 0x3f800000;
              auVar48._0_8_ = &DAT_3f8000003f800000;
              auVar48._12_4_ = 0x3f800000;
              auVar48._16_4_ = 0x3f800000;
              auVar48._20_4_ = 0x3f800000;
              auVar48._24_4_ = 0x3f800000;
              auVar48._28_4_ = 0x3f800000;
              auVar132 = vfnmadd213ps_avx512vl(auVar136,auVar134,auVar48);
              auVar114 = vfmadd132ps_fma(auVar132,auVar136,auVar136);
              auVar76._4_4_ = auVar28._4_4_ * auVar150._4_4_;
              auVar76._0_4_ = auVar28._0_4_ * auVar150._0_4_;
              auVar76._8_4_ = auVar28._8_4_ * auVar150._8_4_;
              auVar76._12_4_ = auVar28._12_4_ * auVar150._12_4_;
              auVar76._16_4_ = fVar217 * 0.0;
              auVar76._20_4_ = fVar202 * 0.0;
              auVar76._24_4_ = fVar203 * 0.0;
              auVar76._28_4_ = iVar1;
              auVar115 = vfmadd231ps_fma(auVar76,auVar124,ZEXT1632(auVar115));
              auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar121,ZEXT1632(auVar249));
              fVar203 = auVar114._0_4_;
              fVar217 = auVar114._4_4_;
              fVar202 = auVar114._8_4_;
              fVar216 = auVar114._12_4_;
              auVar136 = ZEXT1632(CONCAT412(auVar115._12_4_ * fVar216,
                                            CONCAT48(auVar115._8_4_ * fVar202,
                                                     CONCAT44(auVar115._4_4_ * fVar217,
                                                              auVar115._0_4_ * fVar203))));
              auVar97._4_4_ = uStack_6dc;
              auVar97._0_4_ = local_6e0;
              auVar97._8_4_ = uStack_6d8;
              auVar97._12_4_ = uStack_6d4;
              auVar97._16_4_ = uStack_6d0;
              auVar97._20_4_ = uStack_6cc;
              auVar97._24_4_ = uStack_6c8;
              auVar97._28_4_ = uStack_6c4;
              uVar168 = vcmpps_avx512vl(auVar136,auVar97,0xd);
              uVar167 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar49._4_4_ = uVar167;
              auVar49._0_4_ = uVar167;
              auVar49._8_4_ = uVar167;
              auVar49._12_4_ = uVar167;
              auVar49._16_4_ = uVar167;
              auVar49._20_4_ = uVar167;
              auVar49._24_4_ = uVar167;
              auVar49._28_4_ = uVar167;
              uVar33 = vcmpps_avx512vl(auVar136,auVar49,2);
              local_5f0 = (byte)uVar168 & (byte)uVar33 & local_5f0;
              if (local_5f0 == 0) goto LAB_01c521bd;
              uVar168 = vcmpps_avx512vl(auVar134,auVar128,4);
              if ((local_5f0 & (byte)uVar168) == 0) {
                local_5f0 = 0;
              }
              else {
                local_5f0 = local_5f0 & (byte)uVar168;
                fVar218 = auVar122._0_4_ * fVar203;
                fVar219 = auVar122._4_4_ * fVar217;
                auVar77._4_4_ = fVar219;
                auVar77._0_4_ = fVar218;
                fVar197 = auVar122._8_4_ * fVar202;
                auVar77._8_4_ = fVar197;
                fVar201 = auVar122._12_4_ * fVar216;
                auVar77._12_4_ = fVar201;
                fVar108 = auVar122._16_4_ * 0.0;
                auVar77._16_4_ = fVar108;
                fVar109 = auVar122._20_4_ * 0.0;
                auVar77._20_4_ = fVar109;
                fVar160 = auVar122._24_4_ * 0.0;
                auVar77._24_4_ = fVar160;
                auVar77._28_4_ = auVar122._28_4_;
                fVar203 = auVar123._0_4_ * fVar203;
                fVar217 = auVar123._4_4_ * fVar217;
                auVar78._4_4_ = fVar217;
                auVar78._0_4_ = fVar203;
                fVar202 = auVar123._8_4_ * fVar202;
                auVar78._8_4_ = fVar202;
                fVar216 = auVar123._12_4_ * fVar216;
                auVar78._12_4_ = fVar216;
                fVar161 = auVar123._16_4_ * 0.0;
                auVar78._16_4_ = fVar161;
                fVar162 = auVar123._20_4_ * 0.0;
                auVar78._20_4_ = fVar162;
                fVar163 = auVar123._24_4_ * 0.0;
                auVar78._24_4_ = fVar163;
                auVar78._28_4_ = auVar123._28_4_;
                auVar226._8_4_ = 0x3f800000;
                auVar226._0_8_ = &DAT_3f8000003f800000;
                auVar226._12_4_ = 0x3f800000;
                auVar226._16_4_ = 0x3f800000;
                auVar226._20_4_ = 0x3f800000;
                auVar226._24_4_ = 0x3f800000;
                auVar226._28_4_ = 0x3f800000;
                auVar134 = vsubps_avx(auVar226,auVar77);
                local_880._0_4_ =
                     (uint)(bVar107 & 1) * (int)fVar218 |
                     (uint)!(bool)(bVar107 & 1) * auVar134._0_4_;
                bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
                local_880._4_4_ = (uint)bVar13 * (int)fVar219 | (uint)!bVar13 * auVar134._4_4_;
                bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
                local_880._8_4_ = (uint)bVar13 * (int)fVar197 | (uint)!bVar13 * auVar134._8_4_;
                bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
                local_880._12_4_ = (uint)bVar13 * (int)fVar201 | (uint)!bVar13 * auVar134._12_4_;
                bVar13 = (bool)((byte)(uVar100 >> 4) & 1);
                local_880._16_4_ = (uint)bVar13 * (int)fVar108 | (uint)!bVar13 * auVar134._16_4_;
                bVar13 = (bool)((byte)(uVar100 >> 5) & 1);
                local_880._20_4_ = (uint)bVar13 * (int)fVar109 | (uint)!bVar13 * auVar134._20_4_;
                bVar13 = (bool)((byte)(uVar100 >> 6) & 1);
                local_880._24_4_ = (uint)bVar13 * (int)fVar160 | (uint)!bVar13 * auVar134._24_4_;
                bVar13 = SUB81(uVar100 >> 7,0);
                local_880._28_4_ = (uint)bVar13 * auVar122._28_4_ | (uint)!bVar13 * auVar134._28_4_;
                auVar134 = vsubps_avx(auVar226,auVar78);
                local_540._0_4_ =
                     (uint)(bVar107 & 1) * (int)fVar203 |
                     (uint)!(bool)(bVar107 & 1) * auVar134._0_4_;
                bVar13 = (bool)((byte)(uVar100 >> 1) & 1);
                local_540._4_4_ = (uint)bVar13 * (int)fVar217 | (uint)!bVar13 * auVar134._4_4_;
                bVar13 = (bool)((byte)(uVar100 >> 2) & 1);
                local_540._8_4_ = (uint)bVar13 * (int)fVar202 | (uint)!bVar13 * auVar134._8_4_;
                bVar13 = (bool)((byte)(uVar100 >> 3) & 1);
                local_540._12_4_ = (uint)bVar13 * (int)fVar216 | (uint)!bVar13 * auVar134._12_4_;
                bVar13 = (bool)((byte)(uVar100 >> 4) & 1);
                local_540._16_4_ = (uint)bVar13 * (int)fVar161 | (uint)!bVar13 * auVar134._16_4_;
                bVar13 = (bool)((byte)(uVar100 >> 5) & 1);
                local_540._20_4_ = (uint)bVar13 * (int)fVar162 | (uint)!bVar13 * auVar134._20_4_;
                bVar13 = (bool)((byte)(uVar100 >> 6) & 1);
                local_540._24_4_ = (uint)bVar13 * (int)fVar163 | (uint)!bVar13 * auVar134._24_4_;
                bVar13 = SUB81(uVar100 >> 7,0);
                local_540._28_4_ = (uint)bVar13 * auVar123._28_4_ | (uint)!bVar13 * auVar134._28_4_;
                local_8a0 = auVar136;
              }
            }
            auVar253 = ZEXT3264(local_920);
            auVar241 = ZEXT3264(local_900);
            if (local_5f0 != 0) {
              auVar134 = vsubps_avx(ZEXT1632(auVar113),auVar125);
              auVar114 = vfmadd213ps_fma(auVar134,local_880,auVar125);
              uVar167 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar50._4_4_ = uVar167;
              auVar50._0_4_ = uVar167;
              auVar50._8_4_ = uVar167;
              auVar50._12_4_ = uVar167;
              auVar50._16_4_ = uVar167;
              auVar50._20_4_ = uVar167;
              auVar50._24_4_ = uVar167;
              auVar50._28_4_ = uVar167;
              auVar134 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar114._12_4_ + auVar114._12_4_,
                                                            CONCAT48(auVar114._8_4_ + auVar114._8_4_
                                                                     ,CONCAT44(auVar114._4_4_ +
                                                                               auVar114._4_4_,
                                                                               auVar114._0_4_ +
                                                                               auVar114._0_4_)))),
                                         auVar50);
              uVar168 = vcmpps_avx512vl(local_8a0,auVar134,6);
              local_5f0 = local_5f0 & (byte)uVar168;
              if (local_5f0 != 0) {
                auVar179._8_4_ = 0xbf800000;
                auVar179._0_8_ = 0xbf800000bf800000;
                auVar179._12_4_ = 0xbf800000;
                auVar179._16_4_ = 0xbf800000;
                auVar179._20_4_ = 0xbf800000;
                auVar179._24_4_ = 0xbf800000;
                auVar179._28_4_ = 0xbf800000;
                auVar51._8_4_ = 0x40000000;
                auVar51._0_8_ = 0x4000000040000000;
                auVar51._12_4_ = 0x40000000;
                auVar51._16_4_ = 0x40000000;
                auVar51._20_4_ = 0x40000000;
                auVar51._24_4_ = 0x40000000;
                auVar51._28_4_ = 0x40000000;
                local_680 = vfmadd132ps_avx512vl(local_540,auVar179,auVar51);
                local_540 = local_680;
                auVar134 = local_540;
                local_640 = (undefined4)lVar102;
                local_630 = local_970;
                uStack_628 = uStack_968;
                local_620 = local_8b0._0_8_;
                uStack_618 = local_8b0._8_8_;
                local_610 = local_8c0._0_8_;
                uStack_608 = local_8c0._8_8_;
                local_600 = local_8d0;
                uStack_5f8 = uStack_8c8;
                pGVar104 = (context->scene->geometries).items[uVar105].ptr;
                local_540 = auVar134;
                if ((pGVar104->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  auVar114 = vcvtsi2ss_avx512f(auVar245._0_16_,local_640);
                  fVar203 = auVar114._0_4_;
                  local_5e0[0] = (fVar203 + local_880._0_4_ + 0.0) * (float)local_6c0._0_4_;
                  local_5e0[1] = (fVar203 + local_880._4_4_ + 1.0) * (float)local_6c0._4_4_;
                  local_5e0[2] = (fVar203 + local_880._8_4_ + 2.0) * fStack_6b8;
                  local_5e0[3] = (fVar203 + local_880._12_4_ + 3.0) * fStack_6b4;
                  fStack_5d0 = (fVar203 + local_880._16_4_ + 4.0) * fStack_6b0;
                  fStack_5cc = (fVar203 + local_880._20_4_ + 5.0) * fStack_6ac;
                  fStack_5c8 = (fVar203 + local_880._24_4_ + 6.0) * fStack_6a8;
                  fStack_5c4 = fVar203 + local_880._28_4_ + 7.0;
                  local_540._0_8_ = local_680._0_8_;
                  local_540._8_8_ = local_680._8_8_;
                  local_540._16_8_ = local_680._16_8_;
                  local_540._24_8_ = local_680._24_8_;
                  local_5c0 = local_540._0_8_;
                  uStack_5b8 = local_540._8_8_;
                  uStack_5b0 = local_540._16_8_;
                  uStack_5a8 = local_540._24_8_;
                  local_5a0 = local_8a0;
                  auVar180._8_4_ = 0x7f800000;
                  auVar180._0_8_ = 0x7f8000007f800000;
                  auVar180._12_4_ = 0x7f800000;
                  auVar180._16_4_ = 0x7f800000;
                  auVar180._20_4_ = 0x7f800000;
                  auVar180._24_4_ = 0x7f800000;
                  auVar180._28_4_ = 0x7f800000;
                  auVar134 = vblendmps_avx512vl(auVar180,local_8a0);
                  auVar155._0_4_ =
                       (uint)(local_5f0 & 1) * auVar134._0_4_ |
                       (uint)!(bool)(local_5f0 & 1) * 0x7f800000;
                  bVar13 = (bool)(local_5f0 >> 1 & 1);
                  auVar155._4_4_ = (uint)bVar13 * auVar134._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_5f0 >> 2 & 1);
                  auVar155._8_4_ = (uint)bVar13 * auVar134._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_5f0 >> 3 & 1);
                  auVar155._12_4_ = (uint)bVar13 * auVar134._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_5f0 >> 4 & 1);
                  auVar155._16_4_ = (uint)bVar13 * auVar134._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_5f0 >> 5 & 1);
                  auVar155._20_4_ = (uint)bVar13 * auVar134._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_5f0 >> 6 & 1);
                  auVar155._24_4_ = (uint)bVar13 * auVar134._24_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar155._28_4_ =
                       (uint)(local_5f0 >> 7) * auVar134._28_4_ |
                       (uint)!(bool)(local_5f0 >> 7) * 0x7f800000;
                  auVar134 = vshufps_avx(auVar155,auVar155,0xb1);
                  auVar134 = vminps_avx(auVar155,auVar134);
                  auVar136 = vshufpd_avx(auVar134,auVar134,5);
                  auVar134 = vminps_avx(auVar134,auVar136);
                  auVar136 = vpermpd_avx2(auVar134,0x4e);
                  auVar134 = vminps_avx(auVar134,auVar136);
                  uVar168 = vcmpps_avx512vl(auVar155,auVar134,0);
                  bVar99 = (byte)uVar168 & local_5f0;
                  bVar107 = local_5f0;
                  if (bVar99 != 0) {
                    bVar107 = bVar99;
                  }
                  uVar35 = 0;
                  for (uVar101 = (uint)bVar107; (uVar101 & 1) == 0;
                      uVar101 = uVar101 >> 1 | 0x80000000) {
                    uVar35 = uVar35 + 1;
                  }
                  uVar100 = (ulong)uVar35;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar104->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar203 = local_5e0[uVar100];
                    uVar167 = *(undefined4 *)((long)&local_5c0 + uVar100 * 4);
                    fVar217 = 1.0 - fVar203;
                    auVar42._8_4_ = 0x80000000;
                    auVar42._0_8_ = 0x8000000080000000;
                    auVar42._12_4_ = 0x80000000;
                    auVar115 = vxorps_avx512vl(ZEXT416((uint)fVar217),auVar42);
                    auVar114 = ZEXT416((uint)(fVar203 * fVar217 * 4.0));
                    auVar113 = vfnmsub213ss_fma(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),
                                                auVar114);
                    auVar114 = vfmadd213ss_fma(ZEXT416((uint)fVar217),ZEXT416((uint)fVar217),
                                               auVar114);
                    fVar217 = fVar217 * auVar115._0_4_ * 0.5;
                    fVar202 = auVar113._0_4_ * 0.5;
                    fVar216 = auVar114._0_4_ * 0.5;
                    fVar218 = fVar203 * fVar203 * 0.5;
                    auVar208._0_4_ = fVar218 * (float)local_8d0._0_4_;
                    auVar208._4_4_ = fVar218 * (float)local_8d0._4_4_;
                    auVar208._8_4_ = fVar218 * (float)uStack_8c8;
                    auVar208._12_4_ = fVar218 * uStack_8c8._4_4_;
                    auVar195._4_4_ = fVar216;
                    auVar195._0_4_ = fVar216;
                    auVar195._8_4_ = fVar216;
                    auVar195._12_4_ = fVar216;
                    auVar114 = vfmadd132ps_fma(auVar195,auVar208,local_8c0);
                    auVar209._4_4_ = fVar202;
                    auVar209._0_4_ = fVar202;
                    auVar209._8_4_ = fVar202;
                    auVar209._12_4_ = fVar202;
                    auVar114 = vfmadd132ps_fma(auVar209,auVar114,local_8b0);
                    auVar196._4_4_ = fVar217;
                    auVar196._0_4_ = fVar217;
                    auVar196._8_4_ = fVar217;
                    auVar196._12_4_ = fVar217;
                    auVar114 = vfmadd132ps_fma(auVar196,auVar114,auVar27);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5a0 + uVar100 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar114._0_4_;
                    uVar9 = vextractps_avx(auVar114,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar9;
                    uVar9 = vextractps_avx(auVar114,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar9;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar203;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar167;
                    *(uint *)(ray + k * 4 + 0x440) = uVar7;
                    *(uint *)(ray + k * 4 + 0x480) = uVar105;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                  else {
                    local_7b0 = local_8b0._0_8_;
                    uStack_7a8 = local_8b0._8_8_;
                    local_7c0 = local_8c0._0_4_;
                    fStack_7bc = local_8c0._4_4_;
                    fStack_7b8 = local_8c0._8_4_;
                    fStack_7b4 = local_8c0._12_4_;
                    _local_8e0 = _local_8d0;
                    local_4e0 = vmovdqa64_avx512vl(auVar254._0_32_);
                    local_930 = pGVar104;
                    local_6a0 = local_880;
                    local_660 = local_8a0;
                    local_63c = iVar8;
                    bVar107 = local_5f0;
                    do {
                      auVar245 = local_4c0;
                      auVar249 = auVar250._0_16_;
                      local_7a0 = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_5e0[uVar100]));
                      local_1c0 = vbroadcastss_avx512f
                                            (ZEXT416(*(uint *)((long)&local_5c0 + uVar100 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) =
                           *(undefined4 *)(local_5a0 + uVar100 * 4);
                      local_960.context = context->user;
                      fVar216 = local_200._0_4_;
                      fVar203 = 1.0 - fVar216;
                      auVar43._8_4_ = 0x80000000;
                      auVar43._0_8_ = 0x8000000080000000;
                      auVar43._12_4_ = 0x80000000;
                      auVar115 = vxorps_avx512vl(ZEXT416((uint)fVar203),auVar43);
                      auVar114 = ZEXT416((uint)(fVar216 * fVar203 * 4.0));
                      auVar113 = vfnmsub213ss_fma(local_200._0_16_,local_200._0_16_,auVar114);
                      auVar114 = vfmadd213ss_fma(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),
                                                 auVar114);
                      fVar203 = fVar203 * auVar115._0_4_ * 0.5;
                      fVar217 = auVar113._0_4_ * 0.5;
                      fVar202 = auVar114._0_4_ * 0.5;
                      fVar216 = fVar216 * fVar216 * 0.5;
                      auVar223._0_4_ = fVar216 * (float)local_8e0._0_4_;
                      auVar223._4_4_ = fVar216 * (float)local_8e0._4_4_;
                      auVar223._8_4_ = fVar216 * fStack_8d8;
                      auVar223._12_4_ = fVar216 * fStack_8d4;
                      auVar173._4_4_ = fVar202;
                      auVar173._0_4_ = fVar202;
                      auVar173._8_4_ = fVar202;
                      auVar173._12_4_ = fVar202;
                      auVar92._4_4_ = fStack_7bc;
                      auVar92._0_4_ = local_7c0;
                      auVar92._8_4_ = fStack_7b8;
                      auVar92._12_4_ = fStack_7b4;
                      auVar114 = vfmadd132ps_fma(auVar173,auVar223,auVar92);
                      auVar210._4_4_ = fVar217;
                      auVar210._0_4_ = fVar217;
                      auVar210._8_4_ = fVar217;
                      auVar210._12_4_ = fVar217;
                      auVar93._8_8_ = uStack_7a8;
                      auVar93._0_8_ = local_7b0;
                      auVar114 = vfmadd132ps_fma(auVar210,auVar114,auVar93);
                      auVar174._4_4_ = fVar203;
                      auVar174._0_4_ = fVar203;
                      auVar174._8_4_ = fVar203;
                      auVar174._12_4_ = fVar203;
                      auVar114 = vfmadd132ps_fma(auVar174,auVar114,auVar27);
                      auVar158 = vbroadcastss_avx512f(auVar114);
                      auVar159 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar159,ZEXT1664(auVar114));
                      auVar159 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar159,ZEXT1664(auVar114));
                      local_2c0[0] = (RTCHitN)auVar158[0];
                      local_2c0[1] = (RTCHitN)auVar158[1];
                      local_2c0[2] = (RTCHitN)auVar158[2];
                      local_2c0[3] = (RTCHitN)auVar158[3];
                      local_2c0[4] = (RTCHitN)auVar158[4];
                      local_2c0[5] = (RTCHitN)auVar158[5];
                      local_2c0[6] = (RTCHitN)auVar158[6];
                      local_2c0[7] = (RTCHitN)auVar158[7];
                      local_2c0[8] = (RTCHitN)auVar158[8];
                      local_2c0[9] = (RTCHitN)auVar158[9];
                      local_2c0[10] = (RTCHitN)auVar158[10];
                      local_2c0[0xb] = (RTCHitN)auVar158[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar158[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar158[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar158[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar158[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar158[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar158[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar158[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar158[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar158[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar158[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar158[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar158[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar158[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar158[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar158[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar158[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar158[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar158[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar158[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar158[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar158[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar158[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar158[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar158[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar158[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar158[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar158[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar158[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar158[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar158[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar158[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar158[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar158[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar158[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar158[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar158[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar158[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar158[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar158[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar158[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar158[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar158[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar158[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar158[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar158[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar158[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar158[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar158[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar158[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar158[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar158[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar158[0x3f];
                      local_180 = local_480._0_8_;
                      uStack_178 = local_480._8_8_;
                      uStack_170 = local_480._16_8_;
                      uStack_168 = local_480._24_8_;
                      uStack_160 = local_480._32_8_;
                      uStack_158 = local_480._40_8_;
                      uStack_150 = local_480._48_8_;
                      uStack_148 = local_480._56_8_;
                      auVar158 = vmovdqa64_avx512f(local_440);
                      local_140 = vmovdqa64_avx512f(auVar158);
                      auVar134 = vpcmpeqd_avx2(auVar158._0_32_,auVar158._0_32_);
                      local_928[3] = auVar134;
                      local_928[2] = auVar134;
                      local_928[1] = auVar134;
                      *local_928 = auVar134;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_960.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_960.context)->instPrimID[0]));
                      local_580 = local_300;
                      local_960.valid = (int *)local_580;
                      local_960.geometryUserPtr = pGVar104->userPtr;
                      local_960.hit = local_2c0;
                      local_960.N = 0x10;
                      local_4c0._1_3_ = 0;
                      local_4c0[0] = bVar107;
                      local_4c0._4_60_ = auVar245._4_60_;
                      local_960.ray = (RTCRayN *)ray;
                      if (pGVar104->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar104->intersectionFilterN)(&local_960);
                        auVar134 = vmovdqa64_avx512vl(local_4e0);
                        auVar254 = ZEXT3264(auVar134);
                        auVar252 = ZEXT3264(local_820);
                        auVar183 = ZEXT3264(local_800);
                        auVar251 = ZEXT3264(local_7e0);
                        auVar253 = ZEXT3264(local_920);
                        auVar241 = ZEXT3264(local_900);
                        auVar248 = ZEXT3264(local_740);
                        auVar247 = ZEXT3264(local_700);
                        auVar246 = ZEXT3264(local_720);
                        auVar114 = vxorps_avx512vl(auVar249,auVar249);
                        auVar250 = ZEXT1664(auVar114);
                        pGVar104 = local_930;
                        bVar107 = local_4c0[0];
                      }
                      auVar114 = auVar250._0_16_;
                      auVar245 = vmovdqa64_avx512f(local_580);
                      uVar168 = vptestmd_avx512f(auVar245,auVar245);
                      if ((short)uVar168 == 0) {
LAB_01c5264a:
                        *(undefined4 *)(ray + k * 4 + 0x200) = local_7a0;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar104->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var12)(&local_960);
                          bVar107 = local_4c0[0];
                          auVar134 = vmovdqa64_avx512vl(local_4e0);
                          auVar254 = ZEXT3264(auVar134);
                          auVar252 = ZEXT3264(local_820);
                          auVar183 = ZEXT3264(local_800);
                          auVar251 = ZEXT3264(local_7e0);
                          auVar253 = ZEXT3264(local_920);
                          auVar241 = ZEXT3264(local_900);
                          auVar248 = ZEXT3264(local_740);
                          auVar247 = ZEXT3264(local_700);
                          auVar246 = ZEXT3264(local_720);
                          auVar114 = vxorps_avx512vl(auVar114,auVar114);
                          auVar250 = ZEXT1664(auVar114);
                          pGVar104 = local_930;
                        }
                        auVar245 = vmovdqa64_avx512f(local_580);
                        uVar34 = vptestmd_avx512f(auVar245,auVar245);
                        if ((short)uVar34 == 0) goto LAB_01c5264a;
                        iVar1 = *(int *)(local_960.hit + 4);
                        iVar2 = *(int *)(local_960.hit + 8);
                        iVar79 = *(int *)(local_960.hit + 0xc);
                        iVar80 = *(int *)(local_960.hit + 0x10);
                        iVar81 = *(int *)(local_960.hit + 0x14);
                        iVar82 = *(int *)(local_960.hit + 0x18);
                        iVar83 = *(int *)(local_960.hit + 0x1c);
                        iVar84 = *(int *)(local_960.hit + 0x20);
                        iVar85 = *(int *)(local_960.hit + 0x24);
                        iVar86 = *(int *)(local_960.hit + 0x28);
                        iVar87 = *(int *)(local_960.hit + 0x2c);
                        iVar88 = *(int *)(local_960.hit + 0x30);
                        iVar89 = *(int *)(local_960.hit + 0x34);
                        iVar90 = *(int *)(local_960.hit + 0x38);
                        iVar91 = *(int *)(local_960.hit + 0x3c);
                        bVar99 = (byte)uVar34;
                        bVar13 = (bool)((byte)(uVar34 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar34 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar34 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar34 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar34 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar34 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar34 >> 7) & 1);
                        bVar98 = (byte)(uVar34 >> 8);
                        bVar20 = (bool)((byte)(uVar34 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar34 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar34 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar34 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar34 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar34 >> 0xe) & 1);
                        bVar26 = SUB81(uVar34 >> 0xf,0);
                        *(uint *)(local_960.ray + 0x300) =
                             (uint)(bVar99 & 1) * *(int *)local_960.hit |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_960.ray + 0x300);
                        *(uint *)(local_960.ray + 0x304) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 0x304);
                        *(uint *)(local_960.ray + 0x308) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x308);
                        *(uint *)(local_960.ray + 0x30c) =
                             (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_960.ray + 0x30c)
                        ;
                        *(uint *)(local_960.ray + 0x310) =
                             (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_960.ray + 0x310)
                        ;
                        *(uint *)(local_960.ray + 0x314) =
                             (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_960.ray + 0x314)
                        ;
                        *(uint *)(local_960.ray + 0x318) =
                             (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_960.ray + 0x318)
                        ;
                        *(uint *)(local_960.ray + 0x31c) =
                             (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_960.ray + 0x31c)
                        ;
                        *(uint *)(local_960.ray + 800) =
                             (uint)(bVar98 & 1) * iVar84 |
                             (uint)!(bool)(bVar98 & 1) * *(int *)(local_960.ray + 800);
                        *(uint *)(local_960.ray + 0x324) =
                             (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_960.ray + 0x324)
                        ;
                        *(uint *)(local_960.ray + 0x328) =
                             (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_960.ray + 0x328)
                        ;
                        *(uint *)(local_960.ray + 0x32c) =
                             (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_960.ray + 0x32c)
                        ;
                        *(uint *)(local_960.ray + 0x330) =
                             (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_960.ray + 0x330)
                        ;
                        *(uint *)(local_960.ray + 0x334) =
                             (uint)bVar24 * iVar89 | (uint)!bVar24 * *(int *)(local_960.ray + 0x334)
                        ;
                        *(uint *)(local_960.ray + 0x338) =
                             (uint)bVar25 * iVar90 | (uint)!bVar25 * *(int *)(local_960.ray + 0x338)
                        ;
                        *(uint *)(local_960.ray + 0x33c) =
                             (uint)bVar26 * iVar91 | (uint)!bVar26 * *(int *)(local_960.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_960.hit + 0x44);
                        iVar2 = *(int *)(local_960.hit + 0x48);
                        iVar79 = *(int *)(local_960.hit + 0x4c);
                        iVar80 = *(int *)(local_960.hit + 0x50);
                        iVar81 = *(int *)(local_960.hit + 0x54);
                        iVar82 = *(int *)(local_960.hit + 0x58);
                        iVar83 = *(int *)(local_960.hit + 0x5c);
                        iVar84 = *(int *)(local_960.hit + 0x60);
                        iVar85 = *(int *)(local_960.hit + 100);
                        iVar86 = *(int *)(local_960.hit + 0x68);
                        iVar87 = *(int *)(local_960.hit + 0x6c);
                        iVar88 = *(int *)(local_960.hit + 0x70);
                        iVar89 = *(int *)(local_960.hit + 0x74);
                        iVar90 = *(int *)(local_960.hit + 0x78);
                        iVar91 = *(int *)(local_960.hit + 0x7c);
                        bVar13 = (bool)((byte)(uVar34 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar34 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar34 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar34 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar34 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar34 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar34 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar34 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar34 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar34 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar34 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar34 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar34 >> 0xe) & 1);
                        bVar26 = SUB81(uVar34 >> 0xf,0);
                        *(uint *)(local_960.ray + 0x340) =
                             (uint)(bVar99 & 1) * *(int *)(local_960.hit + 0x40) |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_960.ray + 0x340);
                        *(uint *)(local_960.ray + 0x344) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 0x344);
                        *(uint *)(local_960.ray + 0x348) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x348);
                        *(uint *)(local_960.ray + 0x34c) =
                             (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_960.ray + 0x34c)
                        ;
                        *(uint *)(local_960.ray + 0x350) =
                             (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_960.ray + 0x350)
                        ;
                        *(uint *)(local_960.ray + 0x354) =
                             (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_960.ray + 0x354)
                        ;
                        *(uint *)(local_960.ray + 0x358) =
                             (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_960.ray + 0x358)
                        ;
                        *(uint *)(local_960.ray + 0x35c) =
                             (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_960.ray + 0x35c)
                        ;
                        *(uint *)(local_960.ray + 0x360) =
                             (uint)(bVar98 & 1) * iVar84 |
                             (uint)!(bool)(bVar98 & 1) * *(int *)(local_960.ray + 0x360);
                        *(uint *)(local_960.ray + 0x364) =
                             (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_960.ray + 0x364)
                        ;
                        *(uint *)(local_960.ray + 0x368) =
                             (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_960.ray + 0x368)
                        ;
                        *(uint *)(local_960.ray + 0x36c) =
                             (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_960.ray + 0x36c)
                        ;
                        *(uint *)(local_960.ray + 0x370) =
                             (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_960.ray + 0x370)
                        ;
                        *(uint *)(local_960.ray + 0x374) =
                             (uint)bVar24 * iVar89 | (uint)!bVar24 * *(int *)(local_960.ray + 0x374)
                        ;
                        *(uint *)(local_960.ray + 0x378) =
                             (uint)bVar25 * iVar90 | (uint)!bVar25 * *(int *)(local_960.ray + 0x378)
                        ;
                        *(uint *)(local_960.ray + 0x37c) =
                             (uint)bVar26 * iVar91 | (uint)!bVar26 * *(int *)(local_960.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_960.hit + 0x84);
                        iVar2 = *(int *)(local_960.hit + 0x88);
                        iVar79 = *(int *)(local_960.hit + 0x8c);
                        iVar80 = *(int *)(local_960.hit + 0x90);
                        iVar81 = *(int *)(local_960.hit + 0x94);
                        iVar82 = *(int *)(local_960.hit + 0x98);
                        iVar83 = *(int *)(local_960.hit + 0x9c);
                        iVar84 = *(int *)(local_960.hit + 0xa0);
                        iVar85 = *(int *)(local_960.hit + 0xa4);
                        iVar86 = *(int *)(local_960.hit + 0xa8);
                        iVar87 = *(int *)(local_960.hit + 0xac);
                        iVar88 = *(int *)(local_960.hit + 0xb0);
                        iVar89 = *(int *)(local_960.hit + 0xb4);
                        iVar90 = *(int *)(local_960.hit + 0xb8);
                        iVar91 = *(int *)(local_960.hit + 0xbc);
                        bVar13 = (bool)((byte)(uVar34 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar34 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar34 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar34 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar34 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar34 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar34 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar34 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar34 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar34 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar34 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar34 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar34 >> 0xe) & 1);
                        bVar26 = SUB81(uVar34 >> 0xf,0);
                        *(uint *)(local_960.ray + 0x380) =
                             (uint)(bVar99 & 1) * *(int *)(local_960.hit + 0x80) |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_960.ray + 0x380);
                        *(uint *)(local_960.ray + 900) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 900);
                        *(uint *)(local_960.ray + 0x388) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x388);
                        *(uint *)(local_960.ray + 0x38c) =
                             (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_960.ray + 0x38c)
                        ;
                        *(uint *)(local_960.ray + 0x390) =
                             (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_960.ray + 0x390)
                        ;
                        *(uint *)(local_960.ray + 0x394) =
                             (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_960.ray + 0x394)
                        ;
                        *(uint *)(local_960.ray + 0x398) =
                             (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_960.ray + 0x398)
                        ;
                        *(uint *)(local_960.ray + 0x39c) =
                             (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_960.ray + 0x39c)
                        ;
                        *(uint *)(local_960.ray + 0x3a0) =
                             (uint)(bVar98 & 1) * iVar84 |
                             (uint)!(bool)(bVar98 & 1) * *(int *)(local_960.ray + 0x3a0);
                        *(uint *)(local_960.ray + 0x3a4) =
                             (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_960.ray + 0x3a4)
                        ;
                        *(uint *)(local_960.ray + 0x3a8) =
                             (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_960.ray + 0x3a8)
                        ;
                        *(uint *)(local_960.ray + 0x3ac) =
                             (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_960.ray + 0x3ac)
                        ;
                        *(uint *)(local_960.ray + 0x3b0) =
                             (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_960.ray + 0x3b0)
                        ;
                        *(uint *)(local_960.ray + 0x3b4) =
                             (uint)bVar24 * iVar89 | (uint)!bVar24 * *(int *)(local_960.ray + 0x3b4)
                        ;
                        *(uint *)(local_960.ray + 0x3b8) =
                             (uint)bVar25 * iVar90 | (uint)!bVar25 * *(int *)(local_960.ray + 0x3b8)
                        ;
                        *(uint *)(local_960.ray + 0x3bc) =
                             (uint)bVar26 * iVar91 | (uint)!bVar26 * *(int *)(local_960.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_960.hit + 0xc4);
                        iVar2 = *(int *)(local_960.hit + 200);
                        iVar79 = *(int *)(local_960.hit + 0xcc);
                        iVar80 = *(int *)(local_960.hit + 0xd0);
                        iVar81 = *(int *)(local_960.hit + 0xd4);
                        iVar82 = *(int *)(local_960.hit + 0xd8);
                        iVar83 = *(int *)(local_960.hit + 0xdc);
                        iVar84 = *(int *)(local_960.hit + 0xe0);
                        iVar85 = *(int *)(local_960.hit + 0xe4);
                        iVar86 = *(int *)(local_960.hit + 0xe8);
                        iVar87 = *(int *)(local_960.hit + 0xec);
                        iVar88 = *(int *)(local_960.hit + 0xf0);
                        iVar89 = *(int *)(local_960.hit + 0xf4);
                        iVar90 = *(int *)(local_960.hit + 0xf8);
                        iVar91 = *(int *)(local_960.hit + 0xfc);
                        bVar13 = (bool)((byte)(uVar34 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar34 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar34 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar34 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar34 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar34 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar34 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar34 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar34 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar34 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar34 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar34 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar34 >> 0xe) & 1);
                        bVar26 = SUB81(uVar34 >> 0xf,0);
                        *(uint *)(local_960.ray + 0x3c0) =
                             (uint)(bVar99 & 1) * *(int *)(local_960.hit + 0xc0) |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_960.ray + 0x3c0);
                        *(uint *)(local_960.ray + 0x3c4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 0x3c4);
                        *(uint *)(local_960.ray + 0x3c8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x3c8);
                        *(uint *)(local_960.ray + 0x3cc) =
                             (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_960.ray + 0x3cc)
                        ;
                        *(uint *)(local_960.ray + 0x3d0) =
                             (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_960.ray + 0x3d0)
                        ;
                        *(uint *)(local_960.ray + 0x3d4) =
                             (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_960.ray + 0x3d4)
                        ;
                        *(uint *)(local_960.ray + 0x3d8) =
                             (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_960.ray + 0x3d8)
                        ;
                        *(uint *)(local_960.ray + 0x3dc) =
                             (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_960.ray + 0x3dc)
                        ;
                        *(uint *)(local_960.ray + 0x3e0) =
                             (uint)(bVar98 & 1) * iVar84 |
                             (uint)!(bool)(bVar98 & 1) * *(int *)(local_960.ray + 0x3e0);
                        *(uint *)(local_960.ray + 0x3e4) =
                             (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_960.ray + 0x3e4)
                        ;
                        *(uint *)(local_960.ray + 1000) =
                             (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_960.ray + 1000);
                        *(uint *)(local_960.ray + 0x3ec) =
                             (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_960.ray + 0x3ec)
                        ;
                        *(uint *)(local_960.ray + 0x3f0) =
                             (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_960.ray + 0x3f0)
                        ;
                        *(uint *)(local_960.ray + 0x3f4) =
                             (uint)bVar24 * iVar89 | (uint)!bVar24 * *(int *)(local_960.ray + 0x3f4)
                        ;
                        *(uint *)(local_960.ray + 0x3f8) =
                             (uint)bVar25 * iVar90 | (uint)!bVar25 * *(int *)(local_960.ray + 0x3f8)
                        ;
                        *(uint *)(local_960.ray + 0x3fc) =
                             (uint)bVar26 * iVar91 | (uint)!bVar26 * *(int *)(local_960.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_960.hit + 0x104);
                        iVar2 = *(int *)(local_960.hit + 0x108);
                        iVar79 = *(int *)(local_960.hit + 0x10c);
                        iVar80 = *(int *)(local_960.hit + 0x110);
                        iVar81 = *(int *)(local_960.hit + 0x114);
                        iVar82 = *(int *)(local_960.hit + 0x118);
                        iVar83 = *(int *)(local_960.hit + 0x11c);
                        iVar84 = *(int *)(local_960.hit + 0x120);
                        iVar85 = *(int *)(local_960.hit + 0x124);
                        iVar86 = *(int *)(local_960.hit + 0x128);
                        iVar87 = *(int *)(local_960.hit + 300);
                        iVar88 = *(int *)(local_960.hit + 0x130);
                        iVar89 = *(int *)(local_960.hit + 0x134);
                        iVar90 = *(int *)(local_960.hit + 0x138);
                        iVar91 = *(int *)(local_960.hit + 0x13c);
                        bVar13 = (bool)((byte)(uVar34 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar34 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar34 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar34 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar34 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar34 >> 6) & 1);
                        bVar19 = (bool)((byte)(uVar34 >> 7) & 1);
                        bVar20 = (bool)((byte)(uVar34 >> 9) & 1);
                        bVar21 = (bool)((byte)(uVar34 >> 10) & 1);
                        bVar22 = (bool)((byte)(uVar34 >> 0xb) & 1);
                        bVar23 = (bool)((byte)(uVar34 >> 0xc) & 1);
                        bVar24 = (bool)((byte)(uVar34 >> 0xd) & 1);
                        bVar25 = (bool)((byte)(uVar34 >> 0xe) & 1);
                        bVar26 = SUB81(uVar34 >> 0xf,0);
                        *(uint *)(local_960.ray + 0x400) =
                             (uint)(bVar99 & 1) * *(int *)(local_960.hit + 0x100) |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_960.ray + 0x400);
                        *(uint *)(local_960.ray + 0x404) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_960.ray + 0x404);
                        *(uint *)(local_960.ray + 0x408) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_960.ray + 0x408);
                        *(uint *)(local_960.ray + 0x40c) =
                             (uint)bVar15 * iVar79 | (uint)!bVar15 * *(int *)(local_960.ray + 0x40c)
                        ;
                        *(uint *)(local_960.ray + 0x410) =
                             (uint)bVar16 * iVar80 | (uint)!bVar16 * *(int *)(local_960.ray + 0x410)
                        ;
                        *(uint *)(local_960.ray + 0x414) =
                             (uint)bVar17 * iVar81 | (uint)!bVar17 * *(int *)(local_960.ray + 0x414)
                        ;
                        *(uint *)(local_960.ray + 0x418) =
                             (uint)bVar18 * iVar82 | (uint)!bVar18 * *(int *)(local_960.ray + 0x418)
                        ;
                        *(uint *)(local_960.ray + 0x41c) =
                             (uint)bVar19 * iVar83 | (uint)!bVar19 * *(int *)(local_960.ray + 0x41c)
                        ;
                        *(uint *)(local_960.ray + 0x420) =
                             (uint)(bVar98 & 1) * iVar84 |
                             (uint)!(bool)(bVar98 & 1) * *(int *)(local_960.ray + 0x420);
                        *(uint *)(local_960.ray + 0x424) =
                             (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_960.ray + 0x424)
                        ;
                        *(uint *)(local_960.ray + 0x428) =
                             (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_960.ray + 0x428)
                        ;
                        *(uint *)(local_960.ray + 0x42c) =
                             (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_960.ray + 0x42c)
                        ;
                        *(uint *)(local_960.ray + 0x430) =
                             (uint)bVar23 * iVar88 | (uint)!bVar23 * *(int *)(local_960.ray + 0x430)
                        ;
                        *(uint *)(local_960.ray + 0x434) =
                             (uint)bVar24 * iVar89 | (uint)!bVar24 * *(int *)(local_960.ray + 0x434)
                        ;
                        *(uint *)(local_960.ray + 0x438) =
                             (uint)bVar25 * iVar90 | (uint)!bVar25 * *(int *)(local_960.ray + 0x438)
                        ;
                        *(uint *)(local_960.ray + 0x43c) =
                             (uint)bVar26 * iVar91 | (uint)!bVar26 * *(int *)(local_960.ray + 0x43c)
                        ;
                        auVar245 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_960.hit + 0x140));
                        auVar245 = vmovdqu32_avx512f(auVar245);
                        *(undefined1 (*) [64])(local_960.ray + 0x440) = auVar245;
                        auVar245 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_960.hit + 0x180));
                        auVar245 = vmovdqu32_avx512f(auVar245);
                        *(undefined1 (*) [64])(local_960.ray + 0x480) = auVar245;
                        auVar245 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_960.hit + 0x1c0));
                        auVar245 = vmovdqa32_avx512f(auVar245);
                        *(undefined1 (*) [64])(local_960.ray + 0x4c0) = auVar245;
                        auVar245 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_960.hit + 0x200));
                        auVar245 = vmovdqa32_avx512f(auVar245);
                        *(undefined1 (*) [64])(local_960.ray + 0x500) = auVar245;
                      }
                      bVar99 = ~(byte)(1 << ((uint)uVar100 & 0x1f)) & bVar107;
                      uVar167 = *(undefined4 *)(ray + k * 4 + 0x200);
                      auVar52._4_4_ = uVar167;
                      auVar52._0_4_ = uVar167;
                      auVar52._8_4_ = uVar167;
                      auVar52._12_4_ = uVar167;
                      auVar52._16_4_ = uVar167;
                      auVar52._20_4_ = uVar167;
                      auVar52._24_4_ = uVar167;
                      auVar52._28_4_ = uVar167;
                      uVar168 = vcmpps_avx512vl(local_8a0,auVar52,2);
                      bVar107 = bVar99 & (byte)uVar168;
                      if ((bVar99 & (byte)uVar168) != 0) {
                        auVar181._8_4_ = 0x7f800000;
                        auVar181._0_8_ = 0x7f8000007f800000;
                        auVar181._12_4_ = 0x7f800000;
                        auVar181._16_4_ = 0x7f800000;
                        auVar181._20_4_ = 0x7f800000;
                        auVar181._24_4_ = 0x7f800000;
                        auVar181._28_4_ = 0x7f800000;
                        auVar134 = vblendmps_avx512vl(auVar181,local_8a0);
                        auVar156._0_4_ =
                             (uint)(bVar107 & 1) * auVar134._0_4_ |
                             (uint)!(bool)(bVar107 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar107 >> 1 & 1);
                        auVar156._4_4_ = (uint)bVar13 * auVar134._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar107 >> 2 & 1);
                        auVar156._8_4_ = (uint)bVar13 * auVar134._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar107 >> 3 & 1);
                        auVar156._12_4_ =
                             (uint)bVar13 * auVar134._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar107 >> 4 & 1);
                        auVar156._16_4_ =
                             (uint)bVar13 * auVar134._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar107 >> 5 & 1);
                        auVar156._20_4_ =
                             (uint)bVar13 * auVar134._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar107 >> 6 & 1);
                        auVar156._24_4_ =
                             (uint)bVar13 * auVar134._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar156._28_4_ =
                             (uint)(bVar107 >> 7) * auVar134._28_4_ |
                             (uint)!(bool)(bVar107 >> 7) * 0x7f800000;
                        auVar134 = vshufps_avx(auVar156,auVar156,0xb1);
                        auVar134 = vminps_avx(auVar156,auVar134);
                        auVar136 = vshufpd_avx(auVar134,auVar134,5);
                        auVar134 = vminps_avx(auVar134,auVar136);
                        auVar136 = vpermpd_avx2(auVar134,0x4e);
                        auVar134 = vminps_avx(auVar134,auVar136);
                        uVar168 = vcmpps_avx512vl(auVar156,auVar134,0);
                        bVar98 = (byte)uVar168 & bVar107;
                        bVar99 = bVar107;
                        if (bVar98 != 0) {
                          bVar99 = bVar98;
                        }
                        uVar35 = 0;
                        for (uVar101 = (uint)bVar99; (uVar101 & 1) == 0;
                            uVar101 = uVar101 >> 1 | 0x80000000) {
                          uVar35 = uVar35 + 1;
                        }
                        uVar100 = (ulong)uVar35;
                      }
                    } while (bVar107 != 0);
                  }
                }
              }
            }
          }
          lVar102 = lVar102 + 8;
          auVar245 = auVar241;
        } while ((int)lVar102 < iVar8);
      }
      uVar167 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar41._4_4_ = uVar167;
      auVar41._0_4_ = uVar167;
      auVar41._8_4_ = uVar167;
      auVar41._12_4_ = uVar167;
      uVar168 = vcmpps_avx512vl(local_4f0,auVar41,2);
      uVar105 = (uint)uVar106 & (uint)uVar106 + 0xf & (uint)uVar168;
      uVar106 = (ulong)uVar105;
    } while (uVar105 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }